

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize_x86_fma.cpp
# Opt level: O3

void ncnn::requantize(int *intptr,char *ptr,Mat *scale_in_data,Mat *bias_data,Mat *scale_out_data,
                     int activation_type,Mat *activation_params,int elemcount,int elempack)

{
  float fVar1;
  undefined4 uVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  ulong uVar29;
  undefined1 uVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar37 [16];
  undefined1 auVar48 [32];
  undefined1 auVar38 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar114 [36];
  undefined1 auVar113 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar115 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar147 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar148 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar169 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar189 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar202;
  undefined1 auVar190 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar203 [36];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  float fVar204;
  v4sf one;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  float fVar232;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar215 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar230;
  float fVar231;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 in_ZMM8 [64];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar245 [28];
  undefined1 auVar246 [28];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar259;
  float fVar260;
  undefined1 auVar247 [32];
  float fVar258;
  float fVar261;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar240 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar262 [16];
  undefined1 auVar271 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar274 [16];
  undefined1 auVar278 [32];
  float fVar281;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar290 [28];
  undefined1 auVar286 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar303;
  float fVar306;
  undefined1 auVar292 [32];
  float fVar301;
  float fVar302;
  float fVar304;
  float fVar305;
  undefined1 in_ZMM12 [64];
  undefined1 auVar299 [64];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar287 [16];
  undefined1 auVar300 [64];
  undefined1 auVar308 [16];
  float fVar307;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [28];
  undefined1 auVar320 [32];
  undefined1 auVar318 [28];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar323 [32];
  undefined1 auVar311 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar312 [16];
  undefined1 auVar329 [32];
  undefined1 auVar313 [16];
  undefined1 auVar331 [32];
  undefined1 auVar314 [16];
  undefined1 auVar333 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar334 [64];
  undefined1 auVar335 [28];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 in_ZMM14 [64];
  float fVar344;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined8 *in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int scale_out_data_size;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 auVar112 [32];
  undefined1 auVar146 [32];
  undefined1 auVar168 [32];
  undefined1 auVar170 [32];
  undefined1 auVar176 [32];
  undefined1 auVar188 [32];
  undefined1 auVar191 [32];
  undefined1 auVar199 [32];
  undefined1 auVar214 [32];
  undefined1 auVar216 [32];
  undefined1 auVar225 [32];
  undefined1 auVar248 [32];
  undefined1 auVar251 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [64];
  undefined1 auVar291 [32];
  undefined1 auVar298 [32];
  undefined1 auVar321 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar328 [32];
  undefined1 auVar330 [32];
  undefined1 auVar332 [32];
  undefined1 auVar319 [32];
  undefined1 auVar322 [32];
  float fVar353;
  
  fVar1 = *(float *)&scale_in_data->data;
  local_d8._4_4_ = fVar1;
  local_d8._0_4_ = fVar1;
  fStack_d0 = fVar1;
  fStack_cc = fVar1;
  fStack_c8 = fVar1;
  fStack_c4 = fVar1;
  fStack_c0 = fVar1;
  if (in_stack_00000030 == 8 && 1 < (int)bias_data) {
    auVar253._0_8_ = scale_in_data->data;
    auVar253._8_8_ = scale_in_data->refcount;
    auVar253._16_8_ = scale_in_data->elemsize;
    auVar253._24_4_ = scale_in_data->elempack;
    auVar253._28_4_ = *(undefined4 *)&scale_in_data->field_0x1c;
    _local_d8 = auVar253._0_28_;
  }
  fVar307 = *(float *)&activation_params->data;
  local_f8._4_4_ = fVar307;
  local_f8._0_4_ = fVar307;
  fStack_f0 = fVar307;
  fStack_ec = fVar307;
  fStack_e8 = fVar307;
  fStack_e4 = fVar307;
  fStack_e0 = fVar307;
  auVar276._28_4_ = fVar307;
  auVar276._0_28_ = _local_f8;
  auVar280 = ZEXT3264(auVar276);
  if (1 < elemcount && in_stack_00000030 == 8) {
    auVar49._0_8_ = activation_params->data;
    auVar49._8_8_ = activation_params->refcount;
    auVar49._16_8_ = activation_params->elemsize;
    auVar49._24_4_ = activation_params->elempack;
    auVar49._28_4_ = *(undefined4 *)&activation_params->field_0x1c;
    _local_f8 = auVar49._0_28_;
  }
  uVar34 = in_stack_00000028 * in_stack_00000030;
  if (activation_type == 0) {
    uVar31 = 0;
    if (0xf < (int)uVar34) {
      uVar31 = uVar34 & 0x7ffffff0;
      iVar33 = 0xf;
      auVar300 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar334 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar84 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
      auVar113 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
      auVar273 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar272 = in_ZMM12;
      do {
        auVar203 = in_ZMM7._28_36_;
        auVar114 = in_ZMM6._28_36_;
        auVar253 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        auVar49 = vcvtdq2ps_avx(*(undefined1 (*) [32])((long)intptr + 0x20));
        in_ZMM13 = ZEXT3264(auVar49);
        auVar299._0_4_ = auVar253._0_4_ * (float)local_d8._0_4_;
        auVar299._4_4_ = auVar253._4_4_ * (float)local_d8._4_4_;
        auVar299._8_4_ = auVar253._8_4_ * fStack_d0;
        auVar299._12_4_ = auVar253._12_4_ * fStack_cc;
        auVar299._16_4_ = auVar253._16_4_ * fStack_c8;
        auVar299._20_4_ = auVar253._20_4_ * fStack_c4;
        auVar299._28_36_ = auVar272._28_36_;
        auVar299._24_4_ = auVar253._24_4_ * fStack_c0;
        auVar145 = auVar299._0_32_;
        in_ZMM12 = ZEXT3264(auVar145);
        auVar245._0_4_ = auVar49._0_4_ * (float)local_d8._0_4_;
        auVar245._4_4_ = auVar49._4_4_ * (float)local_d8._4_4_;
        auVar245._8_4_ = auVar49._8_4_ * fStack_d0;
        auVar245._12_4_ = auVar49._12_4_ * fStack_cc;
        auVar245._16_4_ = auVar49._16_4_ * fStack_c8;
        auVar245._20_4_ = auVar49._20_4_ * fStack_c4;
        auVar245._24_4_ = auVar49._24_4_ * fStack_c0;
        auVar147._28_4_ = auVar253._28_4_;
        auVar147._0_28_ = auVar245;
        auVar270 = auVar273._0_32_;
        auVar144 = auVar334._0_32_;
        fVar202 = auVar334._0_4_;
        fVar204 = auVar334._4_4_;
        fVar232 = auVar334._8_4_;
        fVar234 = auVar334._12_4_;
        fVar258 = auVar334._16_4_;
        fVar259 = auVar334._20_4_;
        fVar260 = auVar334._24_4_;
        fVar261 = auVar334._28_4_;
        fVar307 = auVar273._0_4_;
        fVar230 = auVar273._4_4_;
        fVar231 = auVar273._8_4_;
        fVar233 = auVar273._12_4_;
        fVar235 = auVar273._16_4_;
        fVar344 = auVar273._20_4_;
        fVar347 = auVar273._24_4_;
        fVar348 = auVar273._28_4_;
        switch(elempack) {
        case 1:
          auVar114 = (undefined1  [36])0x0;
          auVar253 = vmaxps_avx(auVar145,ZEXT1632(ZEXT816(0)));
          in_ZMM12 = ZEXT3264(auVar253);
          auVar253 = vmaxps_avx(auVar147,ZEXT1632(ZEXT816(0)));
          auVar245 = auVar253._0_28_;
          break;
        case 2:
          auVar237 = ZEXT816(0);
          auVar114 = (undefined1  [36])0x0;
          auVar253 = vmaxps_avx(auVar145,ZEXT1632(auVar237));
          auVar49 = vminps_avx(auVar145,ZEXT1632(auVar237));
          fVar307 = *(float *)*in_stack_00000020;
          in_ZMM14 = ZEXT3264(CONCAT428(fVar307,CONCAT424(fVar307,CONCAT420(fVar307,CONCAT416(
                                                  fVar307,CONCAT412(fVar307,CONCAT48(fVar307,
                                                  CONCAT44(fVar307,fVar307))))))));
          in_ZMM12 = ZEXT3264(CONCAT428(auVar49._28_4_ + auVar253._28_4_,
                                        CONCAT424(fVar307 * auVar49._24_4_ + auVar253._24_4_,
                                                  CONCAT420(fVar307 * auVar49._20_4_ +
                                                            auVar253._20_4_,
                                                            CONCAT416(fVar307 * auVar49._16_4_ +
                                                                      auVar253._16_4_,
                                                                      CONCAT412(fVar307 * auVar49.
                                                  _12_4_ + auVar253._12_4_,
                                                  CONCAT48(fVar307 * auVar49._8_4_ + auVar253._8_4_,
                                                           CONCAT44(fVar307 * auVar49._4_4_ +
                                                                    auVar253._4_4_,
                                                                    fVar307 * auVar49._0_4_ +
                                                                    auVar253._0_4_))))))));
          auVar253 = vmaxps_avx(auVar147,ZEXT1632(auVar237));
          in_ZMM13 = ZEXT3264(auVar253);
          auVar49 = vminps_avx(auVar147,ZEXT1632(auVar237));
          auVar245._0_4_ = fVar307 * auVar49._0_4_ + auVar253._0_4_;
          auVar245._4_4_ = fVar307 * auVar49._4_4_ + auVar253._4_4_;
          auVar245._8_4_ = fVar307 * auVar49._8_4_ + auVar253._8_4_;
          auVar245._12_4_ = fVar307 * auVar49._12_4_ + auVar253._12_4_;
          auVar245._16_4_ = fVar307 * auVar49._16_4_ + auVar253._16_4_;
          auVar245._20_4_ = fVar307 * auVar49._20_4_ + auVar253._20_4_;
          auVar245._24_4_ = fVar307 * auVar49._24_4_ + auVar253._24_4_;
          break;
        case 3:
          uVar2 = *(undefined4 *)*in_stack_00000020;
          auVar326._4_4_ = uVar2;
          auVar326._0_4_ = uVar2;
          auVar326._8_4_ = uVar2;
          auVar326._12_4_ = uVar2;
          auVar326._16_4_ = uVar2;
          auVar326._20_4_ = uVar2;
          auVar326._24_4_ = uVar2;
          auVar326._28_4_ = uVar2;
          in_ZMM13 = ZEXT3264(auVar326);
          uVar2 = ((undefined4 *)*in_stack_00000020)[1];
          auVar343._4_4_ = uVar2;
          auVar343._0_4_ = uVar2;
          auVar343._8_4_ = uVar2;
          auVar343._12_4_ = uVar2;
          auVar343._16_4_ = uVar2;
          auVar343._20_4_ = uVar2;
          auVar343._24_4_ = uVar2;
          auVar343._28_4_ = uVar2;
          in_ZMM14 = ZEXT3264(auVar343);
          auVar253 = vmaxps_avx(auVar145,auVar326);
          auVar253 = vminps_avx(auVar253,auVar343);
          in_ZMM12 = ZEXT3264(auVar253);
          auVar253 = vmaxps_avx(auVar147,auVar326);
          auVar253 = vminps_avx(auVar253,auVar343);
          auVar245 = auVar253._0_28_;
          break;
        case 4:
          auVar293._0_4_ = (uint)auVar299._0_4_ ^ auVar300._0_4_;
          auVar293._4_4_ = (uint)auVar299._4_4_ ^ auVar300._4_4_;
          auVar293._8_4_ = (uint)auVar299._8_4_ ^ auVar300._8_4_;
          auVar293._12_4_ = (uint)auVar299._12_4_ ^ auVar300._12_4_;
          auVar293._16_4_ = (uint)auVar299._16_4_ ^ auVar300._16_4_;
          auVar293._20_4_ = (uint)auVar299._20_4_ ^ auVar300._20_4_;
          auVar293._24_4_ = (uint)auVar299._24_4_ ^ auVar300._24_4_;
          auVar293._28_4_ = auVar272._28_4_ ^ auVar300._28_4_;
          auVar65._8_4_ = 0x42b0c0a5;
          auVar65._0_8_ = 0x42b0c0a542b0c0a5;
          auVar65._12_4_ = 0x42b0c0a5;
          auVar65._16_4_ = 0x42b0c0a5;
          auVar65._20_4_ = 0x42b0c0a5;
          auVar65._24_4_ = 0x42b0c0a5;
          auVar65._28_4_ = 0x42b0c0a5;
          auVar147 = vminps_avx(auVar293,auVar65);
          auVar190._8_4_ = 0xc2b0c0a5;
          auVar190._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar190._12_4_ = 0xc2b0c0a5;
          auVar190._16_4_ = 0xc2b0c0a5;
          auVar190._20_4_ = 0xc2b0c0a5;
          auVar190._24_4_ = 0xc2b0c0a5;
          auVar190._28_4_ = 0xc2b0c0a5;
          auVar147 = vmaxps_avx(auVar147,auVar190);
          auVar327._0_4_ = auVar147._0_4_ * 1.442695 + fVar202;
          auVar327._4_4_ = auVar147._4_4_ * 1.442695 + fVar204;
          auVar327._8_4_ = auVar147._8_4_ * 1.442695 + fVar232;
          auVar327._12_4_ = auVar147._12_4_ * 1.442695 + fVar234;
          auVar327._16_4_ = auVar147._16_4_ * 1.442695 + fVar258;
          auVar327._20_4_ = auVar147._20_4_ * 1.442695 + fVar259;
          auVar327._24_4_ = auVar147._24_4_ * 1.442695 + fVar260;
          auVar327._28_4_ = auVar49._28_4_ + fVar261;
          auVar145 = vroundps_avx(auVar327,1);
          auVar49 = vcmpps_avx(auVar327,auVar145,1);
          auVar49 = vandps_avx(auVar49,auVar270);
          auVar49 = vsubps_avx(auVar145,auVar49);
          auVar23._4_4_ = auVar49._4_4_ * 0.6931472;
          auVar23._0_4_ = auVar49._0_4_ * 0.6931472;
          auVar23._8_4_ = auVar49._8_4_ * 0.6931472;
          auVar23._12_4_ = auVar49._12_4_ * 0.6931472;
          auVar23._16_4_ = auVar49._16_4_ * 0.6931472;
          auVar23._20_4_ = auVar49._20_4_ * 0.6931472;
          auVar23._24_4_ = auVar49._24_4_ * 0.6931472;
          auVar23._28_4_ = auVar145._28_4_;
          auVar228 = vsubps_avx(auVar147,auVar23);
          fVar351 = auVar228._0_4_;
          fVar281 = auVar228._4_4_;
          fVar302 = auVar228._8_4_;
          fVar304 = auVar228._12_4_;
          fVar306 = auVar228._16_4_;
          fVar349 = auVar228._20_4_;
          fVar350 = auVar228._24_4_;
          auVar114 = ZEXT436(auVar280._28_4_);
          auVar203 = ZEXT436(0x3e2aaaaa);
          auVar312._0_4_ = (int)auVar49._0_4_;
          auVar312._4_4_ = (int)auVar49._4_4_;
          auVar312._8_4_ = (int)auVar49._8_4_;
          auVar312._12_4_ = (int)auVar49._12_4_;
          auVar328._16_4_ = (int)auVar49._16_4_;
          auVar328._0_16_ = auVar312;
          auVar328._20_4_ = (int)auVar49._20_4_;
          auVar328._24_4_ = (int)auVar49._24_4_;
          auVar328._28_4_ = (int)auVar49._28_4_;
          auVar282 = vpslld_avx(auVar312,0x17);
          auVar237 = vpslld_avx(auVar328._16_16_,0x17);
          auVar38._8_4_ = 0x3f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar38._12_4_ = 0x3f800000;
          auVar237 = vpaddd_avx(auVar237,auVar38);
          auVar282 = vpaddd_avx(auVar282,auVar38);
          uVar29 = CONCAT44(auVar245._4_4_,auVar245._0_4_);
          auVar254._0_8_ = uVar29 ^ 0x8000000080000000;
          auVar254._8_4_ = -auVar245._8_4_;
          auVar254._12_4_ = -auVar245._12_4_;
          auVar254._16_4_ = -auVar245._16_4_;
          auVar254._20_4_ = -auVar245._20_4_;
          auVar254._24_4_ = -auVar245._24_4_;
          auVar254._28_4_ = auVar253._28_4_ ^ 0x80000000;
          auVar253 = vminps_avx(auVar254,auVar65);
          auVar66._8_4_ = 0xc2b0c0a5;
          auVar66._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar66._12_4_ = 0xc2b0c0a5;
          auVar66._16_4_ = 0xc2b0c0a5;
          auVar66._20_4_ = 0xc2b0c0a5;
          auVar66._24_4_ = 0xc2b0c0a5;
          auVar66._28_4_ = 0xc2b0c0a5;
          auVar49 = vmaxps_avx(auVar253,auVar66);
          auVar329._0_4_ = auVar49._0_4_ * 1.442695 + fVar202;
          auVar329._4_4_ = auVar49._4_4_ * 1.442695 + fVar204;
          auVar329._8_4_ = auVar49._8_4_ * 1.442695 + fVar232;
          auVar329._12_4_ = auVar49._12_4_ * 1.442695 + fVar234;
          auVar329._16_4_ = auVar49._16_4_ * 1.442695 + fVar258;
          auVar329._20_4_ = auVar49._20_4_ * 1.442695 + fVar259;
          auVar329._24_4_ = auVar49._24_4_ * 1.442695 + fVar260;
          auVar329._28_4_ = fVar261 + -0.0;
          auVar147 = vroundps_avx(auVar329,1);
          auVar253 = vcmpps_avx(auVar329,auVar147,1);
          auVar253 = vandps_avx(auVar253,auVar270);
          auVar253 = vsubps_avx(auVar147,auVar253);
          auVar24._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar24._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar24._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar24._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar24._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar24._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar24._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar24._28_4_ = auVar147._28_4_;
          auVar84 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          auVar49 = vsubps_avx(auVar49,auVar24);
          fVar261 = auVar49._0_4_;
          fVar301 = auVar49._4_4_;
          fVar303 = auVar49._8_4_;
          fVar305 = auVar49._12_4_;
          fVar4 = auVar49._16_4_;
          fVar5 = auVar49._20_4_;
          fVar6 = auVar49._24_4_;
          auVar113 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          auVar300 = ZEXT3264(CONCAT428(0x80000000,
                                        CONCAT424(0x80000000,
                                                  CONCAT420(0x80000000,
                                                            CONCAT416(0x80000000,
                                                                      CONCAT412(0x80000000,
                                                                                CONCAT48(0x80000000,
                                                                                                                                                                                  
                                                  0x8000000080000000)))))));
          auVar273 = ZEXT3264(auVar270);
          auVar334 = ZEXT3264(auVar144);
          auVar280 = ZEXT3264(auVar280._0_32_);
          auVar313._0_4_ = (int)auVar253._0_4_;
          auVar313._4_4_ = (int)auVar253._4_4_;
          auVar313._8_4_ = (int)auVar253._8_4_;
          auVar313._12_4_ = (int)auVar253._12_4_;
          auVar330._16_4_ = (int)auVar253._16_4_;
          auVar330._0_16_ = auVar313;
          auVar330._20_4_ = (int)auVar253._20_4_;
          auVar330._24_4_ = (int)auVar253._24_4_;
          auVar330._28_4_ = (int)auVar253._28_4_;
          auVar239 = vpslld_avx(auVar313,0x17);
          auVar238 = vpslld_avx(auVar330._16_16_,0x17);
          auVar238 = vpaddd_avx(auVar238,auVar38);
          auVar239 = vpaddd_avx(auVar239,auVar38);
          in_ZMM14 = ZEXT1664(auVar239);
          in_ZMM13 = ZEXT3264(CONCAT1616(auVar238,auVar239));
          auVar294._0_4_ =
               (fVar351 + fVar307 +
               fVar351 * fVar351 *
               (((((fVar351 * 0.00019875691 + 0.0013981999) * fVar351 + 0.008333452) * fVar351 +
                 0.041665796) * fVar351 + 0.16666666) * fVar351 + fVar202)) * auVar282._0_4_ +
               fVar307;
          auVar294._4_4_ =
               (fVar281 + fVar230 +
               fVar281 * fVar281 *
               (((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) * fVar281 +
                 0.041665796) * fVar281 + 0.16666666) * fVar281 + fVar204)) * auVar282._4_4_ +
               fVar230;
          auVar294._8_4_ =
               (fVar302 + fVar231 +
               fVar302 * fVar302 *
               (((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) * fVar302 +
                 0.041665796) * fVar302 + 0.16666666) * fVar302 + fVar232)) * auVar282._8_4_ +
               fVar231;
          auVar294._12_4_ =
               (fVar304 + fVar233 +
               fVar304 * fVar304 *
               (((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 + 0.008333452) * fVar304 +
                 0.041665796) * fVar304 + 0.16666666) * fVar304 + fVar234)) * auVar282._12_4_ +
               fVar233;
          auVar294._16_4_ =
               (fVar306 + fVar235 +
               fVar306 * fVar306 *
               (((((fVar306 * 0.00019875691 + 0.0013981999) * fVar306 + 0.008333452) * fVar306 +
                 0.041665796) * fVar306 + 0.16666666) * fVar306 + fVar258)) * auVar237._0_4_ +
               fVar235;
          auVar294._20_4_ =
               (fVar349 + fVar344 +
               fVar349 * fVar349 *
               (((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 + 0.008333452) * fVar349 +
                 0.041665796) * fVar349 + 0.16666666) * fVar349 + fVar259)) * auVar237._4_4_ +
               fVar344;
          auVar294._24_4_ =
               (fVar350 + fVar347 +
               fVar350 * fVar350 *
               (((((fVar350 * 0.00019875691 + 0.0013981999) * fVar350 + 0.008333452) * fVar350 +
                 0.041665796) * fVar350 + 0.16666666) * fVar350 + fVar260)) * auVar237._8_4_ +
               fVar347;
          auVar294._28_4_ = auVar228._28_4_ + fVar348 + auVar145._28_4_ + fVar348;
          auVar253 = vdivps_avx(auVar270,auVar294);
          in_ZMM12 = ZEXT3264(auVar253);
          auVar255._0_4_ =
               (fVar261 + fVar307 +
               fVar261 * fVar261 *
               (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                 0.041665796) * fVar261 + 0.16666666) * fVar261 + fVar202)) * auVar239._0_4_ +
               fVar307;
          auVar255._4_4_ =
               (fVar301 + fVar230 +
               fVar301 * fVar301 *
               (((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) * fVar301 +
                 0.041665796) * fVar301 + 0.16666666) * fVar301 + fVar204)) * auVar239._4_4_ +
               fVar230;
          auVar255._8_4_ =
               (fVar303 + fVar231 +
               fVar303 * fVar303 *
               (((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) * fVar303 +
                 0.041665796) * fVar303 + 0.16666666) * fVar303 + fVar232)) * auVar239._8_4_ +
               fVar231;
          auVar255._12_4_ =
               (fVar305 + fVar233 +
               fVar305 * fVar305 *
               (((((fVar305 * 0.00019875691 + 0.0013981999) * fVar305 + 0.008333452) * fVar305 +
                 0.041665796) * fVar305 + 0.16666666) * fVar305 + fVar234)) * auVar239._12_4_ +
               fVar233;
          auVar255._16_4_ =
               (fVar4 + fVar235 +
               fVar4 * fVar4 *
               (((((fVar4 * 0.00019875691 + 0.0013981999) * fVar4 + 0.008333452) * fVar4 +
                 0.041665796) * fVar4 + 0.16666666) * fVar4 + fVar258)) * auVar238._0_4_ + fVar235;
          auVar255._20_4_ =
               (fVar5 + fVar344 +
               fVar5 * fVar5 *
               (((((fVar5 * 0.00019875691 + 0.0013981999) * fVar5 + 0.008333452) * fVar5 +
                 0.041665796) * fVar5 + 0.16666666) * fVar5 + fVar259)) * auVar238._4_4_ + fVar344;
          auVar255._24_4_ =
               (fVar6 + fVar347 +
               fVar6 * fVar6 *
               (((((fVar6 * 0.00019875691 + 0.0013981999) * fVar6 + 0.008333452) * fVar6 +
                 0.041665796) * fVar6 + 0.16666666) * fVar6 + fVar260)) * auVar238._8_4_ + fVar347;
          auVar255._28_4_ = auVar49._28_4_ + fVar348 + auVar147._28_4_ + fVar348;
          auVar253 = vdivps_avx(auVar270,auVar255);
          auVar245 = auVar253._0_28_;
          break;
        case 5:
          auVar139._8_4_ = 0x42b0c0a5;
          auVar139._0_8_ = 0x42b0c0a542b0c0a5;
          auVar139._12_4_ = 0x42b0c0a5;
          auVar139._16_4_ = 0x42b0c0a5;
          auVar139._20_4_ = 0x42b0c0a5;
          auVar139._24_4_ = 0x42b0c0a5;
          auVar139._28_4_ = 0x42b0c0a5;
          auVar253 = vminps_avx(auVar145,auVar139);
          auVar140._8_4_ = 0xc2b0c0a5;
          auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar140._12_4_ = 0xc2b0c0a5;
          auVar140._16_4_ = 0xc2b0c0a5;
          auVar140._20_4_ = 0xc2b0c0a5;
          auVar140._24_4_ = 0xc2b0c0a5;
          auVar140._28_4_ = 0xc2b0c0a5;
          auVar49 = vmaxps_avx(auVar253,auVar140);
          auVar341._0_4_ = auVar49._0_4_ * 1.442695 + fVar202;
          auVar341._4_4_ = auVar49._4_4_ * 1.442695 + fVar204;
          auVar341._8_4_ = auVar49._8_4_ * 1.442695 + fVar232;
          auVar341._12_4_ = auVar49._12_4_ * 1.442695 + fVar234;
          auVar341._16_4_ = auVar49._16_4_ * 1.442695 + fVar258;
          auVar341._20_4_ = auVar49._20_4_ * 1.442695 + fVar259;
          auVar341._24_4_ = auVar49._24_4_ * 1.442695 + fVar260;
          auVar341._28_4_ = in_ZMM14._28_4_ + fVar261;
          auVar145 = vroundps_avx(auVar341,1);
          auVar253 = vcmpps_avx(auVar341,auVar145,1);
          auVar253 = vandps_avx(auVar253,auVar270);
          auVar253 = vsubps_avx(auVar145,auVar253);
          auVar18._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar18._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar18._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar18._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar18._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar18._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar18._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar18._28_4_ = auVar145._28_4_;
          auVar49 = vsubps_avx(auVar49,auVar18);
          fVar351 = auVar49._0_4_;
          fVar281 = auVar49._4_4_;
          fVar301 = auVar49._8_4_;
          fVar302 = auVar49._12_4_;
          fVar303 = auVar49._16_4_;
          fVar304 = auVar49._20_4_;
          fVar305 = auVar49._24_4_;
          auVar113 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          auVar300 = ZEXT3264(CONCAT428(0x80000000,
                                        CONCAT424(0x80000000,
                                                  CONCAT420(0x80000000,
                                                            CONCAT416(0x80000000,
                                                                      CONCAT412(0x80000000,
                                                                                CONCAT48(0x80000000,
                                                                                                                                                                                  
                                                  0x8000000080000000)))))));
          auVar310._0_4_ = (int)auVar253._0_4_;
          auVar310._4_4_ = (int)auVar253._4_4_;
          auVar310._8_4_ = (int)auVar253._8_4_;
          auVar310._12_4_ = (int)auVar253._12_4_;
          auVar325._16_4_ = (int)auVar253._16_4_;
          auVar325._0_16_ = auVar310;
          auVar325._20_4_ = (int)auVar253._20_4_;
          auVar325._24_4_ = (int)auVar253._24_4_;
          auVar325._28_4_ = (int)auVar253._28_4_;
          auVar238 = vpslld_avx(auVar310,0x17);
          auVar237 = vpslld_avx(auVar325._16_16_,0x17);
          auVar282._8_4_ = 0x3f800000;
          auVar282._0_8_ = 0x3f8000003f800000;
          auVar282._12_4_ = 0x3f800000;
          auVar237 = vpaddd_avx(auVar237,auVar282);
          auVar282 = vpaddd_avx(auVar238,auVar282);
          auVar177._0_4_ =
               fVar307 + auVar282._0_4_ *
                         (fVar351 + fVar307 +
                         fVar351 * fVar351 *
                         (fVar351 * (fVar351 * (fVar351 * (fVar351 * (fVar351 * 0.00019875691 +
                                                                     0.0013981999) + 0.008333452) +
                                               0.041665796) + 0.16666666) + fVar202));
          auVar177._4_4_ =
               fVar230 + auVar282._4_4_ *
                         (fVar281 + fVar230 +
                         fVar281 * fVar281 *
                         (fVar281 * (fVar281 * (fVar281 * (fVar281 * (fVar281 * 0.00019875691 +
                                                                     0.0013981999) + 0.008333452) +
                                               0.041665796) + 0.16666666) + fVar204));
          auVar177._8_4_ =
               fVar231 + auVar282._8_4_ *
                         (fVar301 + fVar231 +
                         fVar301 * fVar301 *
                         (fVar301 * (fVar301 * (fVar301 * (fVar301 * (fVar301 * 0.00019875691 +
                                                                     0.0013981999) + 0.008333452) +
                                               0.041665796) + 0.16666666) + fVar232));
          auVar177._12_4_ =
               fVar233 + auVar282._12_4_ *
                         (fVar302 + fVar233 +
                         fVar302 * fVar302 *
                         (fVar302 * (fVar302 * (fVar302 * (fVar302 * (fVar302 * 0.00019875691 +
                                                                     0.0013981999) + 0.008333452) +
                                               0.041665796) + 0.16666666) + fVar234));
          auVar177._16_4_ =
               fVar235 + auVar237._0_4_ *
                         (fVar303 + fVar235 +
                         fVar303 * fVar303 *
                         (fVar303 * (fVar303 * (fVar303 * (fVar303 * (fVar303 * 0.00019875691 +
                                                                     0.0013981999) + 0.008333452) +
                                               0.041665796) + 0.16666666) + fVar258));
          auVar177._20_4_ =
               fVar344 + auVar237._4_4_ *
                         (fVar304 + fVar344 +
                         fVar304 * fVar304 *
                         (fVar304 * (fVar304 * (fVar304 * (fVar304 * (fVar304 * 0.00019875691 +
                                                                     0.0013981999) + 0.008333452) +
                                               0.041665796) + 0.16666666) + fVar259));
          auVar177._24_4_ =
               fVar347 + auVar237._8_4_ *
                         (fVar305 + fVar347 +
                         fVar305 * fVar305 *
                         (fVar305 * (fVar305 * (fVar305 * (fVar305 * (fVar305 * 0.00019875691 +
                                                                     0.0013981999) + 0.008333452) +
                                               0.041665796) + 0.16666666) + fVar260));
          auVar177._28_4_ =
               fVar348 + auVar49._28_4_ + fVar348 +
                         in_ZMM7._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                         fVar261;
          auVar49 = vcmpps_avx(auVar177,ZEXT832(0) << 0x20,2);
          auVar226._8_4_ = 0x800000;
          auVar226._0_8_ = 0x80000000800000;
          auVar226._12_4_ = 0x800000;
          auVar226._16_4_ = 0x800000;
          auVar226._20_4_ = 0x800000;
          auVar226._24_4_ = 0x800000;
          auVar226._28_4_ = 0x800000;
          auVar253 = vmaxps_avx(auVar226,auVar177);
          auVar282 = vpsrld_avx(auVar253._0_16_,0x17);
          auVar237 = vpsrld_avx(auVar253._16_16_,0x17);
          auVar141._8_4_ = 0x807fffff;
          auVar141._0_8_ = 0x807fffff807fffff;
          auVar141._12_4_ = 0x807fffff;
          auVar141._16_4_ = 0x807fffff;
          auVar141._20_4_ = 0x807fffff;
          auVar141._24_4_ = 0x807fffff;
          auVar141._28_4_ = 0x807fffff;
          auVar253 = vandps_avx(auVar253,auVar141);
          auVar228 = vorps_avx(auVar253,auVar144);
          auVar227._8_4_ = 0x3f3504f3;
          auVar227._0_8_ = 0x3f3504f33f3504f3;
          auVar227._12_4_ = 0x3f3504f3;
          auVar227._16_4_ = 0x3f3504f3;
          auVar227._20_4_ = 0x3f3504f3;
          auVar227._24_4_ = 0x3f3504f3;
          auVar227._28_4_ = 0x3f3504f3;
          auVar145 = vcmpps_avx(auVar227,auVar228,2);
          auVar253 = vandnps_avx(auVar145,auVar228);
          fVar351 = auVar228._0_4_ + -1.0 + auVar253._0_4_;
          fVar281 = auVar228._4_4_ + -1.0 + auVar253._4_4_;
          fVar301 = auVar228._8_4_ + -1.0 + auVar253._8_4_;
          fVar302 = auVar228._12_4_ + -1.0 + auVar253._12_4_;
          fVar303 = auVar228._16_4_ + -1.0 + auVar253._16_4_;
          fVar304 = auVar228._20_4_ + -1.0 + auVar253._20_4_;
          fVar305 = auVar228._24_4_ + -1.0 + auVar253._24_4_;
          auVar237 = vpsubd_avx(auVar237,auVar145._16_16_);
          auVar238._8_4_ = 0xffffff81;
          auVar238._0_8_ = 0xffffff81ffffff81;
          auVar238._12_4_ = 0xffffff81;
          auVar237 = vpaddd_avx(auVar237,auVar238);
          auVar282 = vpsubd_avx(auVar282,auVar145._0_16_);
          auVar282 = vpaddd_avx(auVar282,auVar238);
          auVar178._16_16_ = auVar237;
          auVar178._0_16_ = auVar282;
          auVar145 = vcvtdq2ps_avx(auVar178);
          auVar19._4_4_ =
               (fVar281 * fVar281 *
                (((((((((fVar281 * 0.070376836 + -0.1151461) * fVar281 + 0.116769984) * fVar281 +
                      -0.12420141) * fVar281 + 0.14249323) * fVar281 + -0.16668057) * fVar281 +
                   0.20000714) * fVar281 + -0.24999994) * fVar281 + 0.3333333) * fVar281 + -0.5) +
               auVar145._4_4_ * 0.6931472 + fVar281) * -2.0;
          auVar19._0_4_ =
               (fVar351 * fVar351 *
                (((((((((fVar351 * 0.070376836 + -0.1151461) * fVar351 + 0.116769984) * fVar351 +
                      -0.12420141) * fVar351 + 0.14249323) * fVar351 + -0.16668057) * fVar351 +
                   0.20000714) * fVar351 + -0.24999994) * fVar351 + 0.3333333) * fVar351 + -0.5) +
               auVar145._0_4_ * 0.6931472 + fVar351) * -2.0;
          auVar19._8_4_ =
               (fVar301 * fVar301 *
                (((((((((fVar301 * 0.070376836 + -0.1151461) * fVar301 + 0.116769984) * fVar301 +
                      -0.12420141) * fVar301 + 0.14249323) * fVar301 + -0.16668057) * fVar301 +
                   0.20000714) * fVar301 + -0.24999994) * fVar301 + 0.3333333) * fVar301 + -0.5) +
               auVar145._8_4_ * 0.6931472 + fVar301) * -2.0;
          auVar19._12_4_ =
               (fVar302 * fVar302 *
                (((((((((fVar302 * 0.070376836 + -0.1151461) * fVar302 + 0.116769984) * fVar302 +
                      -0.12420141) * fVar302 + 0.14249323) * fVar302 + -0.16668057) * fVar302 +
                   0.20000714) * fVar302 + -0.24999994) * fVar302 + 0.3333333) * fVar302 + -0.5) +
               auVar145._12_4_ * 0.6931472 + fVar302) * -2.0;
          auVar19._16_4_ =
               (fVar303 * fVar303 *
                (((((((((fVar303 * 0.070376836 + -0.1151461) * fVar303 + 0.116769984) * fVar303 +
                      -0.12420141) * fVar303 + 0.14249323) * fVar303 + -0.16668057) * fVar303 +
                   0.20000714) * fVar303 + -0.24999994) * fVar303 + 0.3333333) * fVar303 + -0.5) +
               auVar145._16_4_ * 0.6931472 + fVar303) * -2.0;
          auVar19._20_4_ =
               (fVar304 * fVar304 *
                (((((((((fVar304 * 0.070376836 + -0.1151461) * fVar304 + 0.116769984) * fVar304 +
                      -0.12420141) * fVar304 + 0.14249323) * fVar304 + -0.16668057) * fVar304 +
                   0.20000714) * fVar304 + -0.24999994) * fVar304 + 0.3333333) * fVar304 + -0.5) +
               auVar145._20_4_ * 0.6931472 + fVar304) * -2.0;
          auVar19._24_4_ =
               (fVar305 * fVar305 *
                (((((((((fVar305 * 0.070376836 + -0.1151461) * fVar305 + 0.116769984) * fVar305 +
                      -0.12420141) * fVar305 + 0.14249323) * fVar305 + -0.16668057) * fVar305 +
                   0.20000714) * fVar305 + -0.24999994) * fVar305 + 0.3333333) * fVar305 + -0.5) +
               auVar145._24_4_ * 0.6931472 + fVar305) * -2.0;
          auVar19._28_4_ = auVar145._28_4_ + auVar228._28_4_ + -1.0 + auVar253._28_4_ + 0.0;
          auVar179._8_4_ = 0x7fffffff;
          auVar179._0_8_ = 0x7fffffff7fffffff;
          auVar179._12_4_ = 0x7fffffff;
          auVar179._16_4_ = 0x7fffffff;
          auVar179._20_4_ = 0x7fffffff;
          auVar179._24_4_ = 0x7fffffff;
          auVar179._28_4_ = 0x7fffffff;
          auVar253 = vblendvps_avx(auVar19,auVar179,auVar49);
          auVar253 = vminps_avx(auVar253,auVar139);
          auVar346._8_4_ = 0xc2b0c0a5;
          auVar346._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar346._12_4_ = 0xc2b0c0a5;
          auVar346._16_4_ = 0xc2b0c0a5;
          auVar346._20_4_ = 0xc2b0c0a5;
          auVar346._24_4_ = 0xc2b0c0a5;
          auVar346._28_4_ = 0xc2b0c0a5;
          auVar49 = vmaxps_avx(auVar346,auVar253);
          auVar180._0_4_ = auVar49._0_4_ * 1.442695 + fVar202;
          auVar180._4_4_ = auVar49._4_4_ * 1.442695 + fVar204;
          auVar180._8_4_ = auVar49._8_4_ * 1.442695 + fVar232;
          auVar180._12_4_ = auVar49._12_4_ * 1.442695 + fVar234;
          auVar180._16_4_ = auVar49._16_4_ * 1.442695 + fVar258;
          auVar180._20_4_ = auVar49._20_4_ * 1.442695 + fVar259;
          auVar180._24_4_ = auVar49._24_4_ * 1.442695 + fVar260;
          auVar180._28_4_ = fVar261 + NAN;
          auVar145 = vroundps_avx(auVar180,1);
          auVar253 = vcmpps_avx(auVar180,auVar145,1);
          auVar253 = vandps_avx(auVar270,auVar253);
          auVar253 = vsubps_avx(auVar145,auVar253);
          auVar20._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar20._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar20._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar20._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar20._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar20._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar20._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar20._28_4_ = auVar145._28_4_;
          auVar228 = vsubps_avx(auVar49,auVar20);
          fVar351 = auVar228._0_4_;
          fVar301 = auVar228._4_4_;
          fVar303 = auVar228._8_4_;
          fVar305 = auVar228._12_4_;
          fVar4 = auVar228._16_4_;
          fVar5 = auVar228._20_4_;
          fVar6 = auVar228._24_4_;
          auVar237._0_4_ = (int)auVar253._0_4_;
          auVar237._4_4_ = (int)auVar253._4_4_;
          auVar237._8_4_ = (int)auVar253._8_4_;
          auVar237._12_4_ = (int)auVar253._12_4_;
          auVar181._16_4_ = (int)auVar253._16_4_;
          auVar181._0_16_ = auVar237;
          auVar181._20_4_ = (int)auVar253._20_4_;
          auVar181._24_4_ = (int)auVar253._24_4_;
          auVar181._28_4_ = (int)auVar253._28_4_;
          auVar282 = vpslld_avx(auVar237,0x17);
          auVar237 = vpslld_avx(auVar181._16_16_,0x17);
          auVar311._8_4_ = 0x3f800000;
          auVar311._0_8_ = 0x3f8000003f800000;
          auVar311._12_4_ = 0x3f800000;
          auVar237 = vpaddd_avx(auVar311,auVar237);
          auVar282 = vpaddd_avx(auVar282,auVar311);
          auVar253 = vminps_avx(auVar147,auVar139);
          auVar49 = vmaxps_avx(auVar346,auVar253);
          auVar182._0_4_ = auVar49._0_4_ * 1.442695 + fVar202;
          auVar182._4_4_ = auVar49._4_4_ * 1.442695 + fVar204;
          auVar182._8_4_ = auVar49._8_4_ * 1.442695 + fVar232;
          auVar182._12_4_ = auVar49._12_4_ * 1.442695 + fVar234;
          auVar182._16_4_ = auVar49._16_4_ * 1.442695 + fVar258;
          auVar182._20_4_ = auVar49._20_4_ * 1.442695 + fVar259;
          auVar182._24_4_ = auVar49._24_4_ * 1.442695 + fVar260;
          auVar182._28_4_ = auVar237._12_4_ + fVar261;
          auVar147 = vroundps_avx(auVar182,1);
          auVar253 = vcmpps_avx(auVar182,auVar147,1);
          auVar253 = vandps_avx(auVar270,auVar253);
          auVar253 = vsubps_avx(auVar147,auVar253);
          auVar21._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar21._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar21._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar21._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar21._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar21._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar21._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar21._28_4_ = auVar147._28_4_;
          auVar49 = vsubps_avx(auVar49,auVar21);
          fVar281 = auVar49._0_4_;
          fVar302 = auVar49._4_4_;
          fVar304 = auVar49._8_4_;
          fVar306 = auVar49._12_4_;
          fVar349 = auVar49._16_4_;
          fVar350 = auVar49._20_4_;
          fVar352 = auVar49._24_4_;
          auVar239._0_4_ = (int)auVar253._0_4_;
          auVar239._4_4_ = (int)auVar253._4_4_;
          auVar239._8_4_ = (int)auVar253._8_4_;
          auVar239._12_4_ = (int)auVar253._12_4_;
          auVar183._16_4_ = (int)auVar253._16_4_;
          auVar183._0_16_ = auVar239;
          auVar183._20_4_ = (int)auVar253._20_4_;
          auVar183._24_4_ = (int)auVar253._24_4_;
          auVar183._28_4_ = (int)auVar253._28_4_;
          auVar239 = vpslld_avx(auVar239,0x17);
          auVar238 = vpslld_avx(auVar183._16_16_,0x17);
          auVar238 = vpaddd_avx(auVar311,auVar238);
          auVar239 = vpaddd_avx(auVar239,auVar311);
          auVar342._0_4_ =
               fVar307 + (fVar281 * fVar281 *
                          (((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) *
                             fVar281 + 0.041665796) * fVar281 + 0.16666666) * fVar281 + fVar202) +
                         fVar307 + fVar281) * auVar239._0_4_;
          auVar342._4_4_ =
               fVar230 + (fVar302 * fVar302 *
                          (((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) *
                             fVar302 + 0.041665796) * fVar302 + 0.16666666) * fVar302 + fVar204) +
                         fVar230 + fVar302) * auVar239._4_4_;
          auVar342._8_4_ =
               fVar231 + (fVar304 * fVar304 *
                          (((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 + 0.008333452) *
                             fVar304 + 0.041665796) * fVar304 + 0.16666666) * fVar304 + fVar232) +
                         fVar231 + fVar304) * auVar239._8_4_;
          auVar342._12_4_ =
               fVar233 + (fVar306 * fVar306 *
                          (((((fVar306 * 0.00019875691 + 0.0013981999) * fVar306 + 0.008333452) *
                             fVar306 + 0.041665796) * fVar306 + 0.16666666) * fVar306 + fVar234) +
                         fVar233 + fVar306) * auVar239._12_4_;
          auVar342._16_4_ =
               fVar235 + (fVar349 * fVar349 *
                          (((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 + 0.008333452) *
                             fVar349 + 0.041665796) * fVar349 + 0.16666666) * fVar349 + fVar258) +
                         fVar235 + fVar349) * auVar238._0_4_;
          auVar342._20_4_ =
               fVar344 + (fVar350 * fVar350 *
                          (((((fVar350 * 0.00019875691 + 0.0013981999) * fVar350 + 0.008333452) *
                             fVar350 + 0.041665796) * fVar350 + 0.16666666) * fVar350 + fVar259) +
                         fVar344 + fVar350) * auVar238._4_4_;
          auVar342._24_4_ =
               fVar347 + (fVar352 * fVar352 *
                          (((((fVar352 * 0.00019875691 + 0.0013981999) * fVar352 + 0.008333452) *
                             fVar352 + 0.041665796) * fVar352 + 0.16666666) * fVar352 + fVar260) +
                         fVar347 + fVar352) * auVar238._8_4_;
          auVar342._28_4_ = fVar348 + auVar147._28_4_ + fVar348 + auVar49._28_4_;
          in_ZMM14 = ZEXT3264(auVar342);
          auVar62._8_4_ = 0x800000;
          auVar62._0_8_ = 0x80000000800000;
          auVar62._12_4_ = 0x800000;
          auVar62._16_4_ = 0x800000;
          auVar62._20_4_ = 0x800000;
          auVar62._24_4_ = 0x800000;
          auVar62._28_4_ = 0x800000;
          auVar147 = vmaxps_avx(auVar342,auVar62);
          auVar238 = vpsrld_avx(auVar147._16_16_,0x17);
          auVar63._8_4_ = 0x807fffff;
          auVar63._0_8_ = 0x807fffff807fffff;
          auVar63._12_4_ = 0x807fffff;
          auVar63._16_4_ = 0x807fffff;
          auVar63._20_4_ = 0x807fffff;
          auVar63._24_4_ = 0x807fffff;
          auVar63._28_4_ = 0x807fffff;
          auVar253 = vandps_avx(auVar147,auVar63);
          auVar144 = vorps_avx(auVar253,auVar144);
          auVar64._8_4_ = 0x3f3504f3;
          auVar64._0_8_ = 0x3f3504f33f3504f3;
          auVar64._12_4_ = 0x3f3504f3;
          auVar64._16_4_ = 0x3f3504f3;
          auVar64._20_4_ = 0x3f3504f3;
          auVar64._24_4_ = 0x3f3504f3;
          auVar64._28_4_ = 0x3f3504f3;
          auVar49 = vcmpps_avx(auVar64,auVar144,2);
          auVar253 = vandnps_avx(auVar49,auVar144);
          fVar281 = auVar144._0_4_ + -1.0 + auVar253._0_4_;
          fVar302 = auVar144._4_4_ + -1.0 + auVar253._4_4_;
          fVar304 = auVar144._8_4_ + -1.0 + auVar253._8_4_;
          fVar306 = auVar144._12_4_ + -1.0 + auVar253._12_4_;
          fVar349 = auVar144._16_4_ + -1.0 + auVar253._16_4_;
          fVar350 = auVar144._20_4_ + -1.0 + auVar253._20_4_;
          fVar352 = auVar144._24_4_ + -1.0 + auVar253._24_4_;
          auVar238 = vpsubd_avx(auVar238,auVar49._16_16_);
          auVar239 = vpsrld_avx(auVar147._0_16_,0x17);
          auVar78._8_4_ = 0xffffff81;
          auVar78._0_8_ = 0xffffff81ffffff81;
          auVar78._12_4_ = 0xffffff81;
          auVar238 = vpaddd_avx(auVar238,auVar78);
          auVar239 = vpsubd_avx(auVar239,auVar49._0_16_);
          auVar239 = vpaddd_avx(auVar239,auVar78);
          auVar142._16_16_ = auVar238;
          auVar142._0_16_ = auVar239;
          auVar49 = vcmpps_avx(auVar342,_DAT_005a70a0,2);
          auVar147 = vcvtdq2ps_avx(auVar142);
          auVar22._4_4_ =
               (fVar302 + auVar147._4_4_ * 0.6931472 +
               (((((((((fVar302 * 0.070376836 + -0.1151461) * fVar302 + 0.116769984) * fVar302 +
                     -0.12420141) * fVar302 + 0.14249323) * fVar302 + -0.16668057) * fVar302 +
                  0.20000714) * fVar302 + -0.24999994) * fVar302 + 0.3333333) * fVar302 + -0.5) *
               fVar302 * fVar302) * -2.0;
          auVar22._0_4_ =
               (fVar281 + auVar147._0_4_ * 0.6931472 +
               (((((((((fVar281 * 0.070376836 + -0.1151461) * fVar281 + 0.116769984) * fVar281 +
                     -0.12420141) * fVar281 + 0.14249323) * fVar281 + -0.16668057) * fVar281 +
                  0.20000714) * fVar281 + -0.24999994) * fVar281 + 0.3333333) * fVar281 + -0.5) *
               fVar281 * fVar281) * -2.0;
          auVar22._8_4_ =
               (fVar304 + auVar147._8_4_ * 0.6931472 +
               (((((((((fVar304 * 0.070376836 + -0.1151461) * fVar304 + 0.116769984) * fVar304 +
                     -0.12420141) * fVar304 + 0.14249323) * fVar304 + -0.16668057) * fVar304 +
                  0.20000714) * fVar304 + -0.24999994) * fVar304 + 0.3333333) * fVar304 + -0.5) *
               fVar304 * fVar304) * -2.0;
          auVar22._12_4_ =
               (fVar306 + auVar147._12_4_ * 0.6931472 +
               (((((((((fVar306 * 0.070376836 + -0.1151461) * fVar306 + 0.116769984) * fVar306 +
                     -0.12420141) * fVar306 + 0.14249323) * fVar306 + -0.16668057) * fVar306 +
                  0.20000714) * fVar306 + -0.24999994) * fVar306 + 0.3333333) * fVar306 + -0.5) *
               fVar306 * fVar306) * -2.0;
          auVar22._16_4_ =
               (fVar349 + auVar147._16_4_ * 0.6931472 +
               (((((((((fVar349 * 0.070376836 + -0.1151461) * fVar349 + 0.116769984) * fVar349 +
                     -0.12420141) * fVar349 + 0.14249323) * fVar349 + -0.16668057) * fVar349 +
                  0.20000714) * fVar349 + -0.24999994) * fVar349 + 0.3333333) * fVar349 + -0.5) *
               fVar349 * fVar349) * -2.0;
          auVar22._20_4_ =
               (fVar350 + auVar147._20_4_ * 0.6931472 +
               (((((((((fVar350 * 0.070376836 + -0.1151461) * fVar350 + 0.116769984) * fVar350 +
                     -0.12420141) * fVar350 + 0.14249323) * fVar350 + -0.16668057) * fVar350 +
                  0.20000714) * fVar350 + -0.24999994) * fVar350 + 0.3333333) * fVar350 + -0.5) *
               fVar350 * fVar350) * -2.0;
          auVar22._24_4_ =
               (fVar352 + auVar147._24_4_ * 0.6931472 +
               (((((((((fVar352 * 0.070376836 + -0.1151461) * fVar352 + 0.116769984) * fVar352 +
                     -0.12420141) * fVar352 + 0.14249323) * fVar352 + -0.16668057) * fVar352 +
                  0.20000714) * fVar352 + -0.24999994) * fVar352 + 0.3333333) * fVar352 + -0.5) *
               fVar352 * fVar352) * -2.0;
          auVar22._28_4_ = auVar144._28_4_ + -1.0 + auVar253._28_4_ + auVar147._28_4_ + 0.0;
          auVar184._8_4_ = 0x7fffffff;
          auVar184._0_8_ = 0x7fffffff7fffffff;
          auVar184._12_4_ = 0x7fffffff;
          auVar184._16_4_ = 0x7fffffff;
          auVar184._20_4_ = 0x7fffffff;
          auVar184._24_4_ = 0x7fffffff;
          auVar184._28_4_ = 0x7fffffff;
          auVar253 = vblendvps_avx(auVar22,auVar184,auVar49);
          auVar185._8_4_ = 0x42b0c0a5;
          auVar185._0_8_ = 0x42b0c0a542b0c0a5;
          auVar185._12_4_ = 0x42b0c0a5;
          auVar185._16_4_ = 0x42b0c0a5;
          auVar185._20_4_ = 0x42b0c0a5;
          auVar185._24_4_ = 0x42b0c0a5;
          auVar185._28_4_ = 0x42b0c0a5;
          auVar253 = vminps_avx(auVar253,auVar185);
          auVar186._8_4_ = 0xc2b0c0a5;
          auVar186._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar186._12_4_ = 0xc2b0c0a5;
          auVar186._16_4_ = 0xc2b0c0a5;
          auVar186._20_4_ = 0xc2b0c0a5;
          auVar186._24_4_ = 0xc2b0c0a5;
          auVar186._28_4_ = 0xc2b0c0a5;
          auVar49 = vmaxps_avx(auVar253,auVar186);
          auVar187._0_4_ = auVar49._0_4_ * 1.442695 + fVar202;
          auVar187._4_4_ = auVar49._4_4_ * 1.442695 + fVar204;
          auVar187._8_4_ = auVar49._8_4_ * 1.442695 + fVar232;
          auVar187._12_4_ = auVar49._12_4_ * 1.442695 + fVar234;
          auVar187._16_4_ = auVar49._16_4_ * 1.442695 + fVar258;
          auVar187._20_4_ = auVar49._20_4_ * 1.442695 + fVar259;
          auVar187._24_4_ = auVar49._24_4_ * 1.442695 + fVar260;
          auVar187._28_4_ = fVar261 + 1.442695;
          auVar147 = vroundps_avx(auVar187,1);
          auVar253 = vcmpps_avx(auVar187,auVar147,1);
          auVar253 = vandps_avx(auVar270,auVar253);
          auVar253 = vsubps_avx(auVar147,auVar253);
          auVar270._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar270._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar270._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar270._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar270._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar270._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar270._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar270._28_4_ = auVar147._28_4_;
          auVar84 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          auVar49 = vsubps_avx(auVar49,auVar270);
          fVar261 = auVar49._0_4_;
          fVar281 = auVar49._4_4_;
          fVar302 = auVar49._8_4_;
          fVar304 = auVar49._12_4_;
          fVar306 = auVar49._16_4_;
          fVar349 = auVar49._20_4_;
          fVar350 = auVar49._24_4_;
          in_ZMM13 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                        CONCAT424(0x3e2aaaaa,
                                                  CONCAT420(0x3e2aaaaa,
                                                            CONCAT416(0x3e2aaaaa,
                                                                      CONCAT412(0x3e2aaaaa,
                                                                                CONCAT48(0x3e2aaaaa,
                                                                                                                                                                                  
                                                  0x3e2aaaaa3e2aaaaa)))))));
          auVar280 = ZEXT3264(auVar276);
          auVar152._0_4_ = (int)auVar253._0_4_;
          auVar152._4_4_ = (int)auVar253._4_4_;
          auVar152._8_4_ = (int)auVar253._8_4_;
          auVar152._12_4_ = (int)auVar253._12_4_;
          auVar188._16_4_ = (int)auVar253._16_4_;
          auVar188._0_16_ = auVar152;
          auVar188._20_4_ = (int)auVar253._20_4_;
          auVar188._24_4_ = (int)auVar253._24_4_;
          auVar188._28_4_ = (int)auVar253._28_4_;
          auVar239 = vpslld_avx(auVar152,0x17);
          auVar238 = vpslld_avx(auVar188._16_16_,0x17);
          auVar238 = vpaddd_avx(auVar238,auVar311);
          auVar239 = vpaddd_avx(auVar239,auVar311);
          auVar189._0_4_ =
               fVar307 + (fVar351 * fVar351 *
                          (((((fVar351 * 0.00019875691 + 0.0013981999) * fVar351 + 0.008333452) *
                             fVar351 + 0.041665796) * fVar351 + 0.16666666) * fVar351 + fVar202) +
                         fVar307 + fVar351) * auVar282._0_4_;
          auVar189._4_4_ =
               fVar230 + (fVar301 * fVar301 *
                          (((((fVar301 * 0.00019875691 + 0.0013981999) * fVar301 + 0.008333452) *
                             fVar301 + 0.041665796) * fVar301 + 0.16666666) * fVar301 + fVar204) +
                         fVar230 + fVar301) * auVar282._4_4_;
          auVar189._8_4_ =
               fVar231 + (fVar303 * fVar303 *
                          (((((fVar303 * 0.00019875691 + 0.0013981999) * fVar303 + 0.008333452) *
                             fVar303 + 0.041665796) * fVar303 + 0.16666666) * fVar303 + fVar232) +
                         fVar231 + fVar303) * auVar282._8_4_;
          auVar189._12_4_ =
               fVar233 + (fVar305 * fVar305 *
                          (((((fVar305 * 0.00019875691 + 0.0013981999) * fVar305 + 0.008333452) *
                             fVar305 + 0.041665796) * fVar305 + 0.16666666) * fVar305 + fVar234) +
                         fVar233 + fVar305) * auVar282._12_4_;
          auVar189._16_4_ =
               fVar235 + (fVar4 * fVar4 *
                          (((((fVar4 * 0.00019875691 + 0.0013981999) * fVar4 + 0.008333452) * fVar4
                            + 0.041665796) * fVar4 + 0.16666666) * fVar4 + fVar258) +
                         fVar235 + fVar4) * auVar237._0_4_;
          auVar189._20_4_ =
               fVar344 + (fVar5 * fVar5 *
                          (((((fVar5 * 0.00019875691 + 0.0013981999) * fVar5 + 0.008333452) * fVar5
                            + 0.041665796) * fVar5 + 0.16666666) * fVar5 + fVar259) +
                         fVar344 + fVar5) * auVar237._4_4_;
          auVar189._24_4_ =
               fVar347 + (fVar6 * fVar6 *
                          (((((fVar6 * 0.00019875691 + 0.0013981999) * fVar6 + 0.008333452) * fVar6
                            + 0.041665796) * fVar6 + 0.16666666) * fVar6 + fVar260) +
                         fVar347 + fVar6) * auVar237._8_4_;
          auVar189._28_4_ = fVar348 + auVar145._28_4_ + fVar348 + auVar228._28_4_;
          auVar48._8_4_ = 0x40000000;
          auVar48._0_8_ = 0x4000000040000000;
          auVar48._12_4_ = 0x40000000;
          auVar48._16_4_ = 0x40000000;
          auVar48._20_4_ = 0x40000000;
          auVar48._24_4_ = 0x40000000;
          auVar48._28_4_ = 0x40000000;
          auVar253 = vdivps_avx(auVar48,auVar189);
          auVar143._0_4_ =
               fVar307 + (fVar261 * fVar261 *
                          (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) *
                             fVar261 + 0.041665796) * fVar261 + 0.16666666) * fVar261 + fVar202) +
                         fVar307 + fVar261) * auVar239._0_4_;
          auVar143._4_4_ =
               fVar230 + (fVar281 * fVar281 *
                          (((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) *
                             fVar281 + 0.041665796) * fVar281 + 0.16666666) * fVar281 + fVar204) +
                         fVar230 + fVar281) * auVar239._4_4_;
          auVar143._8_4_ =
               fVar231 + (fVar302 * fVar302 *
                          (((((fVar302 * 0.00019875691 + 0.0013981999) * fVar302 + 0.008333452) *
                             fVar302 + 0.041665796) * fVar302 + 0.16666666) * fVar302 + fVar232) +
                         fVar231 + fVar302) * auVar239._8_4_;
          auVar143._12_4_ =
               fVar233 + (fVar304 * fVar304 *
                          (((((fVar304 * 0.00019875691 + 0.0013981999) * fVar304 + 0.008333452) *
                             fVar304 + 0.041665796) * fVar304 + 0.16666666) * fVar304 + fVar234) +
                         fVar233 + fVar304) * auVar239._12_4_;
          auVar143._16_4_ =
               fVar235 + (fVar306 * fVar306 *
                          (((((fVar306 * 0.00019875691 + 0.0013981999) * fVar306 + 0.008333452) *
                             fVar306 + 0.041665796) * fVar306 + 0.16666666) * fVar306 + fVar258) +
                         fVar235 + fVar306) * auVar238._0_4_;
          auVar143._20_4_ =
               fVar344 + (fVar349 * fVar349 *
                          (((((fVar349 * 0.00019875691 + 0.0013981999) * fVar349 + 0.008333452) *
                             fVar349 + 0.041665796) * fVar349 + 0.16666666) * fVar349 + fVar259) +
                         fVar344 + fVar349) * auVar238._4_4_;
          auVar143._24_4_ =
               fVar347 + (fVar350 * fVar350 *
                          (((((fVar350 * 0.00019875691 + 0.0013981999) * fVar350 + 0.008333452) *
                             fVar350 + 0.041665796) * fVar350 + 0.16666666) * fVar350 + fVar260) +
                         fVar347 + fVar350) * auVar238._8_4_;
          auVar143._28_4_ = fVar348 + auVar147._28_4_ + fVar348 + auVar49._28_4_;
          auVar49 = vdivps_avx(auVar48,auVar143);
          fVar202 = auVar253._28_4_ + -1.0;
          auVar290._0_4_ = auVar299._0_4_ * (auVar253._0_4_ + -1.0);
          auVar290._4_4_ = auVar299._4_4_ * (auVar253._4_4_ + -1.0);
          auVar290._8_4_ = auVar299._8_4_ * (auVar253._8_4_ + -1.0);
          auVar290._12_4_ = auVar299._12_4_ * (auVar253._12_4_ + -1.0);
          auVar290._16_4_ = auVar299._16_4_ * (auVar253._16_4_ + -1.0);
          auVar290._20_4_ = auVar299._20_4_ * (auVar253._20_4_ + -1.0);
          auVar290._24_4_ = auVar299._24_4_ * (auVar253._24_4_ + -1.0);
          auVar144._0_4_ = auVar49._0_4_ + -1.0;
          auVar144._4_4_ = auVar49._4_4_ + -1.0;
          auVar144._8_4_ = auVar49._8_4_ + -1.0;
          auVar144._12_4_ = auVar49._12_4_ + -1.0;
          auVar144._16_4_ = auVar49._16_4_ + -1.0;
          auVar144._20_4_ = auVar49._20_4_ + -1.0;
          auVar144._24_4_ = auVar49._24_4_ + -1.0;
          auVar144._28_4_ = auVar49._28_4_ + -1.0;
          goto LAB_0046ba16;
        case 6:
          fVar307 = *(float *)*in_stack_00000020;
          fVar202 = ((float *)*in_stack_00000020)[1];
          auVar228._0_4_ = auVar299._0_4_ * fVar307 + fVar202;
          auVar228._4_4_ = auVar299._4_4_ * fVar307 + fVar202;
          auVar228._8_4_ = auVar299._8_4_ * fVar307 + fVar202;
          auVar228._12_4_ = auVar299._12_4_ * fVar307 + fVar202;
          auVar228._16_4_ = auVar299._16_4_ * fVar307 + fVar202;
          auVar228._20_4_ = auVar299._20_4_ * fVar307 + fVar202;
          auVar228._24_4_ = auVar299._24_4_ * fVar307 + fVar202;
          auVar228._28_4_ = in_ZMM8._28_4_ + fVar202;
          in_ZMM13 = ZEXT864(0) << 0x20;
          auVar253 = vmaxps_avx(auVar228,ZEXT832(0) << 0x20);
          auVar253 = vminps_avx(auVar253,auVar270);
          auVar290._0_4_ = auVar253._0_4_ * auVar299._0_4_;
          auVar290._4_4_ = auVar253._4_4_ * auVar299._4_4_;
          auVar290._8_4_ = auVar253._8_4_ * auVar299._8_4_;
          auVar290._12_4_ = auVar253._12_4_ * auVar299._12_4_;
          auVar290._16_4_ = auVar253._16_4_ * auVar299._16_4_;
          auVar290._20_4_ = auVar253._20_4_ * auVar299._20_4_;
          auVar290._24_4_ = auVar253._24_4_ * auVar299._24_4_;
          auVar145._0_4_ = auVar245._0_4_ * fVar307 + fVar202;
          auVar145._4_4_ = auVar245._4_4_ * fVar307 + fVar202;
          auVar145._8_4_ = auVar245._8_4_ * fVar307 + fVar202;
          auVar145._12_4_ = auVar245._12_4_ * fVar307 + fVar202;
          auVar145._16_4_ = auVar245._16_4_ * fVar307 + fVar202;
          auVar145._20_4_ = auVar245._20_4_ * fVar307 + fVar202;
          auVar145._24_4_ = auVar245._24_4_ * fVar307 + fVar202;
          auVar145._28_4_ = fVar307 + fVar202;
          auVar253 = vmaxps_avx(ZEXT832(0) << 0x20,auVar145);
          auVar144 = vminps_avx(auVar270,auVar253);
LAB_0046ba16:
          in_ZMM12 = ZEXT3264(CONCAT428(auVar272._28_4_,auVar290));
          auVar203 = ZEXT436((uint)fVar202);
          auVar114 = ZEXT436(auVar144._28_4_);
          auVar245._0_4_ = auVar245._0_4_ * auVar144._0_4_;
          auVar245._4_4_ = auVar245._4_4_ * auVar144._4_4_;
          auVar245._8_4_ = auVar245._8_4_ * auVar144._8_4_;
          auVar245._12_4_ = auVar245._12_4_ * auVar144._12_4_;
          auVar245._16_4_ = auVar245._16_4_ * auVar144._16_4_;
          auVar245._20_4_ = auVar245._20_4_ * auVar144._20_4_;
          auVar245._24_4_ = auVar245._24_4_ * auVar144._24_4_;
        }
        auVar272._0_4_ = in_ZMM12._0_4_ * (float)local_f8._0_4_;
        auVar272._4_4_ = in_ZMM12._4_4_ * (float)local_f8._4_4_;
        auVar272._8_4_ = in_ZMM12._8_4_ * fStack_f0;
        auVar272._12_4_ = in_ZMM12._12_4_ * fStack_ec;
        auVar272._16_4_ = in_ZMM12._16_4_ * fStack_e8;
        auVar272._20_4_ = in_ZMM12._20_4_ * fStack_e4;
        auVar272._24_4_ = in_ZMM12._24_4_ * fStack_e0;
        auVar272._28_36_ = auVar114;
        auVar200._0_4_ = auVar245._0_4_ * (float)local_f8._0_4_;
        auVar200._4_4_ = auVar245._4_4_ * (float)local_f8._4_4_;
        auVar200._8_4_ = auVar245._8_4_ * fStack_f0;
        auVar200._12_4_ = auVar245._12_4_ * fStack_ec;
        auVar200._16_4_ = auVar245._16_4_ * fStack_e8;
        auVar200._20_4_ = auVar245._20_4_ * fStack_e4;
        auVar200._24_4_ = auVar245._24_4_ * fStack_e0;
        auVar200._28_36_ = auVar203;
        auVar253 = vandps_avx(auVar272._0_32_,auVar300._0_32_);
        auVar49 = vandps_avx(auVar200._0_32_,auVar300._0_32_);
        auVar253 = vorps_avx(auVar253,auVar334._0_32_);
        auVar49 = vorps_avx(auVar49,auVar334._0_32_);
        auVar116._0_4_ = (int)(auVar253._0_4_ + auVar272._0_4_);
        auVar116._4_4_ = (int)(auVar253._4_4_ + auVar272._4_4_);
        auVar116._8_4_ = (int)(auVar253._8_4_ + auVar272._8_4_);
        auVar116._12_4_ = (int)(auVar253._12_4_ + auVar272._12_4_);
        auVar146._16_4_ = (int)(auVar253._16_4_ + auVar272._16_4_);
        auVar146._0_16_ = auVar116;
        auVar146._20_4_ = (int)(auVar253._20_4_ + auVar272._20_4_);
        auVar146._24_4_ = (int)(auVar253._24_4_ + auVar272._24_4_);
        auVar146._28_4_ = (int)(auVar253._28_4_ + auVar114._0_4_);
        auVar153._0_4_ = (int)(auVar49._0_4_ + auVar200._0_4_);
        auVar153._4_4_ = (int)(auVar49._4_4_ + auVar200._4_4_);
        auVar153._8_4_ = (int)(auVar49._8_4_ + auVar200._8_4_);
        auVar153._12_4_ = (int)(auVar49._12_4_ + auVar200._12_4_);
        auVar191._16_4_ = (int)(auVar49._16_4_ + auVar200._16_4_);
        auVar191._0_16_ = auVar153;
        auVar191._20_4_ = (int)(auVar49._20_4_ + auVar200._20_4_);
        auVar191._24_4_ = (int)(auVar49._24_4_ + auVar200._24_4_);
        auVar191._28_4_ = (int)(auVar49._28_4_ + auVar203._0_4_);
        in_ZMM8 = ZEXT1664(auVar146._16_16_);
        auVar237 = vpackssdw_avx(auVar116,auVar146._16_16_);
        auVar282 = vpackssdw_avx(auVar153,auVar191._16_16_);
        auVar237 = vpminsw_avx(auVar237,auVar84._0_16_);
        auVar282 = vpminsw_avx(auVar282,auVar84._0_16_);
        auVar237 = vpmaxsw_avx(auVar237,auVar113._0_16_);
        auVar282 = vpmaxsw_avx(auVar282,auVar113._0_16_);
        in_ZMM7 = ZEXT1664(auVar282);
        auVar237 = vpacksswb_avx(auVar237,auVar282);
        in_ZMM6 = ZEXT1664(auVar237);
        *(undefined1 (*) [16])ptr = auVar237;
        intptr = (int *)((long)intptr + 0x40);
        ptr = (char *)((long)ptr + 0x10);
        iVar33 = iVar33 + 0x10;
        auVar272 = in_ZMM12;
      } while (iVar33 < (int)uVar34);
    }
    if ((int)(uVar31 | 7) < (int)uVar34) {
      pfVar3 = (float *)*in_stack_00000020;
      auVar300 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar77._8_4_ = 0x3f000000;
      auVar77._0_8_ = 0x3f0000003f000000;
      auVar77._12_4_ = 0x3f000000;
      auVar77._16_4_ = 0x3f000000;
      auVar77._20_4_ = 0x3f000000;
      auVar77._24_4_ = 0x3f000000;
      auVar77._28_4_ = 0x3f000000;
      auVar113 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
      auVar334 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
      auVar84 = ZEXT1664((undefined1  [16])0x0);
      auVar272 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                    CONCAT424(0x42b0c0a5,
                                              CONCAT420(0x42b0c0a5,
                                                        CONCAT416(0x42b0c0a5,
                                                                  CONCAT412(0x42b0c0a5,
                                                                            CONCAT48(0x42b0c0a5,
                                                                                                                                                                          
                                                  0x42b0c0a542b0c0a5)))))));
      auVar273 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar271._8_4_ = 0x3f800000;
      auVar271._0_8_ = 0x3f8000003f800000;
      auVar271._12_4_ = 0x3f800000;
      auVar271._16_4_ = 0x3f800000;
      auVar271._20_4_ = 0x3f800000;
      auVar271._24_4_ = 0x3f800000;
      auVar271._28_4_ = 0x3f800000;
      uVar32 = uVar31;
      do {
        auVar114 = in_ZMM7._28_36_;
        auVar253 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        auVar246._0_4_ = auVar253._0_4_ * (float)local_d8._0_4_;
        auVar246._4_4_ = auVar253._4_4_ * (float)local_d8._4_4_;
        auVar246._8_4_ = auVar253._8_4_ * fStack_d0;
        auVar246._12_4_ = auVar253._12_4_ * fStack_cc;
        auVar246._16_4_ = auVar253._16_4_ * fStack_c8;
        auVar246._20_4_ = auVar253._20_4_ * fStack_c4;
        auVar246._24_4_ = auVar253._24_4_ * fStack_c0;
        auVar25._28_4_ = auVar253._28_4_;
        auVar25._0_28_ = auVar246;
        auVar147 = auVar84._0_32_;
        auVar49 = auVar272._0_32_;
        auVar144 = auVar273._0_32_;
        switch(elempack) {
        case 1:
          auVar253 = vmaxps_avx(auVar25,auVar147);
          auVar246 = auVar253._0_28_;
          break;
        case 2:
          auVar253 = vmaxps_avx(auVar25,auVar147);
          in_ZMM12 = ZEXT3264(auVar253);
          auVar49 = vminps_avx(auVar25,auVar147);
          fVar307 = *pfVar3;
          in_ZMM13 = ZEXT3264(CONCAT428(fVar307,CONCAT424(fVar307,CONCAT420(fVar307,CONCAT416(
                                                  fVar307,CONCAT412(fVar307,CONCAT48(fVar307,
                                                  CONCAT44(fVar307,fVar307))))))));
          auVar246._0_4_ = fVar307 * auVar49._0_4_ + auVar253._0_4_;
          auVar246._4_4_ = fVar307 * auVar49._4_4_ + auVar253._4_4_;
          auVar246._8_4_ = fVar307 * auVar49._8_4_ + auVar253._8_4_;
          auVar246._12_4_ = fVar307 * auVar49._12_4_ + auVar253._12_4_;
          auVar246._16_4_ = fVar307 * auVar49._16_4_ + auVar253._16_4_;
          auVar246._20_4_ = fVar307 * auVar49._20_4_ + auVar253._20_4_;
          auVar246._24_4_ = fVar307 * auVar49._24_4_ + auVar253._24_4_;
          break;
        case 3:
          fVar307 = *pfVar3;
          auVar296._4_4_ = fVar307;
          auVar296._0_4_ = fVar307;
          auVar296._8_4_ = fVar307;
          auVar296._12_4_ = fVar307;
          auVar296._16_4_ = fVar307;
          auVar296._20_4_ = fVar307;
          auVar296._24_4_ = fVar307;
          auVar296._28_4_ = fVar307;
          in_ZMM12 = ZEXT3264(auVar296);
          fVar307 = pfVar3[1];
          auVar333._4_4_ = fVar307;
          auVar333._0_4_ = fVar307;
          auVar333._8_4_ = fVar307;
          auVar333._12_4_ = fVar307;
          auVar333._16_4_ = fVar307;
          auVar333._20_4_ = fVar307;
          auVar333._24_4_ = fVar307;
          auVar333._28_4_ = fVar307;
          in_ZMM13 = ZEXT3264(auVar333);
          auVar253 = vmaxps_avx(auVar25,auVar296);
          auVar253 = vminps_avx(auVar253,auVar333);
          auVar246 = auVar253._0_28_;
          break;
        case 4:
          auVar256._0_4_ = (uint)auVar246._0_4_ ^ auVar300._0_4_;
          auVar256._4_4_ = (uint)auVar246._4_4_ ^ auVar300._4_4_;
          auVar256._8_4_ = (uint)auVar246._8_4_ ^ auVar300._8_4_;
          auVar256._12_4_ = (uint)auVar246._12_4_ ^ auVar300._12_4_;
          auVar256._16_4_ = (uint)auVar246._16_4_ ^ auVar300._16_4_;
          auVar256._20_4_ = (uint)auVar246._20_4_ ^ auVar300._20_4_;
          auVar256._24_4_ = (uint)auVar246._24_4_ ^ auVar300._24_4_;
          auVar256._28_4_ = auVar253._28_4_ ^ auVar300._28_4_;
          auVar253 = vminps_avx(auVar256,auVar49);
          auVar49 = vmaxps_avx(auVar253,auVar144);
          auVar297._0_4_ = auVar49._0_4_ * 1.442695 + 0.5;
          auVar297._4_4_ = auVar49._4_4_ * 1.442695 + 0.5;
          auVar297._8_4_ = auVar49._8_4_ * 1.442695 + 0.5;
          auVar297._12_4_ = auVar49._12_4_ * 1.442695 + 0.5;
          auVar297._16_4_ = auVar49._16_4_ * 1.442695 + 0.5;
          auVar297._20_4_ = auVar49._20_4_ * 1.442695 + 0.5;
          auVar297._24_4_ = auVar49._24_4_ * 1.442695 + 0.5;
          auVar297._28_4_ = in_ZMM12._28_4_ + 0.5;
          auVar147 = vroundps_avx(auVar297,1);
          auVar253 = vcmpps_avx(auVar297,auVar147,1);
          auVar253 = vandps_avx(auVar253,auVar271);
          auVar253 = vsubps_avx(auVar147,auVar253);
          auVar114 = ZEXT436(0xbf317218);
          fVar307 = auVar49._0_4_ + auVar253._0_4_ * -0.6931472;
          fVar202 = auVar49._4_4_ + auVar253._4_4_ * -0.6931472;
          fVar204 = auVar49._8_4_ + auVar253._8_4_ * -0.6931472;
          fVar230 = auVar49._12_4_ + auVar253._12_4_ * -0.6931472;
          fVar231 = auVar49._16_4_ + auVar253._16_4_ * -0.6931472;
          fVar232 = auVar49._20_4_ + auVar253._20_4_ * -0.6931472;
          fVar233 = auVar49._24_4_ + auVar253._24_4_ * -0.6931472;
          auVar287._0_4_ = (int)auVar253._0_4_;
          auVar287._4_4_ = (int)auVar253._4_4_;
          auVar287._8_4_ = (int)auVar253._8_4_;
          auVar287._12_4_ = (int)auVar253._12_4_;
          auVar298._16_4_ = (int)auVar253._16_4_;
          auVar298._0_16_ = auVar287;
          auVar298._20_4_ = (int)auVar253._20_4_;
          auVar298._24_4_ = (int)auVar253._24_4_;
          auVar298._28_4_ = (int)auVar253._28_4_;
          auVar282 = vpslld_avx(auVar287,0x17);
          auVar237 = vpslld_avx(auVar298._16_16_,0x17);
          auVar51._8_4_ = 0x3f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar51._12_4_ = 0x3f800000;
          auVar237 = vpaddd_avx(auVar237,auVar51);
          auVar282 = vpaddd_avx(auVar282,auVar51);
          in_ZMM13 = ZEXT1664(auVar282);
          in_ZMM12 = ZEXT3264(CONCAT1616(auVar237,auVar282));
          auVar257._0_4_ =
               (fVar307 + 1.0 +
               fVar307 * fVar307 *
               (((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) * fVar307 +
                 0.041665796) * fVar307 + 0.16666666) * fVar307 + 0.5)) * auVar282._0_4_ + 1.0;
          auVar257._4_4_ =
               (fVar202 + 1.0 +
               fVar202 * fVar202 *
               (((((fVar202 * 0.00019875691 + 0.0013981999) * fVar202 + 0.008333452) * fVar202 +
                 0.041665796) * fVar202 + 0.16666666) * fVar202 + 0.5)) * auVar282._4_4_ + 1.0;
          auVar257._8_4_ =
               (fVar204 + 1.0 +
               fVar204 * fVar204 *
               (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                 0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5)) * auVar282._8_4_ + 1.0;
          auVar257._12_4_ =
               (fVar230 + 1.0 +
               fVar230 * fVar230 *
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5)) * auVar282._12_4_ + 1.0;
          auVar257._16_4_ =
               (fVar231 + 1.0 +
               fVar231 * fVar231 *
               (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                 0.041665796) * fVar231 + 0.16666666) * fVar231 + 0.5)) * auVar237._0_4_ + 1.0;
          auVar257._20_4_ =
               (fVar232 + 1.0 +
               fVar232 * fVar232 *
               (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                 0.041665796) * fVar232 + 0.16666666) * fVar232 + 0.5)) * auVar237._4_4_ + 1.0;
          auVar257._24_4_ =
               (fVar233 + 1.0 +
               fVar233 * fVar233 *
               (((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) * fVar233 +
                 0.041665796) * fVar233 + 0.16666666) * fVar233 + 0.5)) * auVar237._8_4_ + 1.0;
          auVar257._28_4_ = auVar49._28_4_ + auVar147._28_4_ + 1.0 + auVar147._28_4_ + 1.0;
          auVar253 = vdivps_avx(auVar271,auVar257);
          auVar246 = auVar253._0_28_;
          break;
        case 5:
          auVar253 = vminps_avx(auVar25,auVar49);
          auVar147 = vmaxps_avx(auVar253,auVar144);
          auVar331._0_4_ = auVar147._0_4_ * 1.442695 + 0.5;
          auVar331._4_4_ = auVar147._4_4_ * 1.442695 + 0.5;
          auVar331._8_4_ = auVar147._8_4_ * 1.442695 + 0.5;
          auVar331._12_4_ = auVar147._12_4_ * 1.442695 + 0.5;
          auVar331._16_4_ = auVar147._16_4_ * 1.442695 + 0.5;
          auVar331._20_4_ = auVar147._20_4_ * 1.442695 + 0.5;
          auVar331._24_4_ = auVar147._24_4_ * 1.442695 + 0.5;
          auVar331._28_4_ = in_ZMM13._28_4_ + 0.5;
          auVar270 = vroundps_avx(auVar331,1);
          auVar253 = vcmpps_avx(auVar331,auVar270,1);
          auVar253 = vandps_avx(auVar253,auVar271);
          auVar253 = vsubps_avx(auVar270,auVar253);
          auVar26._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar26._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar26._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar26._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar26._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar26._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar26._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar26._28_4_ = auVar270._28_4_;
          auVar147 = vsubps_avx(auVar147,auVar26);
          fVar307 = auVar147._0_4_;
          fVar202 = auVar147._4_4_;
          fVar204 = auVar147._8_4_;
          fVar230 = auVar147._12_4_;
          fVar231 = auVar147._16_4_;
          fVar232 = auVar147._20_4_;
          fVar233 = auVar147._24_4_;
          auVar314._0_4_ = (int)auVar253._0_4_;
          auVar314._4_4_ = (int)auVar253._4_4_;
          auVar314._8_4_ = (int)auVar253._8_4_;
          auVar314._12_4_ = (int)auVar253._12_4_;
          auVar332._16_4_ = (int)auVar253._16_4_;
          auVar332._0_16_ = auVar314;
          auVar332._20_4_ = (int)auVar253._20_4_;
          auVar332._24_4_ = (int)auVar253._24_4_;
          auVar332._28_4_ = (int)auVar253._28_4_;
          auVar282 = vpslld_avx(auVar314,0x17);
          auVar237 = vpslld_avx(auVar332._16_16_,0x17);
          auVar50._8_4_ = 0x3f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar50._12_4_ = 0x3f800000;
          auVar237 = vpaddd_avx(auVar237,auVar50);
          auVar282 = vpaddd_avx(auVar282,auVar50);
          auVar295._0_4_ =
               (fVar307 + 1.0 +
               fVar307 * fVar307 *
               (((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) * fVar307 +
                 0.041665796) * fVar307 + 0.16666666) * fVar307 + 0.5)) * auVar282._0_4_ + 1.0;
          auVar295._4_4_ =
               (fVar202 + 1.0 +
               fVar202 * fVar202 *
               (((((fVar202 * 0.00019875691 + 0.0013981999) * fVar202 + 0.008333452) * fVar202 +
                 0.041665796) * fVar202 + 0.16666666) * fVar202 + 0.5)) * auVar282._4_4_ + 1.0;
          auVar295._8_4_ =
               (fVar204 + 1.0 +
               fVar204 * fVar204 *
               (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                 0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5)) * auVar282._8_4_ + 1.0;
          auVar295._12_4_ =
               (fVar230 + 1.0 +
               fVar230 * fVar230 *
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5)) * auVar282._12_4_ + 1.0;
          auVar295._16_4_ =
               (fVar231 + 1.0 +
               fVar231 * fVar231 *
               (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                 0.041665796) * fVar231 + 0.16666666) * fVar231 + 0.5)) * auVar237._0_4_ + 1.0;
          auVar295._20_4_ =
               (fVar232 + 1.0 +
               fVar232 * fVar232 *
               (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                 0.041665796) * fVar232 + 0.16666666) * fVar232 + 0.5)) * auVar237._4_4_ + 1.0;
          auVar295._24_4_ =
               (fVar233 + 1.0 +
               fVar233 * fVar233 *
               (((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) * fVar233 +
                 0.041665796) * fVar233 + 0.16666666) * fVar233 + 0.5)) * auVar237._8_4_ + 1.0;
          auVar295._28_4_ = auVar147._28_4_ + 1.0 + auVar270._28_4_ + 1.0;
          auVar192._8_4_ = 0x800000;
          auVar192._0_8_ = 0x80000000800000;
          auVar192._12_4_ = 0x800000;
          auVar192._16_4_ = 0x800000;
          auVar192._20_4_ = 0x800000;
          auVar192._24_4_ = 0x800000;
          auVar192._28_4_ = 0x800000;
          auVar270 = vmaxps_avx(auVar295,auVar192);
          auVar237 = vpsrld_avx(auVar270._16_16_,0x17);
          auVar193._8_4_ = 0x807fffff;
          auVar193._0_8_ = 0x807fffff807fffff;
          auVar193._12_4_ = 0x807fffff;
          auVar193._16_4_ = 0x807fffff;
          auVar193._20_4_ = 0x807fffff;
          auVar193._24_4_ = 0x807fffff;
          auVar193._28_4_ = 0x807fffff;
          auVar253 = vandps_avx(auVar270,auVar193);
          auVar145 = vorps_avx(auVar253,auVar77);
          auVar194._8_4_ = 0x3f3504f3;
          auVar194._0_8_ = 0x3f3504f33f3504f3;
          auVar194._12_4_ = 0x3f3504f3;
          auVar194._16_4_ = 0x3f3504f3;
          auVar194._20_4_ = 0x3f3504f3;
          auVar194._24_4_ = 0x3f3504f3;
          auVar194._28_4_ = 0x3f3504f3;
          auVar147 = vcmpps_avx(auVar194,auVar145,2);
          auVar253 = vandnps_avx(auVar147,auVar145);
          fVar307 = auVar145._0_4_ + -1.0 + auVar253._0_4_;
          fVar202 = auVar145._4_4_ + -1.0 + auVar253._4_4_;
          fVar204 = auVar145._8_4_ + -1.0 + auVar253._8_4_;
          fVar230 = auVar145._12_4_ + -1.0 + auVar253._12_4_;
          fVar231 = auVar145._16_4_ + -1.0 + auVar253._16_4_;
          fVar232 = auVar145._20_4_ + -1.0 + auVar253._20_4_;
          fVar233 = auVar145._24_4_ + -1.0 + auVar253._24_4_;
          auVar237 = vpsubd_avx(auVar237,auVar147._16_16_);
          auVar273 = ZEXT3264(auVar144);
          auVar272 = ZEXT3264(auVar49);
          auVar84 = ZEXT864(0) << 0x20;
          auVar282 = vpsrld_avx(auVar270._0_16_,0x17);
          auVar208._8_4_ = 0xffffff81;
          auVar208._0_8_ = 0xffffff81ffffff81;
          auVar208._12_4_ = 0xffffff81;
          auVar237 = vpaddd_avx(auVar208,auVar237);
          auVar282 = vpsubd_avx(auVar282,auVar147._0_16_);
          auVar282 = vpaddd_avx(auVar282,auVar208);
          auVar195._16_16_ = auVar237;
          auVar195._0_16_ = auVar282;
          auVar147 = vcmpps_avx(auVar295,ZEXT832(0) << 0x20,2);
          auVar270 = vcvtdq2ps_avx(auVar195);
          auVar27._4_4_ =
               (fVar202 * fVar202 *
                (((((((((fVar202 * 0.070376836 + -0.1151461) * fVar202 + 0.116769984) * fVar202 +
                      -0.12420141) * fVar202 + 0.14249323) * fVar202 + -0.16668057) * fVar202 +
                   0.20000714) * fVar202 + -0.24999994) * fVar202 + 0.3333333) * fVar202 + -0.5) +
               fVar202 + auVar270._4_4_ * 0.6931472) * -2.0;
          auVar27._0_4_ =
               (fVar307 * fVar307 *
                (((((((((fVar307 * 0.070376836 + -0.1151461) * fVar307 + 0.116769984) * fVar307 +
                      -0.12420141) * fVar307 + 0.14249323) * fVar307 + -0.16668057) * fVar307 +
                   0.20000714) * fVar307 + -0.24999994) * fVar307 + 0.3333333) * fVar307 + -0.5) +
               fVar307 + auVar270._0_4_ * 0.6931472) * -2.0;
          auVar27._8_4_ =
               (fVar204 * fVar204 *
                (((((((((fVar204 * 0.070376836 + -0.1151461) * fVar204 + 0.116769984) * fVar204 +
                      -0.12420141) * fVar204 + 0.14249323) * fVar204 + -0.16668057) * fVar204 +
                   0.20000714) * fVar204 + -0.24999994) * fVar204 + 0.3333333) * fVar204 + -0.5) +
               fVar204 + auVar270._8_4_ * 0.6931472) * -2.0;
          auVar27._12_4_ =
               (fVar230 * fVar230 *
                (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) * fVar230 +
                      -0.12420141) * fVar230 + 0.14249323) * fVar230 + -0.16668057) * fVar230 +
                   0.20000714) * fVar230 + -0.24999994) * fVar230 + 0.3333333) * fVar230 + -0.5) +
               fVar230 + auVar270._12_4_ * 0.6931472) * -2.0;
          auVar27._16_4_ =
               (fVar231 * fVar231 *
                (((((((((fVar231 * 0.070376836 + -0.1151461) * fVar231 + 0.116769984) * fVar231 +
                      -0.12420141) * fVar231 + 0.14249323) * fVar231 + -0.16668057) * fVar231 +
                   0.20000714) * fVar231 + -0.24999994) * fVar231 + 0.3333333) * fVar231 + -0.5) +
               fVar231 + auVar270._16_4_ * 0.6931472) * -2.0;
          auVar27._20_4_ =
               (fVar232 * fVar232 *
                (((((((((fVar232 * 0.070376836 + -0.1151461) * fVar232 + 0.116769984) * fVar232 +
                      -0.12420141) * fVar232 + 0.14249323) * fVar232 + -0.16668057) * fVar232 +
                   0.20000714) * fVar232 + -0.24999994) * fVar232 + 0.3333333) * fVar232 + -0.5) +
               fVar232 + auVar270._20_4_ * 0.6931472) * -2.0;
          auVar27._24_4_ =
               (fVar233 * fVar233 *
                (((((((((fVar233 * 0.070376836 + -0.1151461) * fVar233 + 0.116769984) * fVar233 +
                      -0.12420141) * fVar233 + 0.14249323) * fVar233 + -0.16668057) * fVar233 +
                   0.20000714) * fVar233 + -0.24999994) * fVar233 + 0.3333333) * fVar233 + -0.5) +
               fVar233 + auVar270._24_4_ * 0.6931472) * -2.0;
          auVar27._28_4_ = auVar145._28_4_ + -1.0 + auVar253._28_4_ + auVar270._28_4_ + 0.0;
          auVar229._8_4_ = 0x7fffffff;
          auVar229._0_8_ = 0x7fffffff7fffffff;
          auVar229._12_4_ = 0x7fffffff;
          auVar229._16_4_ = 0x7fffffff;
          auVar229._20_4_ = 0x7fffffff;
          auVar229._24_4_ = 0x7fffffff;
          auVar229._28_4_ = 0x7fffffff;
          auVar253 = vblendvps_avx(auVar27,auVar229,auVar147);
          auVar253 = vminps_avx(auVar253,auVar49);
          auVar49 = vmaxps_avx(auVar144,auVar253);
          auVar113 = ZEXT1664(auVar113._0_16_);
          auVar334 = ZEXT1664(auVar334._0_16_);
          auVar300 = ZEXT3264(CONCAT428(0x80000000,
                                        CONCAT424(0x80000000,
                                                  CONCAT420(0x80000000,
                                                            CONCAT416(0x80000000,
                                                                      CONCAT412(0x80000000,
                                                                                CONCAT48(0x80000000,
                                                                                                                                                                                  
                                                  0x8000000080000000)))))));
          auVar278._0_4_ = auVar49._0_4_ * 1.442695 + 0.5;
          auVar278._4_4_ = auVar49._4_4_ * 1.442695 + 0.5;
          auVar278._8_4_ = auVar49._8_4_ * 1.442695 + 0.5;
          auVar278._12_4_ = auVar49._12_4_ * 1.442695 + 0.5;
          auVar278._16_4_ = auVar49._16_4_ * 1.442695 + 0.5;
          auVar278._20_4_ = auVar49._20_4_ * 1.442695 + 0.5;
          auVar278._24_4_ = auVar49._24_4_ * 1.442695 + 0.5;
          auVar278._28_4_ = 0x3f000000;
          auVar147 = vroundps_avx(auVar278,1);
          auVar253 = vcmpps_avx(auVar278,auVar147,1);
          auVar253 = vandps_avx(auVar253,auVar271);
          auVar253 = vsubps_avx(auVar147,auVar253);
          auVar28._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar28._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar28._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar28._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar28._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar28._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar28._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar28._28_4_ = auVar147._28_4_;
          auVar49 = vsubps_avx(auVar49,auVar28);
          fVar307 = auVar49._0_4_;
          fVar202 = auVar49._4_4_;
          fVar204 = auVar49._8_4_;
          fVar230 = auVar49._12_4_;
          fVar231 = auVar49._16_4_;
          fVar232 = auVar49._20_4_;
          fVar233 = auVar49._24_4_;
          fVar234 = ((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) * fVar307 +
                     0.041665796) * fVar307 + 0.16666666) * fVar307 + 0.5;
          fVar235 = ((((fVar202 * 0.00019875691 + 0.0013981999) * fVar202 + 0.008333452) * fVar202 +
                     0.041665796) * fVar202 + 0.16666666) * fVar202 + 0.5;
          fVar258 = ((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                     0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5;
          fVar344 = ((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                     0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5;
          fVar259 = ((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                     0.041665796) * fVar231 + 0.16666666) * fVar231 + 0.5;
          fVar347 = ((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                     0.041665796) * fVar232 + 0.16666666) * fVar232 + 0.5;
          fVar260 = ((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) * fVar233 +
                     0.041665796) * fVar233 + 0.16666666) * fVar233 + 0.5;
          in_ZMM13 = ZEXT3264(CONCAT428(0x3f37e013,
                                        CONCAT424(fVar260,CONCAT420(fVar347,CONCAT416(fVar259,
                                                  CONCAT412(fVar344,CONCAT48(fVar258,CONCAT44(
                                                  fVar235,fVar234))))))));
          auVar275._0_4_ = (int)auVar253._0_4_;
          auVar275._4_4_ = (int)auVar253._4_4_;
          auVar275._8_4_ = (int)auVar253._8_4_;
          auVar275._12_4_ = (int)auVar253._12_4_;
          auVar279._16_4_ = (int)auVar253._16_4_;
          auVar279._0_16_ = auVar275;
          auVar279._20_4_ = (int)auVar253._20_4_;
          auVar279._24_4_ = (int)auVar253._24_4_;
          auVar279._28_4_ = (int)auVar253._28_4_;
          auVar282 = vpslld_avx(auVar275,0x17);
          auVar237 = vpslld_avx(auVar279._16_16_,0x17);
          auVar237 = vpaddd_avx(auVar237,auVar50);
          auVar282 = vpaddd_avx(auVar282,auVar50);
          in_ZMM12 = ZEXT1664(auVar282);
          auVar196._0_4_ = auVar282._0_4_ * (fVar307 * fVar307 * fVar234 + fVar307 + 1.0) + 1.0;
          auVar196._4_4_ = auVar282._4_4_ * (fVar202 * fVar202 * fVar235 + fVar202 + 1.0) + 1.0;
          auVar196._8_4_ = auVar282._8_4_ * (fVar204 * fVar204 * fVar258 + fVar204 + 1.0) + 1.0;
          auVar196._12_4_ = auVar282._12_4_ * (fVar230 * fVar230 * fVar344 + fVar230 + 1.0) + 1.0;
          auVar196._16_4_ = auVar237._0_4_ * (fVar231 * fVar231 * fVar259 + fVar231 + 1.0) + 1.0;
          auVar196._20_4_ = auVar237._4_4_ * (fVar232 * fVar232 * fVar347 + fVar232 + 1.0) + 1.0;
          auVar196._24_4_ = auVar237._8_4_ * (fVar233 * fVar233 * fVar260 + fVar233 + 1.0) + 1.0;
          auVar196._28_4_ = auVar147._28_4_ + auVar49._28_4_ + 1.0 + 1.0;
          auVar67._8_4_ = 0x40000000;
          auVar67._0_8_ = 0x4000000040000000;
          auVar67._12_4_ = 0x40000000;
          auVar67._16_4_ = 0x40000000;
          auVar67._20_4_ = 0x40000000;
          auVar67._24_4_ = 0x40000000;
          auVar67._28_4_ = 0x40000000;
          auVar253 = vdivps_avx(auVar67,auVar196);
          auVar197._0_4_ = auVar253._0_4_ + -1.0;
          auVar197._4_4_ = auVar253._4_4_ + -1.0;
          auVar197._8_4_ = auVar253._8_4_ + -1.0;
          auVar197._12_4_ = auVar253._12_4_ + -1.0;
          auVar197._16_4_ = auVar253._16_4_ + -1.0;
          auVar197._20_4_ = auVar253._20_4_ + -1.0;
          auVar197._24_4_ = auVar253._24_4_ + -1.0;
          auVar197._28_4_ = auVar253._28_4_ + -1.0;
          goto LAB_0046bfc8;
        case 6:
          fVar307 = *pfVar3;
          fVar202 = pfVar3[1];
          auVar198._0_4_ = fVar202 + auVar246._0_4_ * fVar307;
          auVar198._4_4_ = fVar202 + auVar246._4_4_ * fVar307;
          auVar198._8_4_ = fVar202 + auVar246._8_4_ * fVar307;
          auVar198._12_4_ = fVar202 + auVar246._12_4_ * fVar307;
          auVar198._16_4_ = fVar202 + auVar246._16_4_ * fVar307;
          auVar198._20_4_ = fVar202 + auVar246._20_4_ * fVar307;
          auVar198._24_4_ = fVar202 + auVar246._24_4_ * fVar307;
          auVar198._28_4_ = fVar202 + fVar307;
          auVar253 = vmaxps_avx(auVar198,auVar147);
          auVar197 = vminps_avx(auVar271,auVar253);
LAB_0046bfc8:
          auVar280 = ZEXT3264(auVar276);
          auVar114 = ZEXT436(auVar197._28_4_);
          auVar246._0_4_ = auVar246._0_4_ * auVar197._0_4_;
          auVar246._4_4_ = auVar246._4_4_ * auVar197._4_4_;
          auVar246._8_4_ = auVar246._8_4_ * auVar197._8_4_;
          auVar246._12_4_ = auVar246._12_4_ * auVar197._12_4_;
          auVar246._16_4_ = auVar246._16_4_ * auVar197._16_4_;
          auVar246._20_4_ = auVar246._20_4_ * auVar197._20_4_;
          auVar246._24_4_ = auVar246._24_4_ * auVar197._24_4_;
        }
        auVar201._0_4_ = auVar246._0_4_ * (float)local_f8._0_4_;
        auVar201._4_4_ = auVar246._4_4_ * (float)local_f8._4_4_;
        auVar201._8_4_ = auVar246._8_4_ * fStack_f0;
        auVar201._12_4_ = auVar246._12_4_ * fStack_ec;
        auVar201._16_4_ = auVar246._16_4_ * fStack_e8;
        auVar201._20_4_ = auVar246._20_4_ * fStack_e4;
        auVar201._24_4_ = auVar246._24_4_ * fStack_e0;
        auVar201._28_36_ = auVar114;
        auVar253 = vandps_avx(auVar201._0_32_,auVar300._0_32_);
        auVar253 = vorps_avx(auVar253,auVar77);
        auVar154._0_4_ = (int)(auVar253._0_4_ + auVar201._0_4_);
        auVar154._4_4_ = (int)(auVar253._4_4_ + auVar201._4_4_);
        auVar154._8_4_ = (int)(auVar253._8_4_ + auVar201._8_4_);
        auVar154._12_4_ = (int)(auVar253._12_4_ + auVar201._12_4_);
        auVar199._16_4_ = (int)(auVar253._16_4_ + auVar201._16_4_);
        auVar199._0_16_ = auVar154;
        auVar199._20_4_ = (int)(auVar253._20_4_ + auVar201._20_4_);
        auVar199._24_4_ = (int)(auVar253._24_4_ + auVar201._24_4_);
        auVar199._28_4_ = (int)(auVar253._28_4_ + auVar114._0_4_);
        auVar237 = vpackssdw_avx(auVar154,auVar199._16_16_);
        auVar237 = vpminsw_avx(auVar113._0_16_,auVar237);
        auVar237 = vpmaxsw_avx(auVar237,auVar334._0_16_);
        auVar237 = vpacksswb_avx(auVar237,auVar237);
        in_ZMM7 = ZEXT1664(auVar237);
        *(long *)*(undefined1 (*) [16])ptr = auVar237._0_8_;
        intptr = (int *)((long)intptr + 0x20);
        ptr = *(undefined1 (*) [16])ptr + 8;
        uVar31 = uVar32 + 8;
        iVar33 = uVar32 + 0xf;
        uVar32 = uVar31;
      } while (iVar33 < (int)uVar34);
    }
    if ((int)(uVar31 | 3) < (int)uVar34) {
      auVar272 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar54._8_4_ = 0x3f000000;
      auVar54._0_8_ = 0x3f0000003f000000;
      auVar54._12_4_ = 0x3f000000;
      auVar84 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
      auVar300 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
      auVar334 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar210._8_4_ = 0x3f800000;
      auVar210._0_8_ = 0x3f8000003f800000;
      auVar210._12_4_ = 0x3f800000;
      uVar32 = uVar31;
      do {
        auVar237 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])intptr);
        auVar243._0_4_ = fVar1 * auVar237._0_4_;
        auVar243._4_4_ = fVar1 * auVar237._4_4_;
        auVar243._8_4_ = fVar1 * auVar237._8_4_;
        auVar243._12_4_ = fVar1 * auVar237._12_4_;
        auVar237 = auVar334._0_16_;
        switch(elempack) {
        case 1:
          auVar243 = vmaxps_avx(auVar243,auVar237);
          break;
        case 2:
          auVar282 = vmaxps_avx(auVar243,auVar237);
          auVar237 = vminps_avx(auVar243,auVar237);
          fVar307 = *(float *)*in_stack_00000020;
          auVar243._0_4_ = auVar237._0_4_ * fVar307 + auVar282._0_4_;
          auVar243._4_4_ = auVar237._4_4_ * fVar307 + auVar282._4_4_;
          auVar243._8_4_ = auVar237._8_4_ * fVar307 + auVar282._8_4_;
          auVar243._12_4_ = auVar237._12_4_ * fVar307 + auVar282._12_4_;
          break;
        case 3:
          uVar2 = *(undefined4 *)*in_stack_00000020;
          auVar99._4_4_ = uVar2;
          auVar99._0_4_ = uVar2;
          auVar99._8_4_ = uVar2;
          auVar99._12_4_ = uVar2;
          uVar2 = ((undefined4 *)*in_stack_00000020)[1];
          auVar134._4_4_ = uVar2;
          auVar134._0_4_ = uVar2;
          auVar134._8_4_ = uVar2;
          auVar134._12_4_ = uVar2;
          auVar237 = vmaxps_avx(auVar243,auVar99);
          auVar243 = vminps_avx(auVar237,auVar134);
          break;
        case 4:
          auVar100._0_4_ = (uint)auVar243._0_4_ ^ auVar272._0_4_;
          auVar100._4_4_ = (uint)auVar243._4_4_ ^ auVar272._4_4_;
          auVar100._8_4_ = (uint)auVar243._8_4_ ^ auVar272._8_4_;
          auVar100._12_4_ = (uint)auVar243._12_4_ ^ auVar272._12_4_;
          auVar135._8_4_ = 0x42b0c0a5;
          auVar135._0_8_ = 0x42b0c0a542b0c0a5;
          auVar135._12_4_ = 0x42b0c0a5;
          auVar237 = vminps_avx(auVar100,auVar135);
          auVar136._8_4_ = 0xc2b0c0a5;
          auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar136._12_4_ = 0xc2b0c0a5;
          auVar238 = vmaxps_avx(auVar237,auVar136);
          auVar137._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
          auVar137._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
          auVar137._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
          auVar137._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
          auVar244._0_4_ = (int)auVar137._0_4_;
          auVar244._4_4_ = (int)auVar137._4_4_;
          auVar244._8_4_ = (int)auVar137._8_4_;
          auVar244._12_4_ = (int)auVar137._12_4_;
          auVar282 = vcvtdq2ps_avx(auVar244);
          auVar237 = vcmpps_avx(auVar137,auVar282,1);
          auVar237 = vandps_avx(auVar210,auVar237);
          auVar237 = vsubps_avx(auVar282,auVar237);
          fVar307 = auVar237._0_4_ * -0.6931472 + auVar238._0_4_;
          fVar202 = auVar237._4_4_ * -0.6931472 + auVar238._4_4_;
          fVar204 = auVar237._8_4_ * -0.6931472 + auVar238._8_4_;
          fVar230 = auVar237._12_4_ * -0.6931472 + auVar238._12_4_;
          auVar138._0_4_ = (int)auVar237._0_4_;
          auVar138._4_4_ = (int)auVar237._4_4_;
          auVar138._8_4_ = (int)auVar237._8_4_;
          auVar138._12_4_ = (int)auVar237._12_4_;
          auVar237 = vpslld_avx(auVar138,0x17);
          auVar237 = vpaddd_avx(auVar210,auVar237);
          auVar101._0_4_ =
               (fVar307 + 1.0 +
               fVar307 * fVar307 *
               (((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) * fVar307 +
                 0.041665796) * fVar307 + 0.16666666) * fVar307 + 0.5)) * auVar237._0_4_ + 1.0;
          auVar101._4_4_ =
               (fVar202 + 1.0 +
               fVar202 * fVar202 *
               (((((fVar202 * 0.00019875691 + 0.0013981999) * fVar202 + 0.008333452) * fVar202 +
                 0.041665796) * fVar202 + 0.16666666) * fVar202 + 0.5)) * auVar237._4_4_ + 1.0;
          auVar101._8_4_ =
               (fVar204 + 1.0 +
               fVar204 * fVar204 *
               (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                 0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5)) * auVar237._8_4_ + 1.0;
          auVar101._12_4_ =
               (fVar230 + 1.0 +
               fVar230 * fVar230 *
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5)) * auVar237._12_4_ + 1.0;
          auVar243 = vdivps_avx(auVar210,auVar101);
          break;
        case 5:
          auVar289._8_4_ = 0x42b0c0a5;
          auVar289._0_8_ = 0x42b0c0a542b0c0a5;
          auVar289._12_4_ = 0x42b0c0a5;
          auVar237 = vminps_avx(auVar243,auVar289);
          auVar316._8_4_ = 0xc2b0c0a5;
          auVar316._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar316._12_4_ = 0xc2b0c0a5;
          auVar238 = vmaxps_avx(auVar316,auVar237);
          auVar128._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
          auVar128._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
          auVar128._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
          auVar128._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
          auVar159._0_4_ = (int)auVar128._0_4_;
          auVar159._4_4_ = (int)auVar128._4_4_;
          auVar159._8_4_ = (int)auVar128._8_4_;
          auVar159._12_4_ = (int)auVar128._12_4_;
          auVar282 = vcvtdq2ps_avx(auVar159);
          auVar237 = vcmpps_avx(auVar128,auVar282,1);
          auVar237 = vandps_avx(auVar210,auVar237);
          auVar237 = vsubps_avx(auVar282,auVar237);
          auVar160._0_4_ = auVar237._0_4_ * 0.6931472;
          auVar160._4_4_ = auVar237._4_4_ * 0.6931472;
          auVar160._8_4_ = auVar237._8_4_ * 0.6931472;
          auVar160._12_4_ = auVar237._12_4_ * 0.6931472;
          auVar282 = vsubps_avx(auVar238,auVar160);
          fVar307 = auVar282._0_4_;
          fVar202 = auVar282._4_4_;
          fVar204 = auVar282._8_4_;
          fVar230 = auVar282._12_4_;
          auVar129._0_4_ = (int)auVar237._0_4_;
          auVar129._4_4_ = (int)auVar237._4_4_;
          auVar129._8_4_ = (int)auVar237._8_4_;
          auVar129._12_4_ = (int)auVar237._12_4_;
          auVar237 = vpslld_avx(auVar129,0x17);
          auVar237 = vpaddd_avx(auVar210,auVar237);
          auVar96._0_4_ =
               (fVar307 + 1.0 +
               (((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) * fVar307 +
                 0.041665796) * fVar307 + 0.16666666) * fVar307 + 0.5) * fVar307 * fVar307) *
               auVar237._0_4_ + 1.0;
          auVar96._4_4_ =
               (fVar202 + 1.0 +
               (((((fVar202 * 0.00019875691 + 0.0013981999) * fVar202 + 0.008333452) * fVar202 +
                 0.041665796) * fVar202 + 0.16666666) * fVar202 + 0.5) * fVar202 * fVar202) *
               auVar237._4_4_ + 1.0;
          auVar96._8_4_ =
               (fVar204 + 1.0 +
               (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                 0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5) * fVar204 * fVar204) *
               auVar237._8_4_ + 1.0;
          auVar96._12_4_ =
               (fVar230 + 1.0 +
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5) * fVar230 * fVar230) *
               auVar237._12_4_ + 1.0;
          auVar130._8_4_ = 0x800000;
          auVar130._0_8_ = 0x80000000800000;
          auVar130._12_4_ = 0x800000;
          auVar237 = vmaxps_avx(auVar96,auVar130);
          auVar282 = vpsrld_avx(auVar237,0x17);
          auVar266._8_4_ = 0xffffff82;
          auVar266._0_8_ = 0xffffff82ffffff82;
          auVar266._12_4_ = 0xffffff82;
          auVar282 = vpaddd_avx(auVar266,auVar282);
          auVar267._8_4_ = 0x807fffff;
          auVar267._0_8_ = 0x807fffff807fffff;
          auVar267._12_4_ = 0x807fffff;
          auVar237 = vandps_avx(auVar267,auVar237);
          auVar239 = vorps_avx(auVar237,auVar54);
          auVar238 = vcvtdq2ps_avx(auVar282);
          auVar268._8_4_ = 0x3f3504f3;
          auVar268._0_8_ = 0x3f3504f33f3504f3;
          auVar268._12_4_ = 0x3f3504f3;
          auVar282 = vcmpps_avx(auVar239,auVar268,1);
          auVar237 = vandps_avx(auVar282,auVar239);
          fVar307 = auVar237._0_4_ + auVar239._0_4_ + -1.0;
          fVar202 = auVar237._4_4_ + auVar239._4_4_ + -1.0;
          fVar204 = auVar237._8_4_ + auVar239._8_4_ + -1.0;
          fVar230 = auVar237._12_4_ + auVar239._12_4_ + -1.0;
          auVar237 = vandps_avx(auVar282,auVar210);
          auVar282 = vsubps_avx(auVar238,auVar237);
          auVar280 = ZEXT3264(auVar276);
          auVar237 = vcmpps_avx(auVar96,_DAT_005a34f0,2);
          auVar131._0_4_ =
               (fVar307 * fVar307 *
                (((((((((fVar307 * 0.070376836 + -0.1151461) * fVar307 + 0.116769984) * fVar307 +
                      -0.12420141) * fVar307 + 0.14249323) * fVar307 + -0.16668057) * fVar307 +
                   0.20000714) * fVar307 + -0.24999994) * fVar307 + 0.3333333) * fVar307 + -0.5) +
               auVar282._0_4_ * 0.6931472 + fVar307) * -2.0;
          auVar131._4_4_ =
               (fVar202 * fVar202 *
                (((((((((fVar202 * 0.070376836 + -0.1151461) * fVar202 + 0.116769984) * fVar202 +
                      -0.12420141) * fVar202 + 0.14249323) * fVar202 + -0.16668057) * fVar202 +
                   0.20000714) * fVar202 + -0.24999994) * fVar202 + 0.3333333) * fVar202 + -0.5) +
               auVar282._4_4_ * 0.6931472 + fVar202) * -2.0;
          auVar131._8_4_ =
               (fVar204 * fVar204 *
                (((((((((fVar204 * 0.070376836 + -0.1151461) * fVar204 + 0.116769984) * fVar204 +
                      -0.12420141) * fVar204 + 0.14249323) * fVar204 + -0.16668057) * fVar204 +
                   0.20000714) * fVar204 + -0.24999994) * fVar204 + 0.3333333) * fVar204 + -0.5) +
               auVar282._8_4_ * 0.6931472 + fVar204) * -2.0;
          auVar131._12_4_ =
               (fVar230 * fVar230 *
                (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) * fVar230 +
                      -0.12420141) * fVar230 + 0.14249323) * fVar230 + -0.16668057) * fVar230 +
                   0.20000714) * fVar230 + -0.24999994) * fVar230 + 0.3333333) * fVar230 + -0.5) +
               auVar282._12_4_ * 0.6931472 + fVar230) * -2.0;
          auVar81._8_4_ = 0x7fffffff;
          auVar81._0_8_ = 0x7fffffff7fffffff;
          auVar81._12_4_ = 0x7fffffff;
          auVar237 = vblendvps_avx(auVar131,auVar81,auVar237);
          auVar237 = vminps_avx(auVar289,auVar237);
          auVar334 = ZEXT864(0) << 0x20;
          auVar238 = vmaxps_avx(auVar316,auVar237);
          auVar84 = ZEXT1664(auVar84._0_16_);
          auVar300 = ZEXT1664(auVar300._0_16_);
          auVar272 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar132._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
          auVar132._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
          auVar132._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
          auVar132._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
          auVar161._0_4_ = (int)auVar132._0_4_;
          auVar161._4_4_ = (int)auVar132._4_4_;
          auVar161._8_4_ = (int)auVar132._8_4_;
          auVar161._12_4_ = (int)auVar132._12_4_;
          auVar282 = vcvtdq2ps_avx(auVar161);
          auVar237 = vcmpps_avx(auVar132,auVar282,1);
          auVar237 = vandps_avx(auVar210,auVar237);
          auVar237 = vsubps_avx(auVar282,auVar237);
          auVar162._0_4_ = auVar237._0_4_ * 0.6931472;
          auVar162._4_4_ = auVar237._4_4_ * 0.6931472;
          auVar162._8_4_ = auVar237._8_4_ * 0.6931472;
          auVar162._12_4_ = auVar237._12_4_ * 0.6931472;
          auVar282 = vsubps_avx(auVar238,auVar162);
          fVar307 = auVar282._0_4_;
          fVar202 = auVar282._4_4_;
          fVar204 = auVar282._8_4_;
          fVar230 = auVar282._12_4_;
          auVar133._0_4_ = (int)auVar237._0_4_;
          auVar133._4_4_ = (int)auVar237._4_4_;
          auVar133._8_4_ = (int)auVar237._8_4_;
          auVar133._12_4_ = (int)auVar237._12_4_;
          auVar237 = vpslld_avx(auVar133,0x17);
          auVar237 = vpaddd_avx(auVar210,auVar237);
          auVar97._0_4_ =
               (fVar307 + 1.0 +
               (((((fVar307 * 0.00019875691 + 0.0013981999) * fVar307 + 0.008333452) * fVar307 +
                 0.041665796) * fVar307 + 0.16666666) * fVar307 + 0.5) * fVar307 * fVar307) *
               auVar237._0_4_ + 1.0;
          auVar97._4_4_ =
               (fVar202 + 1.0 +
               (((((fVar202 * 0.00019875691 + 0.0013981999) * fVar202 + 0.008333452) * fVar202 +
                 0.041665796) * fVar202 + 0.16666666) * fVar202 + 0.5) * fVar202 * fVar202) *
               auVar237._4_4_ + 1.0;
          auVar97._8_4_ =
               (fVar204 + 1.0 +
               (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                 0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5) * fVar204 * fVar204) *
               auVar237._8_4_ + 1.0;
          auVar97._12_4_ =
               (fVar230 + 1.0 +
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5) * fVar230 * fVar230) *
               auVar237._12_4_ + 1.0;
          auVar82._8_4_ = 0x40000000;
          auVar82._0_8_ = 0x4000000040000000;
          auVar82._12_4_ = 0x40000000;
          auVar237 = vdivps_avx(auVar82,auVar97);
          auVar98._0_4_ = auVar237._0_4_ + -1.0;
          auVar98._4_4_ = auVar237._4_4_ + -1.0;
          auVar98._8_4_ = auVar237._8_4_ + -1.0;
          auVar98._12_4_ = auVar237._12_4_ + -1.0;
          goto LAB_0046cbb6;
        case 6:
          fVar307 = *(float *)*in_stack_00000020;
          fVar202 = ((float *)*in_stack_00000020)[1];
          auVar102._0_4_ = auVar243._0_4_ * fVar307 + fVar202;
          auVar102._4_4_ = auVar243._4_4_ * fVar307 + fVar202;
          auVar102._8_4_ = auVar243._8_4_ * fVar307 + fVar202;
          auVar102._12_4_ = auVar243._12_4_ * fVar307 + fVar202;
          auVar237 = vmaxps_avx(auVar237,auVar102);
          auVar98 = vminps_avx(auVar210,auVar237);
LAB_0046cbb6:
          auVar243._0_4_ = auVar243._0_4_ * auVar98._0_4_;
          auVar243._4_4_ = auVar243._4_4_ * auVar98._4_4_;
          auVar243._8_4_ = auVar243._8_4_ * auVar98._8_4_;
          auVar243._12_4_ = auVar243._12_4_ * auVar98._12_4_;
        }
        auVar103._0_4_ = auVar243._0_4_ * auVar280._0_4_;
        auVar103._4_4_ = auVar243._4_4_ * auVar280._4_4_;
        auVar103._8_4_ = auVar243._8_4_ * auVar280._8_4_;
        auVar103._12_4_ = auVar243._12_4_ * auVar280._12_4_;
        auVar237 = vandps_avx(auVar103,auVar272._0_16_);
        auVar237 = vorps_avx(auVar237,auVar54);
        auVar104._0_4_ = (int)(auVar103._0_4_ + auVar237._0_4_);
        auVar104._4_4_ = (int)(auVar103._4_4_ + auVar237._4_4_);
        auVar104._8_4_ = (int)(auVar103._8_4_ + auVar237._8_4_);
        auVar104._12_4_ = (int)(auVar103._12_4_ + auVar237._12_4_);
        auVar237 = vpackssdw_avx(auVar104,auVar104);
        auVar237 = vpminsw_avx(auVar84._0_16_,auVar237);
        auVar237 = vpmaxsw_avx(auVar237,auVar300._0_16_);
        auVar237 = vpacksswb_avx(auVar237,auVar237);
        *(int *)*(undefined1 (*) [16])ptr = auVar237._0_4_;
        intptr = (int *)(*(undefined1 (*) [32])intptr + 0x10);
        ptr = *(undefined1 (*) [16])ptr + 4;
        uVar31 = uVar32 + 4;
        iVar33 = uVar32 + 7;
        uVar32 = uVar31;
      } while (iVar33 < (int)uVar34);
    }
    if (uVar34 - uVar31 != 0 && (int)uVar31 <= (int)uVar34) {
      lVar35 = 0;
      auVar272 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar300 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
      do {
        fVar307 = fVar1 * (float)*(int *)(*(undefined1 (*) [32])intptr + lVar35 * 4);
        auVar237 = ZEXT416((uint)fVar307);
        fVar202 = fVar307;
        switch(elempack) {
        case 1:
          auVar237 = vmaxss_avx(auVar237,ZEXT416(0));
          fVar202 = auVar237._0_4_;
          break;
        case 2:
          auVar40._0_12_ = ZEXT812(0);
          auVar40._12_4_ = 0;
          auVar237 = vcmpss_avx(auVar40,auVar237,1);
          auVar71._8_4_ = 0x3f800000;
          auVar71._0_8_ = 0x3f8000003f800000;
          auVar71._12_4_ = 0x3f800000;
          auVar237 = vblendvps_avx(ZEXT416(*(uint *)*in_stack_00000020),auVar71,auVar237);
          fVar230 = auVar237._0_4_;
LAB_0046cd82:
          fVar202 = fVar230 * fVar307;
          break;
        case 3:
          fVar307 = (float)((uint *)*in_stack_00000020)[1];
          auVar237 = vmaxss_avx(auVar237,ZEXT416(*(uint *)*in_stack_00000020));
          fVar202 = auVar237._0_4_;
          if (fVar307 < auVar237._0_4_) {
            fVar202 = fVar307;
          }
          break;
        case 4:
          auVar237 = vminss_avx(auVar237,ZEXT416(0x42b0c0a5));
          auVar55._0_4_ = auVar237._0_4_ ^ auVar272._0_4_;
          auVar55._4_4_ = auVar237._4_4_ ^ auVar272._4_4_;
          auVar55._8_4_ = auVar237._8_4_ ^ auVar272._8_4_;
          auVar55._12_4_ = auVar237._12_4_ ^ auVar272._12_4_;
          auVar237 = vcmpss_avx(auVar237,ZEXT416(0xc2b0c0a5),1);
          auVar70._8_4_ = 0x42b0c0a5;
          auVar70._0_8_ = 0x42b0c0a542b0c0a5;
          auVar70._12_4_ = 0x42b0c0a5;
          auVar237 = vblendvps_avx(auVar55,auVar70,auVar237);
          fVar307 = expf(auVar237._0_4_);
          auVar300 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar272 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar280 = ZEXT3264(auVar276);
          fVar202 = 1.0 / (fVar307 + 1.0);
          break;
        case 5:
          fVar202 = expf(fVar307);
          fVar202 = logf(fVar202 + 1.0);
          fVar202 = tanhf(fVar202);
          auVar300 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar272 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar280 = ZEXT3264(auVar276);
          fVar202 = fVar202 * fVar307;
          break;
        case 6:
          fVar204 = *(float *)*in_stack_00000020;
          fVar230 = ((float *)*in_stack_00000020)[1];
          fVar231 = (float)((uint)fVar230 ^ auVar272._0_4_) / fVar204;
          fVar202 = 0.0;
          if ((fVar231 <= fVar307) && (fVar202 = fVar307, fVar307 <= fVar231 + 1.0 / fVar204)) {
            fVar230 = fVar204 * fVar307 + fVar230;
            goto LAB_0046cd82;
          }
        }
        fVar202 = auVar280._0_4_ * fVar202;
        auVar237 = vandps_avx(ZEXT416((uint)fVar202),auVar272._0_16_);
        auVar237 = vorps_avx(auVar237,auVar300._0_16_);
        auVar237 = ZEXT416((uint)(fVar202 + auVar237._0_4_));
        auVar237 = vroundss_avx(auVar237,auVar237,0xb);
        iVar33 = (int)auVar237._0_4_;
        if (iVar33 < -0x7e) {
          iVar33 = -0x7f;
        }
        uVar30 = (undefined1)iVar33;
        if (0x7e < iVar33) {
          uVar30 = 0x7f;
        }
        (*(undefined1 (*) [16])ptr)[lVar35] = uVar30;
        lVar35 = lVar35 + 1;
      } while (uVar34 - uVar31 != (int)lVar35);
    }
  }
  else {
    fVar202 = *(float *)&scale_out_data->data;
    local_98._4_4_ = fVar202;
    local_98._0_4_ = fVar202;
    fStack_90 = fVar202;
    fStack_8c = fVar202;
    fStack_88 = fVar202;
    fStack_84 = fVar202;
    fStack_80 = fVar202;
    fStack_7c = fVar202;
    if (1 < activation_type && in_stack_00000030 == 8) {
      local_98 = scale_out_data->data;
      unique0x00006d08 = scale_out_data->refcount;
      unique0x00006d10 = scale_out_data->elemsize;
      fStack_80 = (float)scale_out_data->elempack;
      fStack_7c = *(float *)&scale_out_data->field_0x1c;
    }
    uVar31 = 0;
    if (0xf < (int)uVar34) {
      uVar31 = uVar34 & 0x7ffffff0;
      iVar33 = 0xf;
      auVar75._8_4_ = 0x80000000;
      auVar75._0_8_ = 0x8000000080000000;
      auVar75._12_4_ = 0x80000000;
      auVar75._16_4_ = 0x80000000;
      auVar75._20_4_ = 0x80000000;
      auVar75._24_4_ = 0x80000000;
      auVar75._28_4_ = 0x80000000;
      auVar83._8_4_ = 0x3f000000;
      auVar83._0_8_ = 0x3f0000003f000000;
      auVar83._12_4_ = 0x3f000000;
      auVar83._16_4_ = 0x3f000000;
      auVar83._20_4_ = 0x3f000000;
      auVar83._24_4_ = 0x3f000000;
      auVar83._28_4_ = 0x3f000000;
      auVar272 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
      auVar280 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
      auVar277._8_4_ = 0x3f800000;
      auVar277._0_8_ = 0x3f8000003f800000;
      auVar277._12_4_ = 0x3f800000;
      auVar277._16_4_ = 0x3f800000;
      auVar277._20_4_ = 0x3f800000;
      auVar277._24_4_ = 0x3f800000;
      auVar277._28_4_ = 0x3f800000;
      do {
        auVar203 = in_ZMM7._28_36_;
        auVar114 = in_ZMM5._28_36_;
        auVar253 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        auVar276 = vcvtdq2ps_avx(*(undefined1 (*) [32])((long)intptr + 0x20));
        fVar204 = auVar253._28_4_;
        auVar336._0_4_ = auVar253._0_4_ * (float)local_d8._0_4_ + (float)local_98._0_4_;
        auVar336._4_4_ = auVar253._4_4_ * (float)local_d8._4_4_ + (float)local_98._4_4_;
        auVar336._8_4_ = auVar253._8_4_ * fStack_d0 + fStack_90;
        auVar336._12_4_ = auVar253._12_4_ * fStack_cc + fStack_8c;
        auVar336._16_4_ = auVar253._16_4_ * fStack_c8 + fStack_88;
        auVar336._20_4_ = auVar253._20_4_ * fStack_c4 + fStack_84;
        auVar336._24_4_ = auVar253._24_4_ * fStack_c0 + fStack_80;
        register0x0000159c = fVar204 + fStack_7c;
        in_ZMM14 = ZEXT3264(auVar336);
        auVar317._0_4_ = auVar276._0_4_ * (float)local_d8._0_4_ + (float)local_98._0_4_;
        auVar317._4_4_ = auVar276._4_4_ * (float)local_d8._4_4_ + (float)local_98._4_4_;
        auVar317._8_4_ = auVar276._8_4_ * fStack_d0 + fStack_90;
        auVar317._12_4_ = auVar276._12_4_ * fStack_cc + fStack_8c;
        auVar317._16_4_ = auVar276._16_4_ * fStack_c8 + fStack_88;
        auVar317._20_4_ = auVar276._20_4_ * fStack_c4 + fStack_84;
        auVar317._24_4_ = auVar276._24_4_ * fStack_c0 + fStack_80;
        auVar319._28_4_ = fVar204 + fStack_7c;
        auVar319._0_28_ = auVar317;
        switch(elempack) {
        case 1:
          auVar114 = (undefined1  [36])0x0;
          auVar253 = vmaxps_avx(auVar336,ZEXT1632(ZEXT816(0)));
          in_ZMM14 = ZEXT3264(auVar253);
          auVar253 = vmaxps_avx(auVar319,ZEXT1632(ZEXT816(0)));
          auVar317 = auVar253._0_28_;
          break;
        case 2:
          auVar237 = ZEXT816(0);
          auVar114 = (undefined1  [36])0x0;
          auVar253 = vmaxps_avx(auVar336,ZEXT1632(auVar237));
          auVar276 = vminps_avx(auVar336,ZEXT1632(auVar237));
          fVar204 = *(float *)*in_stack_00000020;
          in_ZMM14 = ZEXT3264(CONCAT428(auVar276._28_4_ + auVar253._28_4_,
                                        CONCAT424(fVar204 * auVar276._24_4_ + auVar253._24_4_,
                                                  CONCAT420(fVar204 * auVar276._20_4_ +
                                                            auVar253._20_4_,
                                                            CONCAT416(fVar204 * auVar276._16_4_ +
                                                                      auVar253._16_4_,
                                                                      CONCAT412(fVar204 * auVar276.
                                                  _12_4_ + auVar253._12_4_,
                                                  CONCAT48(fVar204 * auVar276._8_4_ + auVar253._8_4_
                                                           ,CONCAT44(fVar204 * auVar276._4_4_ +
                                                                     auVar253._4_4_,
                                                                     fVar204 * auVar276._0_4_ +
                                                                     auVar253._0_4_))))))));
          auVar253 = vmaxps_avx(auVar319,ZEXT1632(auVar237));
          auVar276 = vminps_avx(auVar319,ZEXT1632(auVar237));
          auVar317._0_4_ = fVar204 * auVar276._0_4_ + auVar253._0_4_;
          auVar317._4_4_ = fVar204 * auVar276._4_4_ + auVar253._4_4_;
          auVar317._8_4_ = fVar204 * auVar276._8_4_ + auVar253._8_4_;
          auVar317._12_4_ = fVar204 * auVar276._12_4_ + auVar253._12_4_;
          auVar317._16_4_ = fVar204 * auVar276._16_4_ + auVar253._16_4_;
          auVar317._20_4_ = fVar204 * auVar276._20_4_ + auVar253._20_4_;
          auVar317._24_4_ = fVar204 * auVar276._24_4_ + auVar253._24_4_;
          break;
        case 3:
          uVar2 = *(undefined4 *)*in_stack_00000020;
          auVar219._4_4_ = uVar2;
          auVar219._0_4_ = uVar2;
          auVar219._8_4_ = uVar2;
          auVar219._12_4_ = uVar2;
          auVar219._16_4_ = uVar2;
          auVar219._20_4_ = uVar2;
          auVar219._24_4_ = uVar2;
          auVar219._28_4_ = uVar2;
          uVar2 = ((undefined4 *)*in_stack_00000020)[1];
          auVar249._4_4_ = uVar2;
          auVar249._0_4_ = uVar2;
          auVar249._8_4_ = uVar2;
          auVar249._12_4_ = uVar2;
          auVar249._16_4_ = uVar2;
          auVar249._20_4_ = uVar2;
          auVar249._24_4_ = uVar2;
          auVar249._28_4_ = uVar2;
          auVar253 = vmaxps_avx(auVar336,auVar219);
          auVar253 = vminps_avx(auVar253,auVar249);
          in_ZMM14 = ZEXT3264(auVar253);
          auVar253 = vmaxps_avx(auVar319,auVar219);
          auVar253 = vminps_avx(auVar253,auVar249);
          auVar317 = auVar253._0_28_;
          break;
        case 4:
          uVar29 = CONCAT44(auVar336._4_4_,auVar336._0_4_);
          auVar220._0_8_ = uVar29 ^ 0x8000000080000000;
          auVar220._8_4_ = -auVar336._8_4_;
          auVar220._12_4_ = -auVar336._12_4_;
          auVar220._16_4_ = -auVar336._16_4_;
          auVar220._20_4_ = -auVar336._20_4_;
          auVar220._24_4_ = -auVar336._24_4_;
          auVar220._28_4_ = -register0x0000159c;
          auVar60._8_4_ = 0x42b0c0a5;
          auVar60._0_8_ = 0x42b0c0a542b0c0a5;
          auVar60._12_4_ = 0x42b0c0a5;
          auVar60._16_4_ = 0x42b0c0a5;
          auVar60._20_4_ = 0x42b0c0a5;
          auVar60._24_4_ = 0x42b0c0a5;
          auVar60._28_4_ = 0x42b0c0a5;
          auVar253 = vminps_avx(auVar220,auVar60);
          auVar74._8_4_ = 0xc2b0c0a5;
          auVar74._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar74._12_4_ = 0xc2b0c0a5;
          auVar74._16_4_ = 0xc2b0c0a5;
          auVar74._20_4_ = 0xc2b0c0a5;
          auVar74._24_4_ = 0xc2b0c0a5;
          auVar74._28_4_ = 0xc2b0c0a5;
          auVar49 = vmaxps_avx(auVar253,auVar74);
          auVar250._0_4_ = auVar49._0_4_ * 1.442695 + 0.5;
          auVar250._4_4_ = auVar49._4_4_ * 1.442695 + 0.5;
          auVar250._8_4_ = auVar49._8_4_ * 1.442695 + 0.5;
          auVar250._12_4_ = auVar49._12_4_ * 1.442695 + 0.5;
          auVar250._16_4_ = auVar49._16_4_ * 1.442695 + 0.5;
          auVar250._20_4_ = auVar49._20_4_ * 1.442695 + 0.5;
          auVar250._24_4_ = auVar49._24_4_ * 1.442695 + 0.5;
          auVar250._28_4_ = auVar276._28_4_ + 0.5;
          auVar147 = vroundps_avx(auVar250,1);
          auVar253 = vcmpps_avx(auVar250,auVar147,1);
          auVar253 = vandps_avx(auVar253,auVar277);
          auVar253 = vsubps_avx(auVar147,auVar253);
          auVar114 = ZEXT436(0x3f317218);
          auVar13._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar13._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar13._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar13._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar13._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar13._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar13._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar13._28_4_ = auVar147._28_4_;
          auVar144 = vsubps_avx(auVar49,auVar13);
          fVar204 = auVar144._0_4_;
          fVar231 = auVar144._4_4_;
          fVar233 = auVar144._8_4_;
          fVar235 = auVar144._12_4_;
          fVar344 = auVar144._16_4_;
          fVar347 = auVar144._20_4_;
          fVar348 = auVar144._24_4_;
          auVar203 = ZEXT436(0x3ab743ce);
          auVar240._0_4_ = (int)auVar253._0_4_;
          auVar240._4_4_ = (int)auVar253._4_4_;
          auVar240._8_4_ = (int)auVar253._8_4_;
          auVar240._12_4_ = (int)auVar253._12_4_;
          auVar251._16_4_ = (int)auVar253._16_4_;
          auVar251._0_16_ = auVar240;
          auVar251._20_4_ = (int)auVar253._20_4_;
          auVar251._24_4_ = (int)auVar253._24_4_;
          auVar251._28_4_ = (int)auVar253._28_4_;
          auVar282 = vpslld_avx(auVar240,0x17);
          auVar237 = vpslld_avx(auVar251._16_16_,0x17);
          auVar284._8_4_ = 0x3f800000;
          auVar284._0_8_ = 0x3f8000003f800000;
          auVar284._12_4_ = 0x3f800000;
          in_ZMM12 = ZEXT1664(auVar284);
          auVar237 = vpaddd_avx(auVar237,auVar284);
          auVar282 = vpaddd_avx(auVar282,auVar284);
          uVar29 = CONCAT44(auVar317._4_4_,auVar317._0_4_);
          auVar252._0_8_ = uVar29 ^ 0x8000000080000000;
          auVar252._8_4_ = -auVar317._8_4_;
          auVar252._12_4_ = -auVar317._12_4_;
          auVar252._16_4_ = -auVar317._16_4_;
          auVar252._20_4_ = -auVar317._20_4_;
          auVar252._24_4_ = -auVar317._24_4_;
          auVar252._28_4_ = -auVar319._28_4_;
          auVar253 = vminps_avx(auVar252,auVar60);
          auVar276 = vmaxps_avx(auVar253,auVar74);
          auVar280 = ZEXT1664(auVar280._0_16_);
          auVar320._0_4_ = auVar276._0_4_ * 1.442695 + 0.5;
          auVar320._4_4_ = auVar276._4_4_ * 1.442695 + 0.5;
          auVar320._8_4_ = auVar276._8_4_ * 1.442695 + 0.5;
          auVar320._12_4_ = auVar276._12_4_ * 1.442695 + 0.5;
          auVar320._16_4_ = auVar276._16_4_ * 1.442695 + 0.5;
          auVar320._20_4_ = auVar276._20_4_ * 1.442695 + 0.5;
          auVar320._24_4_ = auVar276._24_4_ * 1.442695 + 0.5;
          auVar320._28_4_ = auVar319._28_4_ + 0.5;
          auVar49 = vroundps_avx(auVar320,1);
          auVar253 = vcmpps_avx(auVar320,auVar49,1);
          auVar253 = vandps_avx(auVar253,auVar277);
          auVar253 = vsubps_avx(auVar49,auVar253);
          auVar14._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar14._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar14._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar14._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar14._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar14._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar14._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar14._28_4_ = auVar49._28_4_;
          auVar276 = vsubps_avx(auVar276,auVar14);
          fVar230 = auVar276._0_4_;
          fVar232 = auVar276._4_4_;
          fVar234 = auVar276._8_4_;
          fVar258 = auVar276._12_4_;
          fVar259 = auVar276._16_4_;
          fVar260 = auVar276._20_4_;
          fVar261 = auVar276._24_4_;
          auVar308._0_4_ = (int)auVar253._0_4_;
          auVar308._4_4_ = (int)auVar253._4_4_;
          auVar308._8_4_ = (int)auVar253._8_4_;
          auVar308._12_4_ = (int)auVar253._12_4_;
          auVar321._16_4_ = (int)auVar253._16_4_;
          auVar321._0_16_ = auVar308;
          auVar321._20_4_ = (int)auVar253._20_4_;
          auVar321._24_4_ = (int)auVar253._24_4_;
          auVar321._28_4_ = (int)auVar253._28_4_;
          auVar239 = vpslld_avx(auVar308,0x17);
          auVar238 = vpslld_avx(auVar321._16_16_,0x17);
          auVar238 = vpaddd_avx(auVar238,auVar284);
          auVar239 = vpaddd_avx(auVar239,auVar284);
          auVar221._0_4_ =
               (fVar204 + 1.0 +
               fVar204 * fVar204 *
               (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                 0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5)) * auVar282._0_4_ + 1.0;
          auVar221._4_4_ =
               (fVar231 + 1.0 +
               fVar231 * fVar231 *
               (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                 0.041665796) * fVar231 + 0.16666666) * fVar231 + 0.5)) * auVar282._4_4_ + 1.0;
          auVar221._8_4_ =
               (fVar233 + 1.0 +
               fVar233 * fVar233 *
               (((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) * fVar233 +
                 0.041665796) * fVar233 + 0.16666666) * fVar233 + 0.5)) * auVar282._8_4_ + 1.0;
          auVar221._12_4_ =
               (fVar235 + 1.0 +
               fVar235 * fVar235 *
               (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) * fVar235 +
                 0.041665796) * fVar235 + 0.16666666) * fVar235 + 0.5)) * auVar282._12_4_ + 1.0;
          auVar221._16_4_ =
               (fVar344 + 1.0 +
               fVar344 * fVar344 *
               (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
                 0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5)) * auVar237._0_4_ + 1.0;
          auVar221._20_4_ =
               (fVar347 + 1.0 +
               fVar347 * fVar347 *
               (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                 0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5)) * auVar237._4_4_ + 1.0;
          auVar221._24_4_ =
               (fVar348 + 1.0 +
               fVar348 * fVar348 *
               (((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452) * fVar348 +
                 0.041665796) * fVar348 + 0.16666666) * fVar348 + 0.5)) * auVar237._8_4_ + 1.0;
          auVar221._28_4_ = auVar144._28_4_ + 1.0 + auVar147._28_4_ + 1.0;
          auVar253 = vdivps_avx(auVar277,auVar221);
          in_ZMM14 = ZEXT3264(auVar253);
          auVar222._0_4_ =
               (fVar230 + 1.0 +
               fVar230 * fVar230 *
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5)) * auVar239._0_4_ + 1.0;
          auVar222._4_4_ =
               (fVar232 + 1.0 +
               fVar232 * fVar232 *
               (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                 0.041665796) * fVar232 + 0.16666666) * fVar232 + 0.5)) * auVar239._4_4_ + 1.0;
          auVar222._8_4_ =
               (fVar234 + 1.0 +
               fVar234 * fVar234 *
               (((((fVar234 * 0.00019875691 + 0.0013981999) * fVar234 + 0.008333452) * fVar234 +
                 0.041665796) * fVar234 + 0.16666666) * fVar234 + 0.5)) * auVar239._8_4_ + 1.0;
          auVar222._12_4_ =
               (fVar258 + 1.0 +
               fVar258 * fVar258 *
               (((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258 +
                 0.041665796) * fVar258 + 0.16666666) * fVar258 + 0.5)) * auVar239._12_4_ + 1.0;
          auVar222._16_4_ =
               (fVar259 + 1.0 +
               fVar259 * fVar259 *
               (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                 0.041665796) * fVar259 + 0.16666666) * fVar259 + 0.5)) * auVar238._0_4_ + 1.0;
          auVar222._20_4_ =
               (fVar260 + 1.0 +
               fVar260 * fVar260 *
               (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                 0.041665796) * fVar260 + 0.16666666) * fVar260 + 0.5)) * auVar238._4_4_ + 1.0;
          auVar222._24_4_ =
               (fVar261 + 1.0 +
               fVar261 * fVar261 *
               (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                 0.041665796) * fVar261 + 0.16666666) * fVar261 + 0.5)) * auVar238._8_4_ + 1.0;
          auVar222._28_4_ = auVar276._28_4_ + 1.0 + auVar49._28_4_ + 1.0;
          auVar253 = vdivps_avx(auVar277,auVar222);
          auVar317 = auVar253._0_28_;
          break;
        case 5:
          auVar105._8_4_ = 0x42b0c0a5;
          auVar105._0_8_ = 0x42b0c0a542b0c0a5;
          auVar105._12_4_ = 0x42b0c0a5;
          auVar105._16_4_ = 0x42b0c0a5;
          auVar105._20_4_ = 0x42b0c0a5;
          auVar105._24_4_ = 0x42b0c0a5;
          auVar105._28_4_ = 0x42b0c0a5;
          auVar253 = vminps_avx(auVar336,auVar105);
          auVar106._8_4_ = 0xc2b0c0a5;
          auVar106._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar106._12_4_ = 0xc2b0c0a5;
          auVar106._16_4_ = 0xc2b0c0a5;
          auVar106._20_4_ = 0xc2b0c0a5;
          auVar106._24_4_ = 0xc2b0c0a5;
          auVar106._28_4_ = 0xc2b0c0a5;
          auVar49 = vmaxps_avx(auVar253,auVar106);
          auVar247._0_4_ = auVar49._0_4_ * 1.442695 + 0.5;
          auVar247._4_4_ = auVar49._4_4_ * 1.442695 + 0.5;
          auVar247._8_4_ = auVar49._8_4_ * 1.442695 + 0.5;
          auVar247._12_4_ = auVar49._12_4_ * 1.442695 + 0.5;
          auVar247._16_4_ = auVar49._16_4_ * 1.442695 + 0.5;
          auVar247._20_4_ = auVar49._20_4_ * 1.442695 + 0.5;
          auVar247._24_4_ = auVar49._24_4_ * 1.442695 + 0.5;
          auVar247._28_4_ = auVar276._28_4_ + 0.5;
          auVar276 = vroundps_avx(auVar247,1);
          auVar253 = vcmpps_avx(auVar247,auVar276,1);
          auVar253 = vandps_avx(auVar253,auVar277);
          auVar253 = vsubps_avx(auVar276,auVar253);
          auVar7._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar7._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar7._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar7._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar7._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar7._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar7._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar7._28_4_ = auVar276._28_4_;
          auVar276 = vsubps_avx(auVar49,auVar7);
          fVar204 = auVar276._0_4_;
          fVar230 = auVar276._4_4_;
          fVar231 = auVar276._8_4_;
          fVar232 = auVar276._12_4_;
          fVar233 = auVar276._16_4_;
          fVar234 = auVar276._20_4_;
          fVar235 = auVar276._24_4_;
          auVar236._0_4_ = (int)auVar253._0_4_;
          auVar236._4_4_ = (int)auVar253._4_4_;
          auVar236._8_4_ = (int)auVar253._8_4_;
          auVar236._12_4_ = (int)auVar253._12_4_;
          auVar248._16_4_ = (int)auVar253._16_4_;
          auVar248._0_16_ = auVar236;
          auVar248._20_4_ = (int)auVar253._20_4_;
          auVar248._24_4_ = (int)auVar253._24_4_;
          auVar248._28_4_ = (int)auVar253._28_4_;
          auVar282 = vpslld_avx(auVar236,0x17);
          auVar237 = vpslld_avx(auVar248._16_16_,0x17);
          auVar148._8_4_ = 0x3f800000;
          auVar148._0_8_ = 0x3f8000003f800000;
          auVar148._12_4_ = 0x3f800000;
          auVar237 = vpaddd_avx(auVar237,auVar148);
          auVar282 = vpaddd_avx(auVar282,auVar148);
          auVar211._0_4_ =
               (fVar204 + 1.0 +
               fVar204 * fVar204 *
               (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                 0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5)) * auVar282._0_4_ + 1.0;
          auVar211._4_4_ =
               (fVar230 + 1.0 +
               fVar230 * fVar230 *
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5)) * auVar282._4_4_ + 1.0;
          auVar211._8_4_ =
               (fVar231 + 1.0 +
               fVar231 * fVar231 *
               (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                 0.041665796) * fVar231 + 0.16666666) * fVar231 + 0.5)) * auVar282._8_4_ + 1.0;
          auVar211._12_4_ =
               (fVar232 + 1.0 +
               fVar232 * fVar232 *
               (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                 0.041665796) * fVar232 + 0.16666666) * fVar232 + 0.5)) * auVar282._12_4_ + 1.0;
          auVar211._16_4_ =
               (fVar233 + 1.0 +
               fVar233 * fVar233 *
               (((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) * fVar233 +
                 0.041665796) * fVar233 + 0.16666666) * fVar233 + 0.5)) * auVar237._0_4_ + 1.0;
          auVar211._20_4_ =
               (fVar234 + 1.0 +
               fVar234 * fVar234 *
               (((((fVar234 * 0.00019875691 + 0.0013981999) * fVar234 + 0.008333452) * fVar234 +
                 0.041665796) * fVar234 + 0.16666666) * fVar234 + 0.5)) * auVar237._4_4_ + 1.0;
          auVar211._24_4_ =
               (fVar235 + 1.0 +
               fVar235 * fVar235 *
               (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) * fVar235 +
                 0.041665796) * fVar235 + 0.16666666) * fVar235 + 0.5)) * auVar237._8_4_ + 1.0;
          auVar211._28_4_ =
               auVar276._28_4_ + 1.0 +
               in_ZMM12._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 1.0;
          auVar276 = vcmpps_avx(auVar211,ZEXT832(0) << 0x20,2);
          auVar107._8_4_ = 0x800000;
          auVar107._0_8_ = 0x80000000800000;
          auVar107._12_4_ = 0x800000;
          auVar107._16_4_ = 0x800000;
          auVar107._20_4_ = 0x800000;
          auVar107._24_4_ = 0x800000;
          auVar107._28_4_ = 0x800000;
          auVar253 = vmaxps_avx(auVar211,auVar107);
          auVar238 = vpsrld_avx(auVar253._0_16_,0x17);
          auVar282 = vpsrld_avx(auVar253._16_16_,0x17);
          auVar163._8_4_ = 0x807fffff;
          auVar163._0_8_ = 0x807fffff807fffff;
          auVar163._12_4_ = 0x807fffff;
          auVar163._16_4_ = 0x807fffff;
          auVar163._20_4_ = 0x807fffff;
          auVar163._24_4_ = 0x807fffff;
          auVar163._28_4_ = 0x807fffff;
          auVar253 = vandps_avx(auVar253,auVar163);
          auVar147 = vorps_avx(auVar253,auVar83);
          auVar164._8_4_ = 0x3f3504f3;
          auVar164._0_8_ = 0x3f3504f33f3504f3;
          auVar164._12_4_ = 0x3f3504f3;
          auVar164._16_4_ = 0x3f3504f3;
          auVar164._20_4_ = 0x3f3504f3;
          auVar164._24_4_ = 0x3f3504f3;
          auVar164._28_4_ = 0x3f3504f3;
          auVar49 = vcmpps_avx(auVar164,auVar147,2);
          auVar253 = vandnps_avx(auVar49,auVar147);
          fVar204 = auVar147._0_4_ + -1.0 + auVar253._0_4_;
          fVar230 = auVar147._4_4_ + -1.0 + auVar253._4_4_;
          fVar231 = auVar147._8_4_ + -1.0 + auVar253._8_4_;
          fVar232 = auVar147._12_4_ + -1.0 + auVar253._12_4_;
          fVar233 = auVar147._16_4_ + -1.0 + auVar253._16_4_;
          fVar234 = auVar147._20_4_ + -1.0 + auVar253._20_4_;
          fVar235 = auVar147._24_4_ + -1.0 + auVar253._24_4_;
          auVar282 = vpsubd_avx(auVar282,auVar49._16_16_);
          auVar283._8_4_ = 0xffffff81;
          auVar283._0_8_ = 0xffffff81ffffff81;
          auVar283._12_4_ = 0xffffff81;
          auVar282 = vpaddd_avx(auVar282,auVar283);
          auVar238 = vpsubd_avx(auVar238,auVar49._0_16_);
          auVar238 = vpaddd_avx(auVar283,auVar238);
          auVar165._16_16_ = auVar282;
          auVar165._0_16_ = auVar238;
          auVar49 = vcvtdq2ps_avx(auVar165);
          auVar8._4_4_ = (fVar230 * fVar230 *
                          (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) *
                                 fVar230 + -0.12420141) * fVar230 + 0.14249323) * fVar230 +
                              -0.16668057) * fVar230 + 0.20000714) * fVar230 + -0.24999994) *
                            fVar230 + 0.3333333) * fVar230 + -0.5) +
                         fVar230 + auVar49._4_4_ * 0.6931472) * -2.0;
          auVar8._0_4_ = (fVar204 * fVar204 *
                          (((((((((fVar204 * 0.070376836 + -0.1151461) * fVar204 + 0.116769984) *
                                 fVar204 + -0.12420141) * fVar204 + 0.14249323) * fVar204 +
                              -0.16668057) * fVar204 + 0.20000714) * fVar204 + -0.24999994) *
                            fVar204 + 0.3333333) * fVar204 + -0.5) +
                         fVar204 + auVar49._0_4_ * 0.6931472) * -2.0;
          auVar8._8_4_ = (fVar231 * fVar231 *
                          (((((((((fVar231 * 0.070376836 + -0.1151461) * fVar231 + 0.116769984) *
                                 fVar231 + -0.12420141) * fVar231 + 0.14249323) * fVar231 +
                              -0.16668057) * fVar231 + 0.20000714) * fVar231 + -0.24999994) *
                            fVar231 + 0.3333333) * fVar231 + -0.5) +
                         fVar231 + auVar49._8_4_ * 0.6931472) * -2.0;
          auVar8._12_4_ =
               (fVar232 * fVar232 *
                (((((((((fVar232 * 0.070376836 + -0.1151461) * fVar232 + 0.116769984) * fVar232 +
                      -0.12420141) * fVar232 + 0.14249323) * fVar232 + -0.16668057) * fVar232 +
                   0.20000714) * fVar232 + -0.24999994) * fVar232 + 0.3333333) * fVar232 + -0.5) +
               fVar232 + auVar49._12_4_ * 0.6931472) * -2.0;
          auVar8._16_4_ =
               (fVar233 * fVar233 *
                (((((((((fVar233 * 0.070376836 + -0.1151461) * fVar233 + 0.116769984) * fVar233 +
                      -0.12420141) * fVar233 + 0.14249323) * fVar233 + -0.16668057) * fVar233 +
                   0.20000714) * fVar233 + -0.24999994) * fVar233 + 0.3333333) * fVar233 + -0.5) +
               fVar233 + auVar49._16_4_ * 0.6931472) * -2.0;
          auVar8._20_4_ =
               (fVar234 * fVar234 *
                (((((((((fVar234 * 0.070376836 + -0.1151461) * fVar234 + 0.116769984) * fVar234 +
                      -0.12420141) * fVar234 + 0.14249323) * fVar234 + -0.16668057) * fVar234 +
                   0.20000714) * fVar234 + -0.24999994) * fVar234 + 0.3333333) * fVar234 + -0.5) +
               fVar234 + auVar49._20_4_ * 0.6931472) * -2.0;
          auVar8._24_4_ =
               (fVar235 * fVar235 *
                (((((((((fVar235 * 0.070376836 + -0.1151461) * fVar235 + 0.116769984) * fVar235 +
                      -0.12420141) * fVar235 + 0.14249323) * fVar235 + -0.16668057) * fVar235 +
                   0.20000714) * fVar235 + -0.24999994) * fVar235 + 0.3333333) * fVar235 + -0.5) +
               fVar235 + auVar49._24_4_ * 0.6931472) * -2.0;
          auVar8._28_4_ =
               auVar237._12_4_ + auVar147._28_4_ + -1.0 + auVar253._28_4_ + auVar49._28_4_;
          auVar212._8_4_ = 0x7fffffff;
          auVar212._0_8_ = 0x7fffffff7fffffff;
          auVar212._12_4_ = 0x7fffffff;
          auVar212._16_4_ = 0x7fffffff;
          auVar212._20_4_ = 0x7fffffff;
          auVar212._24_4_ = 0x7fffffff;
          auVar212._28_4_ = 0x7fffffff;
          auVar253 = vblendvps_avx(auVar8,auVar212,auVar276);
          auVar253 = vminps_avx(auVar253,auVar105);
          auVar56._8_4_ = 0xc2b0c0a5;
          auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar56._12_4_ = 0xc2b0c0a5;
          auVar56._16_4_ = 0xc2b0c0a5;
          auVar56._20_4_ = 0xc2b0c0a5;
          auVar56._24_4_ = 0xc2b0c0a5;
          auVar56._28_4_ = 0xc2b0c0a5;
          auVar276 = vmaxps_avx(auVar253,auVar56);
          auVar213._0_4_ = auVar276._0_4_ * 1.442695 + 0.5;
          auVar213._4_4_ = auVar276._4_4_ * 1.442695 + 0.5;
          auVar213._8_4_ = auVar276._8_4_ * 1.442695 + 0.5;
          auVar213._12_4_ = auVar276._12_4_ * 1.442695 + 0.5;
          auVar213._16_4_ = auVar276._16_4_ * 1.442695 + 0.5;
          auVar213._20_4_ = auVar276._20_4_ * 1.442695 + 0.5;
          auVar213._24_4_ = auVar276._24_4_ * 1.442695 + 0.5;
          auVar213._28_4_ = 0x7fc00000;
          auVar144 = vroundps_avx(auVar213,1);
          auVar253 = vcmpps_avx(auVar213,auVar144,1);
          auVar253 = vandps_avx(auVar253,auVar277);
          auVar253 = vsubps_avx(auVar144,auVar253);
          auVar9._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar9._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar9._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar9._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar9._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar9._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar9._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar9._28_4_ = auVar144._28_4_;
          auVar270 = vsubps_avx(auVar276,auVar9);
          fVar204 = auVar270._0_4_;
          fVar231 = auVar270._4_4_;
          fVar233 = auVar270._8_4_;
          fVar235 = auVar270._12_4_;
          fVar344 = auVar270._16_4_;
          fVar347 = auVar270._20_4_;
          fVar348 = auVar270._24_4_;
          auVar205._0_4_ = (int)auVar253._0_4_;
          auVar205._4_4_ = (int)auVar253._4_4_;
          auVar205._8_4_ = (int)auVar253._8_4_;
          auVar205._12_4_ = (int)auVar253._12_4_;
          auVar214._16_4_ = (int)auVar253._16_4_;
          auVar214._0_16_ = auVar205;
          auVar214._20_4_ = (int)auVar253._20_4_;
          auVar214._24_4_ = (int)auVar253._24_4_;
          auVar214._28_4_ = (int)auVar253._28_4_;
          auVar282 = vpslld_avx(auVar205,0x17);
          auVar237 = vpslld_avx(auVar214._16_16_,0x17);
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = 0x3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar237 = vpaddd_avx(auVar237,auVar36);
          auVar282 = vpaddd_avx(auVar282,auVar36);
          auVar253 = vminps_avx(auVar319,auVar105);
          auVar276 = vmaxps_avx(auVar253,auVar56);
          auVar215._0_4_ = auVar276._0_4_ * 1.442695 + 0.5;
          auVar215._4_4_ = auVar276._4_4_ * 1.442695 + 0.5;
          auVar215._8_4_ = auVar276._8_4_ * 1.442695 + 0.5;
          auVar215._12_4_ = auVar276._12_4_ * 1.442695 + 0.5;
          auVar215._16_4_ = auVar276._16_4_ * 1.442695 + 0.5;
          auVar215._20_4_ = auVar276._20_4_ * 1.442695 + 0.5;
          auVar215._24_4_ = auVar276._24_4_ * 1.442695 + 0.5;
          auVar215._28_4_ = auVar237._12_4_ + 0.5;
          auVar49 = vroundps_avx(auVar215,1);
          auVar253 = vcmpps_avx(auVar215,auVar49,1);
          auVar253 = vandps_avx(auVar253,auVar277);
          auVar253 = vsubps_avx(auVar49,auVar253);
          auVar10._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar10._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar10._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar10._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar10._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar10._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar10._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar10._28_4_ = auVar49._28_4_;
          auVar276 = vsubps_avx(auVar276,auVar10);
          fVar230 = auVar276._0_4_;
          fVar232 = auVar276._4_4_;
          fVar234 = auVar276._8_4_;
          fVar258 = auVar276._12_4_;
          fVar259 = auVar276._16_4_;
          fVar260 = auVar276._20_4_;
          fVar261 = auVar276._24_4_;
          auVar206._0_4_ = (int)auVar253._0_4_;
          auVar206._4_4_ = (int)auVar253._4_4_;
          auVar206._8_4_ = (int)auVar253._8_4_;
          auVar206._12_4_ = (int)auVar253._12_4_;
          auVar216._16_4_ = (int)auVar253._16_4_;
          auVar216._0_16_ = auVar206;
          auVar216._20_4_ = (int)auVar253._20_4_;
          auVar216._24_4_ = (int)auVar253._24_4_;
          auVar216._28_4_ = (int)auVar253._28_4_;
          auVar239 = vpslld_avx(auVar206,0x17);
          auVar238 = vpslld_avx(auVar216._16_16_,0x17);
          auVar238 = vpaddd_avx(auVar238,auVar36);
          auVar239 = vpaddd_avx(auVar239,auVar36);
          auVar217._0_4_ =
               auVar239._0_4_ *
               (fVar230 * fVar230 *
                (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                  0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5) + fVar230 + 1.0) + 1.0;
          auVar217._4_4_ =
               auVar239._4_4_ *
               (fVar232 * fVar232 *
                (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                  0.041665796) * fVar232 + 0.16666666) * fVar232 + 0.5) + fVar232 + 1.0) + 1.0;
          auVar217._8_4_ =
               auVar239._8_4_ *
               (fVar234 * fVar234 *
                (((((fVar234 * 0.00019875691 + 0.0013981999) * fVar234 + 0.008333452) * fVar234 +
                  0.041665796) * fVar234 + 0.16666666) * fVar234 + 0.5) + fVar234 + 1.0) + 1.0;
          auVar217._12_4_ =
               auVar239._12_4_ *
               (fVar258 * fVar258 *
                (((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258 +
                  0.041665796) * fVar258 + 0.16666666) * fVar258 + 0.5) + fVar258 + 1.0) + 1.0;
          auVar217._16_4_ =
               auVar238._0_4_ *
               (fVar259 * fVar259 *
                (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                  0.041665796) * fVar259 + 0.16666666) * fVar259 + 0.5) + fVar259 + 1.0) + 1.0;
          auVar217._20_4_ =
               auVar238._4_4_ *
               (fVar260 * fVar260 *
                (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                  0.041665796) * fVar260 + 0.16666666) * fVar260 + 0.5) + fVar260 + 1.0) + 1.0;
          auVar217._24_4_ =
               auVar238._8_4_ *
               (fVar261 * fVar261 *
                (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                  0.041665796) * fVar261 + 0.16666666) * fVar261 + 0.5) + fVar261 + 1.0) + 1.0;
          auVar217._28_4_ = auVar49._28_4_ + auVar276._28_4_ + 1.0 + 1.0;
          auVar57._8_4_ = 0x800000;
          auVar57._0_8_ = 0x80000000800000;
          auVar57._12_4_ = 0x800000;
          auVar57._16_4_ = 0x800000;
          auVar57._20_4_ = 0x800000;
          auVar57._24_4_ = 0x800000;
          auVar57._28_4_ = 0x800000;
          auVar49 = vmaxps_avx(auVar217,auVar57);
          auVar238 = vpsrld_avx(auVar49._16_16_,0x17);
          auVar58._8_4_ = 0x807fffff;
          auVar58._0_8_ = 0x807fffff807fffff;
          auVar58._12_4_ = 0x807fffff;
          auVar58._16_4_ = 0x807fffff;
          auVar58._20_4_ = 0x807fffff;
          auVar58._24_4_ = 0x807fffff;
          auVar58._28_4_ = 0x807fffff;
          auVar253 = vandps_avx(auVar49,auVar58);
          auVar147 = vorps_avx(auVar253,auVar83);
          auVar59._8_4_ = 0x3f3504f3;
          auVar59._0_8_ = 0x3f3504f33f3504f3;
          auVar59._12_4_ = 0x3f3504f3;
          auVar59._16_4_ = 0x3f3504f3;
          auVar59._20_4_ = 0x3f3504f3;
          auVar59._24_4_ = 0x3f3504f3;
          auVar59._28_4_ = 0x3f3504f3;
          auVar276 = vcmpps_avx(auVar59,auVar147,2);
          auVar253 = vandnps_avx(auVar276,auVar147);
          fVar230 = auVar147._0_4_ + -1.0 + auVar253._0_4_;
          fVar232 = auVar147._4_4_ + -1.0 + auVar253._4_4_;
          fVar234 = auVar147._8_4_ + -1.0 + auVar253._8_4_;
          fVar258 = auVar147._12_4_ + -1.0 + auVar253._12_4_;
          fVar259 = auVar147._16_4_ + -1.0 + auVar253._16_4_;
          fVar260 = auVar147._20_4_ + -1.0 + auVar253._20_4_;
          fVar261 = auVar147._24_4_ + -1.0 + auVar253._24_4_;
          auVar238 = vpsubd_avx(auVar238,auVar276._16_16_);
          auVar239 = vpsrld_avx(auVar49._0_16_,0x17);
          auVar262._8_4_ = 0xffffff81;
          auVar262._0_8_ = 0xffffff81ffffff81;
          auVar262._12_4_ = 0xffffff81;
          auVar238 = vpaddd_avx(auVar262,auVar238);
          auVar239 = vpsubd_avx(auVar239,auVar276._0_16_);
          auVar239 = vpaddd_avx(auVar262,auVar239);
          auVar108._16_16_ = auVar238;
          auVar108._0_16_ = auVar239;
          auVar272 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
          auVar276 = vcmpps_avx(auVar217,ZEXT832(0) << 0x20,2);
          auVar49 = vcvtdq2ps_avx(auVar108);
          in_ZMM12 = ZEXT3264(CONCAT428(0x3f317218,
                                        CONCAT424(0x3f317218,
                                                  CONCAT420(0x3f317218,
                                                            CONCAT416(0x3f317218,
                                                                      CONCAT412(0x3f317218,
                                                                                CONCAT48(0x3f317218,
                                                                                                                                                                                  
                                                  0x3f3172183f317218)))))));
          auVar11._4_4_ =
               (fVar232 + auVar49._4_4_ * 0.6931472 +
               (((((((((fVar232 * 0.070376836 + -0.1151461) * fVar232 + 0.116769984) * fVar232 +
                     -0.12420141) * fVar232 + 0.14249323) * fVar232 + -0.16668057) * fVar232 +
                  0.20000714) * fVar232 + -0.24999994) * fVar232 + 0.3333333) * fVar232 + -0.5) *
               fVar232 * fVar232) * -2.0;
          auVar11._0_4_ =
               (fVar230 + auVar49._0_4_ * 0.6931472 +
               (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) * fVar230 +
                     -0.12420141) * fVar230 + 0.14249323) * fVar230 + -0.16668057) * fVar230 +
                  0.20000714) * fVar230 + -0.24999994) * fVar230 + 0.3333333) * fVar230 + -0.5) *
               fVar230 * fVar230) * -2.0;
          auVar11._8_4_ =
               (fVar234 + auVar49._8_4_ * 0.6931472 +
               (((((((((fVar234 * 0.070376836 + -0.1151461) * fVar234 + 0.116769984) * fVar234 +
                     -0.12420141) * fVar234 + 0.14249323) * fVar234 + -0.16668057) * fVar234 +
                  0.20000714) * fVar234 + -0.24999994) * fVar234 + 0.3333333) * fVar234 + -0.5) *
               fVar234 * fVar234) * -2.0;
          auVar11._12_4_ =
               (fVar258 + auVar49._12_4_ * 0.6931472 +
               (((((((((fVar258 * 0.070376836 + -0.1151461) * fVar258 + 0.116769984) * fVar258 +
                     -0.12420141) * fVar258 + 0.14249323) * fVar258 + -0.16668057) * fVar258 +
                  0.20000714) * fVar258 + -0.24999994) * fVar258 + 0.3333333) * fVar258 + -0.5) *
               fVar258 * fVar258) * -2.0;
          auVar11._16_4_ =
               (fVar259 + auVar49._16_4_ * 0.6931472 +
               (((((((((fVar259 * 0.070376836 + -0.1151461) * fVar259 + 0.116769984) * fVar259 +
                     -0.12420141) * fVar259 + 0.14249323) * fVar259 + -0.16668057) * fVar259 +
                  0.20000714) * fVar259 + -0.24999994) * fVar259 + 0.3333333) * fVar259 + -0.5) *
               fVar259 * fVar259) * -2.0;
          auVar11._20_4_ =
               (fVar260 + auVar49._20_4_ * 0.6931472 +
               (((((((((fVar260 * 0.070376836 + -0.1151461) * fVar260 + 0.116769984) * fVar260 +
                     -0.12420141) * fVar260 + 0.14249323) * fVar260 + -0.16668057) * fVar260 +
                  0.20000714) * fVar260 + -0.24999994) * fVar260 + 0.3333333) * fVar260 + -0.5) *
               fVar260 * fVar260) * -2.0;
          auVar11._24_4_ =
               (fVar261 + auVar49._24_4_ * 0.6931472 +
               (((((((((fVar261 * 0.070376836 + -0.1151461) * fVar261 + 0.116769984) * fVar261 +
                     -0.12420141) * fVar261 + 0.14249323) * fVar261 + -0.16668057) * fVar261 +
                  0.20000714) * fVar261 + -0.24999994) * fVar261 + 0.3333333) * fVar261 + -0.5) *
               fVar261 * fVar261) * -2.0;
          auVar11._28_4_ = auVar147._28_4_ + -1.0 + auVar253._28_4_ + auVar49._28_4_ + 0.0;
          auVar166._8_4_ = 0x7fffffff;
          auVar166._0_8_ = 0x7fffffff7fffffff;
          auVar166._12_4_ = 0x7fffffff;
          auVar166._16_4_ = 0x7fffffff;
          auVar166._20_4_ = 0x7fffffff;
          auVar166._24_4_ = 0x7fffffff;
          auVar166._28_4_ = 0x7fffffff;
          auVar253 = vblendvps_avx(auVar11,auVar166,auVar276);
          auVar72._8_4_ = 0x42b0c0a5;
          auVar72._0_8_ = 0x42b0c0a542b0c0a5;
          auVar72._12_4_ = 0x42b0c0a5;
          auVar72._16_4_ = 0x42b0c0a5;
          auVar72._20_4_ = 0x42b0c0a5;
          auVar72._24_4_ = 0x42b0c0a5;
          auVar72._28_4_ = 0x42b0c0a5;
          auVar253 = vminps_avx(auVar253,auVar72);
          auVar73._8_4_ = 0xc2b0c0a5;
          auVar73._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar73._12_4_ = 0xc2b0c0a5;
          auVar73._16_4_ = 0xc2b0c0a5;
          auVar73._20_4_ = 0xc2b0c0a5;
          auVar73._24_4_ = 0xc2b0c0a5;
          auVar73._28_4_ = 0xc2b0c0a5;
          auVar276 = vmaxps_avx(auVar253,auVar73);
          auVar167._0_4_ = auVar276._0_4_ * 1.442695 + 0.5;
          auVar167._4_4_ = auVar276._4_4_ * 1.442695 + 0.5;
          auVar167._8_4_ = auVar276._8_4_ * 1.442695 + 0.5;
          auVar167._12_4_ = auVar276._12_4_ * 1.442695 + 0.5;
          auVar167._16_4_ = auVar276._16_4_ * 1.442695 + 0.5;
          auVar167._20_4_ = auVar276._20_4_ * 1.442695 + 0.5;
          auVar167._24_4_ = auVar276._24_4_ * 1.442695 + 0.5;
          auVar167._28_4_ = 0x7fc00000;
          auVar49 = vroundps_avx(auVar167,1);
          auVar253 = vcmpps_avx(auVar167,auVar49,1);
          auVar253 = vandps_avx(auVar277,auVar253);
          auVar253 = vsubps_avx(auVar49,auVar253);
          auVar12._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar12._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar12._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar12._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar12._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar12._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar12._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar12._28_4_ = auVar49._28_4_;
          auVar276 = vsubps_avx(auVar276,auVar12);
          fVar230 = auVar276._0_4_;
          fVar232 = auVar276._4_4_;
          fVar234 = auVar276._8_4_;
          fVar258 = auVar276._12_4_;
          fVar259 = auVar276._16_4_;
          fVar260 = auVar276._20_4_;
          fVar261 = auVar276._24_4_;
          auVar149._0_4_ = (int)auVar253._0_4_;
          auVar149._4_4_ = (int)auVar253._4_4_;
          auVar149._8_4_ = (int)auVar253._8_4_;
          auVar149._12_4_ = (int)auVar253._12_4_;
          auVar168._16_4_ = (int)auVar253._16_4_;
          auVar168._0_16_ = auVar149;
          auVar168._20_4_ = (int)auVar253._20_4_;
          auVar168._24_4_ = (int)auVar253._24_4_;
          auVar168._28_4_ = (int)auVar253._28_4_;
          auVar239 = vpslld_avx(auVar149,0x17);
          auVar238 = vpslld_avx(auVar168._16_16_,0x17);
          auVar238 = vpaddd_avx(auVar238,auVar36);
          auVar239 = vpaddd_avx(auVar239,auVar36);
          auVar169._0_4_ =
               auVar282._0_4_ *
               (fVar204 * fVar204 *
                (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                  0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5) + fVar204 + 1.0) + 1.0;
          auVar169._4_4_ =
               auVar282._4_4_ *
               (fVar231 * fVar231 *
                (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                  0.041665796) * fVar231 + 0.16666666) * fVar231 + 0.5) + fVar231 + 1.0) + 1.0;
          auVar169._8_4_ =
               auVar282._8_4_ *
               (fVar233 * fVar233 *
                (((((fVar233 * 0.00019875691 + 0.0013981999) * fVar233 + 0.008333452) * fVar233 +
                  0.041665796) * fVar233 + 0.16666666) * fVar233 + 0.5) + fVar233 + 1.0) + 1.0;
          auVar169._12_4_ =
               auVar282._12_4_ *
               (fVar235 * fVar235 *
                (((((fVar235 * 0.00019875691 + 0.0013981999) * fVar235 + 0.008333452) * fVar235 +
                  0.041665796) * fVar235 + 0.16666666) * fVar235 + 0.5) + fVar235 + 1.0) + 1.0;
          auVar169._16_4_ =
               auVar237._0_4_ *
               (fVar344 * fVar344 *
                (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
                  0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5) + fVar344 + 1.0) + 1.0;
          auVar169._20_4_ =
               auVar237._4_4_ *
               (fVar347 * fVar347 *
                (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                  0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5) + fVar347 + 1.0) + 1.0;
          auVar169._24_4_ =
               auVar237._8_4_ *
               (fVar348 * fVar348 *
                (((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452) * fVar348 +
                  0.041665796) * fVar348 + 0.16666666) * fVar348 + 0.5) + fVar348 + 1.0) + 1.0;
          auVar169._28_4_ = auVar144._28_4_ + auVar270._28_4_ + 1.0 + 1.0;
          auVar218._8_4_ = 0x40000000;
          auVar218._0_8_ = 0x4000000040000000;
          auVar218._12_4_ = 0x40000000;
          auVar218._16_4_ = 0x40000000;
          auVar218._20_4_ = 0x40000000;
          auVar218._24_4_ = 0x40000000;
          auVar218._28_4_ = 0x40000000;
          auVar253 = vdivps_avx(auVar218,auVar169);
          auVar109._0_4_ =
               (fVar230 * fVar230 *
                (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                  0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5) + fVar230 + 1.0) *
               auVar239._0_4_ + 1.0;
          auVar109._4_4_ =
               (fVar232 * fVar232 *
                (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                  0.041665796) * fVar232 + 0.16666666) * fVar232 + 0.5) + fVar232 + 1.0) *
               auVar239._4_4_ + 1.0;
          auVar109._8_4_ =
               (fVar234 * fVar234 *
                (((((fVar234 * 0.00019875691 + 0.0013981999) * fVar234 + 0.008333452) * fVar234 +
                  0.041665796) * fVar234 + 0.16666666) * fVar234 + 0.5) + fVar234 + 1.0) *
               auVar239._8_4_ + 1.0;
          auVar109._12_4_ =
               (fVar258 * fVar258 *
                (((((fVar258 * 0.00019875691 + 0.0013981999) * fVar258 + 0.008333452) * fVar258 +
                  0.041665796) * fVar258 + 0.16666666) * fVar258 + 0.5) + fVar258 + 1.0) *
               auVar239._12_4_ + 1.0;
          auVar109._16_4_ =
               (fVar259 * fVar259 *
                (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                  0.041665796) * fVar259 + 0.16666666) * fVar259 + 0.5) + fVar259 + 1.0) *
               auVar238._0_4_ + 1.0;
          auVar109._20_4_ =
               (fVar260 * fVar260 *
                (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                  0.041665796) * fVar260 + 0.16666666) * fVar260 + 0.5) + fVar260 + 1.0) *
               auVar238._4_4_ + 1.0;
          auVar109._24_4_ =
               (fVar261 * fVar261 *
                (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                  0.041665796) * fVar261 + 0.16666666) * fVar261 + 0.5) + fVar261 + 1.0) *
               auVar238._8_4_ + 1.0;
          auVar109._28_4_ = auVar49._28_4_ + auVar276._28_4_ + 1.0 + 1.0;
          auVar276 = vdivps_avx(auVar218,auVar109);
          fVar231 = auVar253._28_4_ + -1.0;
          auVar335._0_4_ = auVar336._0_4_ * (auVar253._0_4_ + -1.0);
          auVar335._4_4_ = auVar336._4_4_ * (auVar253._4_4_ + -1.0);
          auVar335._8_4_ = auVar336._8_4_ * (auVar253._8_4_ + -1.0);
          auVar335._12_4_ = auVar336._12_4_ * (auVar253._12_4_ + -1.0);
          auVar335._16_4_ = auVar336._16_4_ * (auVar253._16_4_ + -1.0);
          auVar335._20_4_ = auVar336._20_4_ * (auVar253._20_4_ + -1.0);
          auVar335._24_4_ = auVar336._24_4_ * (auVar253._24_4_ + -1.0);
          auVar110._0_4_ = auVar276._0_4_ + -1.0;
          auVar110._4_4_ = auVar276._4_4_ + -1.0;
          auVar110._8_4_ = auVar276._8_4_ + -1.0;
          auVar110._12_4_ = auVar276._12_4_ + -1.0;
          auVar110._16_4_ = auVar276._16_4_ + -1.0;
          auVar110._20_4_ = auVar276._20_4_ + -1.0;
          auVar110._24_4_ = auVar276._24_4_ + -1.0;
          auVar110._28_4_ = auVar276._28_4_ + -1.0;
          goto LAB_0046aa80;
        case 6:
          fVar230 = *(float *)*in_stack_00000020;
          fVar231 = ((float *)*in_stack_00000020)[1];
          auVar223._0_4_ = auVar336._0_4_ * fVar230 + fVar231;
          auVar223._4_4_ = auVar336._4_4_ * fVar230 + fVar231;
          auVar223._8_4_ = auVar336._8_4_ * fVar230 + fVar231;
          auVar223._12_4_ = auVar336._12_4_ * fVar230 + fVar231;
          auVar223._16_4_ = auVar336._16_4_ * fVar230 + fVar231;
          auVar223._20_4_ = auVar336._20_4_ * fVar230 + fVar231;
          auVar223._24_4_ = auVar336._24_4_ * fVar230 + fVar231;
          auVar223._28_4_ = fVar204 + fVar231;
          auVar253 = vmaxps_avx(auVar223,ZEXT832(0) << 0x20);
          auVar253 = vminps_avx(auVar253,auVar277);
          auVar335._0_4_ = auVar253._0_4_ * auVar336._0_4_;
          auVar335._4_4_ = auVar253._4_4_ * auVar336._4_4_;
          auVar335._8_4_ = auVar253._8_4_ * auVar336._8_4_;
          auVar335._12_4_ = auVar253._12_4_ * auVar336._12_4_;
          auVar335._16_4_ = auVar253._16_4_ * auVar336._16_4_;
          auVar335._20_4_ = auVar253._20_4_ * auVar336._20_4_;
          auVar335._24_4_ = auVar253._24_4_ * auVar336._24_4_;
          auVar111._0_4_ = auVar317._0_4_ * fVar230 + fVar231;
          auVar111._4_4_ = auVar317._4_4_ * fVar230 + fVar231;
          auVar111._8_4_ = auVar317._8_4_ * fVar230 + fVar231;
          auVar111._12_4_ = auVar317._12_4_ * fVar230 + fVar231;
          auVar111._16_4_ = auVar317._16_4_ * fVar230 + fVar231;
          auVar111._20_4_ = auVar317._20_4_ * fVar230 + fVar231;
          auVar111._24_4_ = auVar317._24_4_ * fVar230 + fVar231;
          auVar111._28_4_ = fVar230 + fVar231;
          auVar253 = vmaxps_avx(ZEXT832(0) << 0x20,auVar111);
          auVar110 = vminps_avx(auVar277,auVar253);
LAB_0046aa80:
          auVar253 = CONCAT428(register0x0000159c,auVar335);
          in_ZMM14 = ZEXT3264(auVar253);
          auVar203 = ZEXT436((uint)fVar231);
          auVar114 = ZEXT436(auVar110._28_4_);
          auVar317._0_4_ = auVar317._0_4_ * auVar110._0_4_;
          auVar317._4_4_ = auVar317._4_4_ * auVar110._4_4_;
          auVar317._8_4_ = auVar317._8_4_ * auVar110._8_4_;
          auVar317._12_4_ = auVar317._12_4_ * auVar110._12_4_;
          auVar317._16_4_ = auVar317._16_4_ * auVar110._16_4_;
          auVar317._20_4_ = auVar317._20_4_ * auVar110._20_4_;
          auVar317._24_4_ = auVar317._24_4_ * auVar110._24_4_;
        }
        auVar300._0_4_ = in_ZMM14._0_4_ * (float)local_f8._0_4_;
        auVar300._4_4_ = in_ZMM14._4_4_ * (float)local_f8._4_4_;
        auVar300._8_4_ = in_ZMM14._8_4_ * fStack_f0;
        auVar300._12_4_ = in_ZMM14._12_4_ * fStack_ec;
        auVar300._16_4_ = in_ZMM14._16_4_ * fStack_e8;
        auVar300._20_4_ = in_ZMM14._20_4_ * fStack_e4;
        auVar300._24_4_ = in_ZMM14._24_4_ * fStack_e0;
        auVar300._28_36_ = auVar114;
        auVar334._0_4_ = auVar317._0_4_ * (float)local_f8._0_4_;
        auVar334._4_4_ = auVar317._4_4_ * (float)local_f8._4_4_;
        auVar334._8_4_ = auVar317._8_4_ * fStack_f0;
        auVar334._12_4_ = auVar317._12_4_ * fStack_ec;
        auVar334._16_4_ = auVar317._16_4_ * fStack_e8;
        auVar334._20_4_ = auVar317._20_4_ * fStack_e4;
        auVar334._24_4_ = auVar317._24_4_ * fStack_e0;
        auVar334._28_36_ = auVar203;
        auVar253 = vandps_avx(auVar300._0_32_,auVar75);
        auVar276 = vandps_avx(auVar334._0_32_,auVar75);
        auVar253 = vorps_avx(auVar253,auVar83);
        auVar276 = vorps_avx(auVar276,auVar83);
        auVar85._0_4_ = (int)(auVar253._0_4_ + auVar300._0_4_);
        auVar85._4_4_ = (int)(auVar253._4_4_ + auVar300._4_4_);
        auVar85._8_4_ = (int)(auVar253._8_4_ + auVar300._8_4_);
        auVar85._12_4_ = (int)(auVar253._12_4_ + auVar300._12_4_);
        auVar112._16_4_ = (int)(auVar253._16_4_ + auVar300._16_4_);
        auVar112._0_16_ = auVar85;
        auVar112._20_4_ = (int)(auVar253._20_4_ + auVar300._20_4_);
        auVar112._24_4_ = (int)(auVar253._24_4_ + auVar300._24_4_);
        auVar112._28_4_ = (int)(auVar253._28_4_ + auVar114._0_4_);
        auVar150._0_4_ = (int)(auVar276._0_4_ + auVar334._0_4_);
        auVar150._4_4_ = (int)(auVar276._4_4_ + auVar334._4_4_);
        auVar150._8_4_ = (int)(auVar276._8_4_ + auVar334._8_4_);
        auVar150._12_4_ = (int)(auVar276._12_4_ + auVar334._12_4_);
        auVar170._16_4_ = (int)(auVar276._16_4_ + auVar334._16_4_);
        auVar170._0_16_ = auVar150;
        auVar170._20_4_ = (int)(auVar276._20_4_ + auVar334._20_4_);
        auVar170._24_4_ = (int)(auVar276._24_4_ + auVar334._24_4_);
        auVar170._28_4_ = (int)(auVar276._28_4_ + auVar203._0_4_);
        in_ZMM8 = ZEXT1664(auVar112._16_16_);
        auVar237 = vpackssdw_avx(auVar85,auVar112._16_16_);
        auVar282 = vpackssdw_avx(auVar150,auVar170._16_16_);
        auVar237 = vpminsw_avx(auVar272._0_16_,auVar237);
        auVar282 = vpminsw_avx(auVar272._0_16_,auVar282);
        auVar237 = vpmaxsw_avx(auVar237,auVar280._0_16_);
        auVar282 = vpmaxsw_avx(auVar282,auVar280._0_16_);
        in_ZMM7 = ZEXT1664(auVar282);
        auVar237 = vpacksswb_avx(auVar237,auVar282);
        in_ZMM5 = ZEXT1664(auVar237);
        *(undefined1 (*) [16])ptr = auVar237;
        intptr = (int *)((long)intptr + 0x40);
        ptr = (char *)((long)ptr + 0x10);
        iVar33 = iVar33 + 0x10;
      } while (iVar33 < (int)uVar34);
    }
    if ((int)(uVar31 | 7) < (int)uVar34) {
      pfVar3 = (float *)*in_stack_00000020;
      auVar76._8_4_ = 0x80000000;
      auVar76._0_8_ = 0x8000000080000000;
      auVar76._12_4_ = 0x80000000;
      auVar76._16_4_ = 0x80000000;
      auVar76._20_4_ = 0x80000000;
      auVar76._24_4_ = 0x80000000;
      auVar76._28_4_ = 0x80000000;
      auVar61._8_4_ = 0x3f000000;
      auVar61._0_8_ = 0x3f0000003f000000;
      auVar61._12_4_ = 0x3f000000;
      auVar61._16_4_ = 0x3f000000;
      auVar61._20_4_ = 0x3f000000;
      auVar61._24_4_ = 0x3f000000;
      auVar61._28_4_ = 0x3f000000;
      auVar86._8_4_ = 0x7f007f;
      auVar86._0_8_ = 0x7f007f007f007f;
      auVar86._12_4_ = 0x7f007f;
      auVar115._8_4_ = 0xff81ff81;
      auVar115._0_8_ = 0xff81ff81ff81ff81;
      auVar115._12_4_ = 0xff81ff81;
      auVar269._8_4_ = 0xc2b0c0a5;
      auVar269._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar269._12_4_ = 0xc2b0c0a5;
      auVar269._16_4_ = 0xc2b0c0a5;
      auVar269._20_4_ = 0xc2b0c0a5;
      auVar269._24_4_ = 0xc2b0c0a5;
      auVar269._28_4_ = 0xc2b0c0a5;
      auVar280 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      uVar32 = uVar31;
      do {
        auVar114 = in_ZMM7._28_36_;
        auVar253 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        auVar318._0_4_ = auVar253._0_4_ * (float)local_d8._0_4_ + (float)local_98._0_4_;
        auVar318._4_4_ = auVar253._4_4_ * (float)local_d8._4_4_ + (float)local_98._4_4_;
        auVar318._8_4_ = auVar253._8_4_ * fStack_d0 + fStack_90;
        auVar318._12_4_ = auVar253._12_4_ * fStack_cc + fStack_8c;
        auVar318._16_4_ = auVar253._16_4_ * fStack_c8 + fStack_88;
        auVar318._20_4_ = auVar253._20_4_ * fStack_c4 + fStack_84;
        auVar318._24_4_ = auVar253._24_4_ * fStack_c0 + fStack_80;
        auVar322._28_4_ = auVar253._28_4_ + fStack_7c;
        auVar322._0_28_ = auVar318;
        auVar253 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar276 = auVar280._0_32_;
        fVar230 = auVar280._4_4_;
        fVar231 = auVar280._8_4_;
        fVar232 = auVar280._12_4_;
        fVar233 = auVar280._16_4_;
        fVar234 = auVar280._20_4_;
        fVar235 = auVar280._24_4_;
        fVar258 = auVar280._28_4_;
        fVar204 = auVar280._0_4_;
        switch(elempack) {
        case 1:
          auVar253 = vmaxps_avx(auVar322,auVar253);
          auVar318 = auVar253._0_28_;
          break;
        case 2:
          auVar276 = vmaxps_avx(auVar322,auVar253);
          in_ZMM14 = ZEXT3264(auVar276);
          auVar253 = vminps_avx(auVar322,auVar253);
          fVar204 = *pfVar3;
          auVar318._0_4_ = fVar204 * auVar253._0_4_ + auVar276._0_4_;
          auVar318._4_4_ = fVar204 * auVar253._4_4_ + auVar276._4_4_;
          auVar318._8_4_ = fVar204 * auVar253._8_4_ + auVar276._8_4_;
          auVar318._12_4_ = fVar204 * auVar253._12_4_ + auVar276._12_4_;
          auVar318._16_4_ = fVar204 * auVar253._16_4_ + auVar276._16_4_;
          auVar318._20_4_ = fVar204 * auVar253._20_4_ + auVar276._20_4_;
          auVar318._24_4_ = fVar204 * auVar253._24_4_ + auVar276._24_4_;
          break;
        case 3:
          fVar204 = *pfVar3;
          auVar339._4_4_ = fVar204;
          auVar339._0_4_ = fVar204;
          auVar339._8_4_ = fVar204;
          auVar339._12_4_ = fVar204;
          auVar339._16_4_ = fVar204;
          auVar339._20_4_ = fVar204;
          auVar339._24_4_ = fVar204;
          auVar339._28_4_ = fVar204;
          in_ZMM14 = ZEXT3264(auVar339);
          fVar204 = pfVar3[1];
          auVar345._4_4_ = fVar204;
          auVar345._0_4_ = fVar204;
          auVar345._8_4_ = fVar204;
          auVar345._12_4_ = fVar204;
          auVar345._16_4_ = fVar204;
          auVar345._20_4_ = fVar204;
          auVar345._24_4_ = fVar204;
          auVar345._28_4_ = fVar204;
          auVar253 = vmaxps_avx(auVar322,auVar339);
          auVar253 = vminps_avx(auVar253,auVar345);
          auVar318 = auVar253._0_28_;
          break;
        case 4:
          uVar29 = CONCAT44(auVar318._4_4_,auVar318._0_4_);
          auVar323._0_8_ = uVar29 ^ 0x8000000080000000;
          auVar323._8_4_ = -auVar318._8_4_;
          auVar323._12_4_ = -auVar318._12_4_;
          auVar323._16_4_ = -auVar318._16_4_;
          auVar323._20_4_ = -auVar318._20_4_;
          auVar323._24_4_ = -auVar318._24_4_;
          auVar323._28_4_ = -auVar322._28_4_;
          auVar47._8_4_ = 0x42b0c0a5;
          auVar47._0_8_ = 0x42b0c0a542b0c0a5;
          auVar47._12_4_ = 0x42b0c0a5;
          auVar47._16_4_ = 0x42b0c0a5;
          auVar47._20_4_ = 0x42b0c0a5;
          auVar47._24_4_ = 0x42b0c0a5;
          auVar47._28_4_ = 0x42b0c0a5;
          auVar253 = vminps_avx(auVar323,auVar47);
          auVar49 = vmaxps_avx(auVar253,auVar269);
          auVar340._0_4_ = auVar49._0_4_ * 1.442695 + 0.5;
          auVar340._4_4_ = auVar49._4_4_ * 1.442695 + 0.5;
          auVar340._8_4_ = auVar49._8_4_ * 1.442695 + 0.5;
          auVar340._12_4_ = auVar49._12_4_ * 1.442695 + 0.5;
          auVar340._16_4_ = auVar49._16_4_ * 1.442695 + 0.5;
          auVar340._20_4_ = auVar49._20_4_ * 1.442695 + 0.5;
          auVar340._24_4_ = auVar49._24_4_ * 1.442695 + 0.5;
          auVar340._28_4_ = in_ZMM14._28_4_ + 0.5;
          auVar147 = vroundps_avx(auVar340,1);
          auVar253 = vcmpps_avx(auVar340,auVar147,1);
          auVar253 = vandps_avx(auVar253,auVar276);
          auVar253 = vsubps_avx(auVar147,auVar253);
          fVar344 = auVar49._0_4_ + auVar253._0_4_ * -0.6931472;
          fVar259 = auVar49._4_4_ + auVar253._4_4_ * -0.6931472;
          fVar347 = auVar49._8_4_ + auVar253._8_4_ * -0.6931472;
          fVar260 = auVar49._12_4_ + auVar253._12_4_ * -0.6931472;
          fVar348 = auVar49._16_4_ + auVar253._16_4_ * -0.6931472;
          fVar261 = auVar49._20_4_ + auVar253._20_4_ * -0.6931472;
          fVar351 = auVar49._24_4_ + auVar253._24_4_ * -0.6931472;
          auVar309._0_4_ = (int)auVar253._0_4_;
          auVar309._4_4_ = (int)auVar253._4_4_;
          auVar309._8_4_ = (int)auVar253._8_4_;
          auVar309._12_4_ = (int)auVar253._12_4_;
          auVar324._16_4_ = (int)auVar253._16_4_;
          auVar324._0_16_ = auVar309;
          auVar324._20_4_ = (int)auVar253._20_4_;
          auVar324._24_4_ = (int)auVar253._24_4_;
          auVar324._28_4_ = (int)auVar253._28_4_;
          auVar282 = vpslld_avx(auVar309,0x17);
          auVar237 = vpslld_avx(auVar324._16_16_,0x17);
          auVar37._8_4_ = 0x3f800000;
          auVar37._0_8_ = 0x3f8000003f800000;
          auVar37._12_4_ = 0x3f800000;
          auVar237 = vpaddd_avx(auVar237,auVar37);
          auVar282 = vpaddd_avx(auVar282,auVar37);
          in_ZMM14 = ZEXT1664(auVar282);
          auVar292._0_4_ =
               (fVar344 + fVar204 +
               fVar344 * fVar344 *
               (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
                 0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5)) * auVar282._0_4_ + fVar204;
          auVar292._4_4_ =
               (fVar259 + fVar230 +
               fVar259 * fVar259 *
               (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                 0.041665796) * fVar259 + 0.16666666) * fVar259 + 0.5)) * auVar282._4_4_ + fVar230;
          auVar292._8_4_ =
               (fVar347 + fVar231 +
               fVar347 * fVar347 *
               (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                 0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5)) * auVar282._8_4_ + fVar231;
          auVar292._12_4_ =
               (fVar260 + fVar232 +
               fVar260 * fVar260 *
               (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                 0.041665796) * fVar260 + 0.16666666) * fVar260 + 0.5)) * auVar282._12_4_ + fVar232;
          auVar292._16_4_ =
               (fVar348 + fVar233 +
               fVar348 * fVar348 *
               (((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452) * fVar348 +
                 0.041665796) * fVar348 + 0.16666666) * fVar348 + 0.5)) * auVar237._0_4_ + fVar233;
          auVar292._20_4_ =
               (fVar261 + fVar234 +
               fVar261 * fVar261 *
               (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                 0.041665796) * fVar261 + 0.16666666) * fVar261 + 0.5)) * auVar237._4_4_ + fVar234;
          auVar292._24_4_ =
               (fVar351 + fVar235 +
               fVar351 * fVar351 *
               (((((fVar351 * 0.00019875691 + 0.0013981999) * fVar351 + 0.008333452) * fVar351 +
                 0.041665796) * fVar351 + 0.16666666) * fVar351 + 0.5)) * auVar237._8_4_ + fVar235;
          auVar292._28_4_ =
               auVar49._28_4_ + auVar147._28_4_ + fVar258 +
               in_ZMM12._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 +
               fVar258;
          in_ZMM12 = ZEXT3264(auVar292);
          auVar253 = vdivps_avx(auVar276,auVar292);
          auVar318 = auVar253._0_28_;
          break;
        case 5:
          auVar41._8_4_ = 0x42b0c0a5;
          auVar41._0_8_ = 0x42b0c0a542b0c0a5;
          auVar41._12_4_ = 0x42b0c0a5;
          auVar41._16_4_ = 0x42b0c0a5;
          auVar41._20_4_ = 0x42b0c0a5;
          auVar41._24_4_ = 0x42b0c0a5;
          auVar41._28_4_ = 0x42b0c0a5;
          auVar253 = vminps_avx(auVar322,auVar41);
          auVar49 = vmaxps_avx(auVar253,auVar269);
          auVar337._0_4_ = auVar49._0_4_ * 1.442695 + 0.5;
          auVar337._4_4_ = auVar49._4_4_ * 1.442695 + 0.5;
          auVar337._8_4_ = auVar49._8_4_ * 1.442695 + 0.5;
          auVar337._12_4_ = auVar49._12_4_ * 1.442695 + 0.5;
          auVar337._16_4_ = auVar49._16_4_ * 1.442695 + 0.5;
          auVar337._20_4_ = auVar49._20_4_ * 1.442695 + 0.5;
          auVar337._24_4_ = auVar49._24_4_ * 1.442695 + 0.5;
          auVar337._28_4_ = in_ZMM14._28_4_ + 0.5;
          auVar147 = vroundps_avx(auVar337,1);
          auVar253 = vcmpps_avx(auVar337,auVar147,1);
          auVar253 = vandps_avx(auVar253,auVar276);
          auVar253 = vsubps_avx(auVar147,auVar253);
          auVar15._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar15._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar15._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar15._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar15._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar15._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar15._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar15._28_4_ = auVar147._28_4_;
          auVar49 = vsubps_avx(auVar49,auVar15);
          fVar344 = auVar49._0_4_;
          fVar259 = auVar49._4_4_;
          fVar347 = auVar49._8_4_;
          fVar260 = auVar49._12_4_;
          fVar348 = auVar49._16_4_;
          fVar261 = auVar49._20_4_;
          fVar351 = auVar49._24_4_;
          auVar285._0_4_ = (int)auVar253._0_4_;
          auVar285._4_4_ = (int)auVar253._4_4_;
          auVar285._8_4_ = (int)auVar253._8_4_;
          auVar285._12_4_ = (int)auVar253._12_4_;
          auVar291._16_4_ = (int)auVar253._16_4_;
          auVar291._0_16_ = auVar285;
          auVar291._20_4_ = (int)auVar253._20_4_;
          auVar291._24_4_ = (int)auVar253._24_4_;
          auVar291._28_4_ = (int)auVar253._28_4_;
          auVar282 = vpslld_avx(auVar285,0x17);
          auVar237 = vpslld_avx(auVar291._16_16_,0x17);
          auVar274._8_4_ = 0x3f800000;
          auVar274._0_8_ = 0x3f8000003f800000;
          auVar274._12_4_ = 0x3f800000;
          auVar237 = vpaddd_avx(auVar237,auVar274);
          auVar282 = vpaddd_avx(auVar282,auVar274);
          auVar338._0_4_ =
               (fVar344 + fVar204 +
               fVar344 * fVar344 *
               (((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
                 0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5)) * auVar282._0_4_ + fVar204;
          auVar338._4_4_ =
               (fVar259 + fVar230 +
               fVar259 * fVar259 *
               (((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                 0.041665796) * fVar259 + 0.16666666) * fVar259 + 0.5)) * auVar282._4_4_ + fVar230;
          auVar338._8_4_ =
               (fVar347 + fVar231 +
               fVar347 * fVar347 *
               (((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                 0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5)) * auVar282._8_4_ + fVar231;
          auVar338._12_4_ =
               (fVar260 + fVar232 +
               fVar260 * fVar260 *
               (((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                 0.041665796) * fVar260 + 0.16666666) * fVar260 + 0.5)) * auVar282._12_4_ + fVar232;
          auVar338._16_4_ =
               (fVar348 + fVar233 +
               fVar348 * fVar348 *
               (((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452) * fVar348 +
                 0.041665796) * fVar348 + 0.16666666) * fVar348 + 0.5)) * auVar237._0_4_ + fVar233;
          auVar338._20_4_ =
               (fVar261 + fVar234 +
               fVar261 * fVar261 *
               (((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                 0.041665796) * fVar261 + 0.16666666) * fVar261 + 0.5)) * auVar237._4_4_ + fVar234;
          auVar338._24_4_ =
               (fVar351 + fVar235 +
               fVar351 * fVar351 *
               (((((fVar351 * 0.00019875691 + 0.0013981999) * fVar351 + 0.008333452) * fVar351 +
                 0.041665796) * fVar351 + 0.16666666) * fVar351 + 0.5)) * auVar237._8_4_ + fVar235;
          auVar338._28_4_ =
               auVar49._28_4_ + fVar258 +
               in_ZMM8._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 +
               fVar258;
          in_ZMM14 = ZEXT3264(auVar338);
          auVar42._8_4_ = 0x800000;
          auVar42._0_8_ = 0x80000000800000;
          auVar42._12_4_ = 0x800000;
          auVar42._16_4_ = 0x800000;
          auVar42._20_4_ = 0x800000;
          auVar42._24_4_ = 0x800000;
          auVar42._28_4_ = 0x800000;
          auVar147 = vmaxps_avx(auVar338,auVar42);
          auVar237 = vpsrld_avx(auVar147._16_16_,0x17);
          auVar43._8_4_ = 0x807fffff;
          auVar43._0_8_ = 0x807fffff807fffff;
          auVar43._12_4_ = 0x807fffff;
          auVar43._16_4_ = 0x807fffff;
          auVar43._20_4_ = 0x807fffff;
          auVar43._24_4_ = 0x807fffff;
          auVar43._28_4_ = 0x807fffff;
          auVar253 = vandps_avx(auVar147,auVar43);
          auVar144 = vorps_avx(auVar253,auVar61);
          auVar171._8_4_ = 0x3f3504f3;
          auVar171._0_8_ = 0x3f3504f33f3504f3;
          auVar171._12_4_ = 0x3f3504f3;
          auVar171._16_4_ = 0x3f3504f3;
          auVar171._20_4_ = 0x3f3504f3;
          auVar171._24_4_ = 0x3f3504f3;
          auVar171._28_4_ = 0x3f3504f3;
          auVar49 = vcmpps_avx(auVar171,auVar144,2);
          auVar253 = vandnps_avx(auVar49,auVar144);
          fVar344 = auVar144._0_4_ + -1.0 + auVar253._0_4_;
          fVar259 = auVar144._4_4_ + -1.0 + auVar253._4_4_;
          fVar347 = auVar144._8_4_ + -1.0 + auVar253._8_4_;
          fVar260 = auVar144._12_4_ + -1.0 + auVar253._12_4_;
          fVar348 = auVar144._16_4_ + -1.0 + auVar253._16_4_;
          fVar261 = auVar144._20_4_ + -1.0 + auVar253._20_4_;
          fVar351 = auVar144._24_4_ + -1.0 + auVar253._24_4_;
          auVar237 = vpsubd_avx(auVar237,auVar49._16_16_);
          auVar282 = vpsrld_avx(auVar147._0_16_,0x17);
          auVar286._8_4_ = 0xffffff81;
          auVar286._0_8_ = 0xffffff81ffffff81;
          auVar286._12_4_ = 0xffffff81;
          auVar237 = vpaddd_avx(auVar286,auVar237);
          auVar282 = vpsubd_avx(auVar282,auVar49._0_16_);
          auVar282 = vpaddd_avx(auVar282,auVar286);
          auVar172._16_16_ = auVar237;
          auVar172._0_16_ = auVar282;
          auVar49 = vcmpps_avx(auVar338,_DAT_005a70a0,2);
          auVar147 = vcvtdq2ps_avx(auVar172);
          auVar16._4_4_ =
               (fVar259 * fVar259 *
                (((((((((fVar259 * 0.070376836 + -0.1151461) * fVar259 + 0.116769984) * fVar259 +
                      -0.12420141) * fVar259 + 0.14249323) * fVar259 + -0.16668057) * fVar259 +
                   0.20000714) * fVar259 + -0.24999994) * fVar259 + 0.3333333) * fVar259 + -0.5) +
               fVar259 + auVar147._4_4_ * 0.6931472) * -2.0;
          auVar16._0_4_ =
               (fVar344 * fVar344 *
                (((((((((fVar344 * 0.070376836 + -0.1151461) * fVar344 + 0.116769984) * fVar344 +
                      -0.12420141) * fVar344 + 0.14249323) * fVar344 + -0.16668057) * fVar344 +
                   0.20000714) * fVar344 + -0.24999994) * fVar344 + 0.3333333) * fVar344 + -0.5) +
               fVar344 + auVar147._0_4_ * 0.6931472) * -2.0;
          auVar16._8_4_ =
               (fVar347 * fVar347 *
                (((((((((fVar347 * 0.070376836 + -0.1151461) * fVar347 + 0.116769984) * fVar347 +
                      -0.12420141) * fVar347 + 0.14249323) * fVar347 + -0.16668057) * fVar347 +
                   0.20000714) * fVar347 + -0.24999994) * fVar347 + 0.3333333) * fVar347 + -0.5) +
               fVar347 + auVar147._8_4_ * 0.6931472) * -2.0;
          auVar16._12_4_ =
               (fVar260 * fVar260 *
                (((((((((fVar260 * 0.070376836 + -0.1151461) * fVar260 + 0.116769984) * fVar260 +
                      -0.12420141) * fVar260 + 0.14249323) * fVar260 + -0.16668057) * fVar260 +
                   0.20000714) * fVar260 + -0.24999994) * fVar260 + 0.3333333) * fVar260 + -0.5) +
               fVar260 + auVar147._12_4_ * 0.6931472) * -2.0;
          auVar16._16_4_ =
               (fVar348 * fVar348 *
                (((((((((fVar348 * 0.070376836 + -0.1151461) * fVar348 + 0.116769984) * fVar348 +
                      -0.12420141) * fVar348 + 0.14249323) * fVar348 + -0.16668057) * fVar348 +
                   0.20000714) * fVar348 + -0.24999994) * fVar348 + 0.3333333) * fVar348 + -0.5) +
               fVar348 + auVar147._16_4_ * 0.6931472) * -2.0;
          auVar16._20_4_ =
               (fVar261 * fVar261 *
                (((((((((fVar261 * 0.070376836 + -0.1151461) * fVar261 + 0.116769984) * fVar261 +
                      -0.12420141) * fVar261 + 0.14249323) * fVar261 + -0.16668057) * fVar261 +
                   0.20000714) * fVar261 + -0.24999994) * fVar261 + 0.3333333) * fVar261 + -0.5) +
               fVar261 + auVar147._20_4_ * 0.6931472) * -2.0;
          auVar16._24_4_ =
               (fVar351 * fVar351 *
                (((((((((fVar351 * 0.070376836 + -0.1151461) * fVar351 + 0.116769984) * fVar351 +
                      -0.12420141) * fVar351 + 0.14249323) * fVar351 + -0.16668057) * fVar351 +
                   0.20000714) * fVar351 + -0.24999994) * fVar351 + 0.3333333) * fVar351 + -0.5) +
               fVar351 + auVar147._24_4_ * 0.6931472) * -2.0;
          auVar16._28_4_ = auVar144._28_4_ + -1.0 + auVar253._28_4_ + auVar147._28_4_ + 0.0;
          auVar44._8_4_ = 0x7fffffff;
          auVar44._0_8_ = 0x7fffffff7fffffff;
          auVar44._12_4_ = 0x7fffffff;
          auVar44._16_4_ = 0x7fffffff;
          auVar44._20_4_ = 0x7fffffff;
          auVar44._24_4_ = 0x7fffffff;
          auVar44._28_4_ = 0x7fffffff;
          auVar253 = vblendvps_avx(auVar16,auVar44,auVar49);
          auVar45._8_4_ = 0x42b0c0a5;
          auVar45._0_8_ = 0x42b0c0a542b0c0a5;
          auVar45._12_4_ = 0x42b0c0a5;
          auVar45._16_4_ = 0x42b0c0a5;
          auVar45._20_4_ = 0x42b0c0a5;
          auVar45._24_4_ = 0x42b0c0a5;
          auVar45._28_4_ = 0x42b0c0a5;
          auVar253 = vminps_avx(auVar253,auVar45);
          auVar49 = vmaxps_avx(auVar269,auVar253);
          auVar224._0_4_ = auVar49._0_4_ * 1.442695 + 0.5;
          auVar224._4_4_ = auVar49._4_4_ * 1.442695 + 0.5;
          auVar224._8_4_ = auVar49._8_4_ * 1.442695 + 0.5;
          auVar224._12_4_ = auVar49._12_4_ * 1.442695 + 0.5;
          auVar224._16_4_ = auVar49._16_4_ * 1.442695 + 0.5;
          auVar224._20_4_ = auVar49._20_4_ * 1.442695 + 0.5;
          auVar224._24_4_ = auVar49._24_4_ * 1.442695 + 0.5;
          auVar224._28_4_ = 0x3f000000;
          auVar147 = vroundps_avx(auVar224,1);
          auVar253 = vcmpps_avx(auVar224,auVar147,1);
          auVar253 = vandps_avx(auVar253,auVar276);
          auVar253 = vsubps_avx(auVar147,auVar253);
          auVar17._4_4_ = auVar253._4_4_ * 0.6931472;
          auVar17._0_4_ = auVar253._0_4_ * 0.6931472;
          auVar17._8_4_ = auVar253._8_4_ * 0.6931472;
          auVar17._12_4_ = auVar253._12_4_ * 0.6931472;
          auVar17._16_4_ = auVar253._16_4_ * 0.6931472;
          auVar17._20_4_ = auVar253._20_4_ * 0.6931472;
          auVar17._24_4_ = auVar253._24_4_ * 0.6931472;
          auVar17._28_4_ = auVar147._28_4_;
          auVar49 = vsubps_avx(auVar49,auVar17);
          fVar344 = auVar49._0_4_;
          fVar259 = auVar49._4_4_;
          fVar347 = auVar49._8_4_;
          fVar260 = auVar49._12_4_;
          fVar348 = auVar49._16_4_;
          fVar261 = auVar49._20_4_;
          fVar351 = auVar49._24_4_;
          fVar281 = ((((fVar344 * 0.00019875691 + 0.0013981999) * fVar344 + 0.008333452) * fVar344 +
                     0.041665796) * fVar344 + 0.16666666) * fVar344 + 0.5;
          fVar301 = ((((fVar259 * 0.00019875691 + 0.0013981999) * fVar259 + 0.008333452) * fVar259 +
                     0.041665796) * fVar259 + 0.16666666) * fVar259 + 0.5;
          fVar302 = ((((fVar347 * 0.00019875691 + 0.0013981999) * fVar347 + 0.008333452) * fVar347 +
                     0.041665796) * fVar347 + 0.16666666) * fVar347 + 0.5;
          fVar303 = ((((fVar260 * 0.00019875691 + 0.0013981999) * fVar260 + 0.008333452) * fVar260 +
                     0.041665796) * fVar260 + 0.16666666) * fVar260 + 0.5;
          fVar304 = ((((fVar348 * 0.00019875691 + 0.0013981999) * fVar348 + 0.008333452) * fVar348 +
                     0.041665796) * fVar348 + 0.16666666) * fVar348 + 0.5;
          fVar305 = ((((fVar261 * 0.00019875691 + 0.0013981999) * fVar261 + 0.008333452) * fVar261 +
                     0.041665796) * fVar261 + 0.16666666) * fVar261 + 0.5;
          fVar306 = ((((fVar351 * 0.00019875691 + 0.0013981999) * fVar351 + 0.008333452) * fVar351 +
                     0.041665796) * fVar351 + 0.16666666) * fVar351 + 0.5;
          in_ZMM12 = ZEXT3264(CONCAT428(0x3f37d30c,
                                        CONCAT424(fVar306,CONCAT420(fVar305,CONCAT416(fVar304,
                                                  CONCAT412(fVar303,CONCAT48(fVar302,CONCAT44(
                                                  fVar301,fVar281))))))));
          auVar207._0_4_ = (int)auVar253._0_4_;
          auVar207._4_4_ = (int)auVar253._4_4_;
          auVar207._8_4_ = (int)auVar253._8_4_;
          auVar207._12_4_ = (int)auVar253._12_4_;
          auVar225._16_4_ = (int)auVar253._16_4_;
          auVar225._0_16_ = auVar207;
          auVar225._20_4_ = (int)auVar253._20_4_;
          auVar225._24_4_ = (int)auVar253._24_4_;
          auVar225._28_4_ = (int)auVar253._28_4_;
          auVar282 = vpslld_avx(auVar207,0x17);
          auVar237 = vpslld_avx(auVar225._16_16_,0x17);
          auVar237 = vpaddd_avx(auVar237,auVar274);
          auVar282 = vpaddd_avx(auVar282,auVar274);
          auVar280 = ZEXT3264(auVar276);
          auVar173._0_4_ =
               auVar282._0_4_ * (fVar344 * fVar344 * fVar281 + fVar344 + fVar204) + fVar204;
          auVar173._4_4_ =
               auVar282._4_4_ * (fVar259 * fVar259 * fVar301 + fVar259 + fVar230) + fVar230;
          auVar173._8_4_ =
               auVar282._8_4_ * (fVar347 * fVar347 * fVar302 + fVar347 + fVar231) + fVar231;
          auVar173._12_4_ =
               auVar282._12_4_ * (fVar260 * fVar260 * fVar303 + fVar260 + fVar232) + fVar232;
          auVar173._16_4_ =
               auVar237._0_4_ * (fVar348 * fVar348 * fVar304 + fVar348 + fVar233) + fVar233;
          auVar173._20_4_ =
               auVar237._4_4_ * (fVar261 * fVar261 * fVar305 + fVar261 + fVar234) + fVar234;
          auVar173._24_4_ =
               auVar237._8_4_ * (fVar351 * fVar351 * fVar306 + fVar351 + fVar235) + fVar235;
          auVar173._28_4_ = auVar147._28_4_ + auVar49._28_4_ + fVar258 + fVar258;
          auVar46._8_4_ = 0x40000000;
          auVar46._0_8_ = 0x4000000040000000;
          auVar46._12_4_ = 0x40000000;
          auVar46._16_4_ = 0x40000000;
          auVar46._20_4_ = 0x40000000;
          auVar46._24_4_ = 0x40000000;
          auVar46._28_4_ = 0x40000000;
          auVar253 = vdivps_avx(auVar46,auVar173);
          auVar174._0_4_ = auVar253._0_4_ + -1.0;
          auVar174._4_4_ = auVar253._4_4_ + -1.0;
          auVar174._8_4_ = auVar253._8_4_ + -1.0;
          auVar174._12_4_ = auVar253._12_4_ + -1.0;
          auVar174._16_4_ = auVar253._16_4_ + -1.0;
          auVar174._20_4_ = auVar253._20_4_ + -1.0;
          auVar174._24_4_ = auVar253._24_4_ + -1.0;
          auVar174._28_4_ = auVar253._28_4_ + -1.0;
          goto LAB_0046b01d;
        case 6:
          fVar204 = *pfVar3;
          fVar230 = pfVar3[1];
          auVar175._0_4_ = fVar230 + auVar318._0_4_ * fVar204;
          auVar175._4_4_ = fVar230 + auVar318._4_4_ * fVar204;
          auVar175._8_4_ = fVar230 + auVar318._8_4_ * fVar204;
          auVar175._12_4_ = fVar230 + auVar318._12_4_ * fVar204;
          auVar175._16_4_ = fVar230 + auVar318._16_4_ * fVar204;
          auVar175._20_4_ = fVar230 + auVar318._20_4_ * fVar204;
          auVar175._24_4_ = fVar230 + auVar318._24_4_ * fVar204;
          auVar175._28_4_ = fVar230 + fVar204;
          auVar253 = vmaxps_avx(auVar253,auVar175);
          auVar174 = vminps_avx(auVar276,auVar253);
LAB_0046b01d:
          auVar114 = ZEXT436(auVar174._28_4_);
          auVar318._0_4_ = auVar318._0_4_ * auVar174._0_4_;
          auVar318._4_4_ = auVar318._4_4_ * auVar174._4_4_;
          auVar318._8_4_ = auVar318._8_4_ * auVar174._8_4_;
          auVar318._12_4_ = auVar318._12_4_ * auVar174._12_4_;
          auVar318._16_4_ = auVar318._16_4_ * auVar174._16_4_;
          auVar318._20_4_ = auVar318._20_4_ * auVar174._20_4_;
          auVar318._24_4_ = auVar318._24_4_ * auVar174._24_4_;
        }
        auVar84._0_4_ = auVar318._0_4_ * (float)local_f8._0_4_;
        auVar84._4_4_ = auVar318._4_4_ * (float)local_f8._4_4_;
        auVar84._8_4_ = auVar318._8_4_ * fStack_f0;
        auVar84._12_4_ = auVar318._12_4_ * fStack_ec;
        auVar84._16_4_ = auVar318._16_4_ * fStack_e8;
        auVar84._20_4_ = auVar318._20_4_ * fStack_e4;
        auVar84._24_4_ = auVar318._24_4_ * fStack_e0;
        auVar84._28_36_ = auVar114;
        auVar253 = vandps_avx(auVar84._0_32_,auVar76);
        auVar253 = vorps_avx(auVar253,auVar61);
        auVar151._0_4_ = (int)(auVar253._0_4_ + auVar84._0_4_);
        auVar151._4_4_ = (int)(auVar253._4_4_ + auVar84._4_4_);
        auVar151._8_4_ = (int)(auVar253._8_4_ + auVar84._8_4_);
        auVar151._12_4_ = (int)(auVar253._12_4_ + auVar84._12_4_);
        auVar176._16_4_ = (int)(auVar253._16_4_ + auVar84._16_4_);
        auVar176._0_16_ = auVar151;
        auVar176._20_4_ = (int)(auVar253._20_4_ + auVar84._20_4_);
        auVar176._24_4_ = (int)(auVar253._24_4_ + auVar84._24_4_);
        auVar176._28_4_ = (int)(auVar253._28_4_ + auVar114._0_4_);
        in_ZMM8 = ZEXT1664(auVar176._16_16_);
        auVar237 = vpackssdw_avx(auVar151,auVar176._16_16_);
        auVar237 = vpminsw_avx(auVar237,auVar86);
        auVar237 = vpmaxsw_avx(auVar237,auVar115);
        auVar237 = vpacksswb_avx(auVar237,auVar237);
        in_ZMM7 = ZEXT1664(auVar237);
        *(long *)*(undefined1 (*) [16])ptr = auVar237._0_8_;
        intptr = (int *)((long)intptr + 0x20);
        ptr = *(undefined1 (*) [16])ptr + 8;
        uVar31 = uVar32 + 8;
        iVar33 = uVar32 + 0xf;
        uVar32 = uVar31;
      } while (iVar33 < (int)uVar34);
    }
    if ((int)(uVar31 | 3) < (int)uVar34) {
      auVar280 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar52._8_4_ = 0x3f000000;
      auVar52._0_8_ = 0x3f0000003f000000;
      auVar52._12_4_ = 0x3f000000;
      auVar334 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
      auVar272 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
      auVar300 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar209._8_4_ = 0x3f800000;
      auVar209._0_8_ = 0x3f8000003f800000;
      auVar209._12_4_ = 0x3f800000;
      uVar32 = uVar31;
      do {
        auVar237 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])intptr);
        auVar241._0_4_ = fVar1 * auVar237._0_4_ + fVar202;
        auVar241._4_4_ = fVar1 * auVar237._4_4_ + fVar202;
        auVar241._8_4_ = fVar1 * auVar237._8_4_ + fVar202;
        auVar241._12_4_ = fVar1 * auVar237._12_4_ + fVar202;
        auVar237 = auVar300._0_16_;
        switch(elempack) {
        case 1:
          auVar241 = vmaxps_avx(auVar241,auVar237);
          break;
        case 2:
          auVar282 = vmaxps_avx(auVar241,auVar237);
          auVar237 = vminps_avx(auVar241,auVar237);
          fVar204 = *(float *)*in_stack_00000020;
          auVar241._0_4_ = auVar237._0_4_ * fVar204 + auVar282._0_4_;
          auVar241._4_4_ = auVar237._4_4_ * fVar204 + auVar282._4_4_;
          auVar241._8_4_ = auVar237._8_4_ * fVar204 + auVar282._8_4_;
          auVar241._12_4_ = auVar237._12_4_ * fVar204 + auVar282._12_4_;
          break;
        case 3:
          uVar2 = *(undefined4 *)*in_stack_00000020;
          auVar90._4_4_ = uVar2;
          auVar90._0_4_ = uVar2;
          auVar90._8_4_ = uVar2;
          auVar90._12_4_ = uVar2;
          uVar2 = ((undefined4 *)*in_stack_00000020)[1];
          auVar123._4_4_ = uVar2;
          auVar123._0_4_ = uVar2;
          auVar123._8_4_ = uVar2;
          auVar123._12_4_ = uVar2;
          auVar237 = vmaxps_avx(auVar241,auVar90);
          auVar241 = vminps_avx(auVar237,auVar123);
          break;
        case 4:
          auVar91._0_4_ = (uint)auVar241._0_4_ ^ auVar280._0_4_;
          auVar91._4_4_ = (uint)auVar241._4_4_ ^ auVar280._4_4_;
          auVar91._8_4_ = (uint)auVar241._8_4_ ^ auVar280._8_4_;
          auVar91._12_4_ = (uint)auVar241._12_4_ ^ auVar280._12_4_;
          auVar124._8_4_ = 0x42b0c0a5;
          auVar124._0_8_ = 0x42b0c0a542b0c0a5;
          auVar124._12_4_ = 0x42b0c0a5;
          auVar237 = vminps_avx(auVar91,auVar124);
          auVar125._8_4_ = 0xc2b0c0a5;
          auVar125._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar125._12_4_ = 0xc2b0c0a5;
          auVar238 = vmaxps_avx(auVar237,auVar125);
          auVar126._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
          auVar126._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
          auVar126._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
          auVar126._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
          auVar242._0_4_ = (int)auVar126._0_4_;
          auVar242._4_4_ = (int)auVar126._4_4_;
          auVar242._8_4_ = (int)auVar126._8_4_;
          auVar242._12_4_ = (int)auVar126._12_4_;
          auVar282 = vcvtdq2ps_avx(auVar242);
          auVar237 = vcmpps_avx(auVar126,auVar282,1);
          auVar237 = vandps_avx(auVar209,auVar237);
          auVar237 = vsubps_avx(auVar282,auVar237);
          fVar204 = auVar237._0_4_ * -0.6931472 + auVar238._0_4_;
          fVar230 = auVar237._4_4_ * -0.6931472 + auVar238._4_4_;
          fVar231 = auVar237._8_4_ * -0.6931472 + auVar238._8_4_;
          fVar232 = auVar237._12_4_ * -0.6931472 + auVar238._12_4_;
          auVar127._0_4_ = (int)auVar237._0_4_;
          auVar127._4_4_ = (int)auVar237._4_4_;
          auVar127._8_4_ = (int)auVar237._8_4_;
          auVar127._12_4_ = (int)auVar237._12_4_;
          auVar237 = vpslld_avx(auVar127,0x17);
          auVar237 = vpaddd_avx(auVar209,auVar237);
          auVar92._0_4_ =
               (fVar204 + 1.0 +
               fVar204 * fVar204 *
               (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                 0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5)) * auVar237._0_4_ + 1.0;
          auVar92._4_4_ =
               (fVar230 + 1.0 +
               fVar230 * fVar230 *
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5)) * auVar237._4_4_ + 1.0;
          auVar92._8_4_ =
               (fVar231 + 1.0 +
               fVar231 * fVar231 *
               (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                 0.041665796) * fVar231 + 0.16666666) * fVar231 + 0.5)) * auVar237._8_4_ + 1.0;
          auVar92._12_4_ =
               (fVar232 + 1.0 +
               fVar232 * fVar232 *
               (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                 0.041665796) * fVar232 + 0.16666666) * fVar232 + 0.5)) * auVar237._12_4_ + 1.0;
          auVar241 = vdivps_avx(auVar209,auVar92);
          break;
        case 5:
          auVar288._8_4_ = 0x42b0c0a5;
          auVar288._0_8_ = 0x42b0c0a542b0c0a5;
          auVar288._12_4_ = 0x42b0c0a5;
          auVar237 = vminps_avx(auVar241,auVar288);
          auVar315._8_4_ = 0xc2b0c0a5;
          auVar315._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar315._12_4_ = 0xc2b0c0a5;
          auVar238 = vmaxps_avx(auVar315,auVar237);
          auVar117._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
          auVar117._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
          auVar117._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
          auVar117._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
          auVar155._0_4_ = (int)auVar117._0_4_;
          auVar155._4_4_ = (int)auVar117._4_4_;
          auVar155._8_4_ = (int)auVar117._8_4_;
          auVar155._12_4_ = (int)auVar117._12_4_;
          auVar282 = vcvtdq2ps_avx(auVar155);
          auVar237 = vcmpps_avx(auVar117,auVar282,1);
          auVar237 = vandps_avx(auVar209,auVar237);
          auVar237 = vsubps_avx(auVar282,auVar237);
          auVar156._0_4_ = auVar237._0_4_ * 0.6931472;
          auVar156._4_4_ = auVar237._4_4_ * 0.6931472;
          auVar156._8_4_ = auVar237._8_4_ * 0.6931472;
          auVar156._12_4_ = auVar237._12_4_ * 0.6931472;
          auVar282 = vsubps_avx(auVar238,auVar156);
          fVar204 = auVar282._0_4_;
          fVar230 = auVar282._4_4_;
          fVar231 = auVar282._8_4_;
          fVar232 = auVar282._12_4_;
          auVar118._0_4_ = (int)auVar237._0_4_;
          auVar118._4_4_ = (int)auVar237._4_4_;
          auVar118._8_4_ = (int)auVar237._8_4_;
          auVar118._12_4_ = (int)auVar237._12_4_;
          auVar237 = vpslld_avx(auVar118,0x17);
          auVar237 = vpaddd_avx(auVar209,auVar237);
          auVar87._0_4_ =
               (fVar204 + 1.0 +
               (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                 0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5) * fVar204 * fVar204) *
               auVar237._0_4_ + 1.0;
          auVar87._4_4_ =
               (fVar230 + 1.0 +
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5) * fVar230 * fVar230) *
               auVar237._4_4_ + 1.0;
          auVar87._8_4_ =
               (fVar231 + 1.0 +
               (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                 0.041665796) * fVar231 + 0.16666666) * fVar231 + 0.5) * fVar231 * fVar231) *
               auVar237._8_4_ + 1.0;
          auVar87._12_4_ =
               (fVar232 + 1.0 +
               (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                 0.041665796) * fVar232 + 0.16666666) * fVar232 + 0.5) * fVar232 * fVar232) *
               auVar237._12_4_ + 1.0;
          auVar119._8_4_ = 0x800000;
          auVar119._0_8_ = 0x80000000800000;
          auVar119._12_4_ = 0x800000;
          auVar237 = vmaxps_avx(auVar87,auVar119);
          auVar282 = vpsrld_avx(auVar237,0x17);
          auVar263._8_4_ = 0xffffff82;
          auVar263._0_8_ = 0xffffff82ffffff82;
          auVar263._12_4_ = 0xffffff82;
          auVar282 = vpaddd_avx(auVar263,auVar282);
          auVar264._8_4_ = 0x807fffff;
          auVar264._0_8_ = 0x807fffff807fffff;
          auVar264._12_4_ = 0x807fffff;
          auVar237 = vandps_avx(auVar264,auVar237);
          auVar239 = vorps_avx(auVar237,auVar52);
          auVar238 = vcvtdq2ps_avx(auVar282);
          auVar265._8_4_ = 0x3f3504f3;
          auVar265._0_8_ = 0x3f3504f33f3504f3;
          auVar265._12_4_ = 0x3f3504f3;
          auVar282 = vcmpps_avx(auVar239,auVar265,1);
          auVar237 = vandps_avx(auVar282,auVar239);
          fVar204 = auVar237._0_4_ + auVar239._0_4_ + -1.0;
          fVar230 = auVar237._4_4_ + auVar239._4_4_ + -1.0;
          fVar231 = auVar237._8_4_ + auVar239._8_4_ + -1.0;
          fVar232 = auVar237._12_4_ + auVar239._12_4_ + -1.0;
          auVar237 = vandps_avx(auVar282,auVar209);
          auVar282 = vsubps_avx(auVar238,auVar237);
          auVar237 = vcmpps_avx(auVar87,_DAT_005a34f0,2);
          auVar120._0_4_ =
               (fVar204 * fVar204 *
                (((((((((fVar204 * 0.070376836 + -0.1151461) * fVar204 + 0.116769984) * fVar204 +
                      -0.12420141) * fVar204 + 0.14249323) * fVar204 + -0.16668057) * fVar204 +
                   0.20000714) * fVar204 + -0.24999994) * fVar204 + 0.3333333) * fVar204 + -0.5) +
               auVar282._0_4_ * 0.6931472 + fVar204) * -2.0;
          auVar120._4_4_ =
               (fVar230 * fVar230 *
                (((((((((fVar230 * 0.070376836 + -0.1151461) * fVar230 + 0.116769984) * fVar230 +
                      -0.12420141) * fVar230 + 0.14249323) * fVar230 + -0.16668057) * fVar230 +
                   0.20000714) * fVar230 + -0.24999994) * fVar230 + 0.3333333) * fVar230 + -0.5) +
               auVar282._4_4_ * 0.6931472 + fVar230) * -2.0;
          auVar120._8_4_ =
               (fVar231 * fVar231 *
                (((((((((fVar231 * 0.070376836 + -0.1151461) * fVar231 + 0.116769984) * fVar231 +
                      -0.12420141) * fVar231 + 0.14249323) * fVar231 + -0.16668057) * fVar231 +
                   0.20000714) * fVar231 + -0.24999994) * fVar231 + 0.3333333) * fVar231 + -0.5) +
               auVar282._8_4_ * 0.6931472 + fVar231) * -2.0;
          auVar120._12_4_ =
               (fVar232 * fVar232 *
                (((((((((fVar232 * 0.070376836 + -0.1151461) * fVar232 + 0.116769984) * fVar232 +
                      -0.12420141) * fVar232 + 0.14249323) * fVar232 + -0.16668057) * fVar232 +
                   0.20000714) * fVar232 + -0.24999994) * fVar232 + 0.3333333) * fVar232 + -0.5) +
               auVar282._12_4_ * 0.6931472 + fVar232) * -2.0;
          auVar79._8_4_ = 0x7fffffff;
          auVar79._0_8_ = 0x7fffffff7fffffff;
          auVar79._12_4_ = 0x7fffffff;
          auVar237 = vblendvps_avx(auVar120,auVar79,auVar237);
          auVar237 = vminps_avx(auVar288,auVar237);
          auVar300 = ZEXT864(0) << 0x20;
          auVar238 = vmaxps_avx(auVar315,auVar237);
          auVar334 = ZEXT1664(auVar334._0_16_);
          auVar272 = ZEXT1664(auVar272._0_16_);
          auVar280 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar121._0_4_ = auVar238._0_4_ * 1.442695 + 0.5;
          auVar121._4_4_ = auVar238._4_4_ * 1.442695 + 0.5;
          auVar121._8_4_ = auVar238._8_4_ * 1.442695 + 0.5;
          auVar121._12_4_ = auVar238._12_4_ * 1.442695 + 0.5;
          auVar157._0_4_ = (int)auVar121._0_4_;
          auVar157._4_4_ = (int)auVar121._4_4_;
          auVar157._8_4_ = (int)auVar121._8_4_;
          auVar157._12_4_ = (int)auVar121._12_4_;
          auVar282 = vcvtdq2ps_avx(auVar157);
          auVar237 = vcmpps_avx(auVar121,auVar282,1);
          auVar237 = vandps_avx(auVar209,auVar237);
          auVar237 = vsubps_avx(auVar282,auVar237);
          auVar158._0_4_ = auVar237._0_4_ * 0.6931472;
          auVar158._4_4_ = auVar237._4_4_ * 0.6931472;
          auVar158._8_4_ = auVar237._8_4_ * 0.6931472;
          auVar158._12_4_ = auVar237._12_4_ * 0.6931472;
          auVar282 = vsubps_avx(auVar238,auVar158);
          fVar204 = auVar282._0_4_;
          fVar230 = auVar282._4_4_;
          fVar231 = auVar282._8_4_;
          fVar232 = auVar282._12_4_;
          auVar122._0_4_ = (int)auVar237._0_4_;
          auVar122._4_4_ = (int)auVar237._4_4_;
          auVar122._8_4_ = (int)auVar237._8_4_;
          auVar122._12_4_ = (int)auVar237._12_4_;
          auVar237 = vpslld_avx(auVar122,0x17);
          auVar237 = vpaddd_avx(auVar209,auVar237);
          auVar88._0_4_ =
               (fVar204 + 1.0 +
               (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                 0.041665796) * fVar204 + 0.16666666) * fVar204 + 0.5) * fVar204 * fVar204) *
               auVar237._0_4_ + 1.0;
          auVar88._4_4_ =
               (fVar230 + 1.0 +
               (((((fVar230 * 0.00019875691 + 0.0013981999) * fVar230 + 0.008333452) * fVar230 +
                 0.041665796) * fVar230 + 0.16666666) * fVar230 + 0.5) * fVar230 * fVar230) *
               auVar237._4_4_ + 1.0;
          auVar88._8_4_ =
               (fVar231 + 1.0 +
               (((((fVar231 * 0.00019875691 + 0.0013981999) * fVar231 + 0.008333452) * fVar231 +
                 0.041665796) * fVar231 + 0.16666666) * fVar231 + 0.5) * fVar231 * fVar231) *
               auVar237._8_4_ + 1.0;
          auVar88._12_4_ =
               (fVar232 + 1.0 +
               (((((fVar232 * 0.00019875691 + 0.0013981999) * fVar232 + 0.008333452) * fVar232 +
                 0.041665796) * fVar232 + 0.16666666) * fVar232 + 0.5) * fVar232 * fVar232) *
               auVar237._12_4_ + 1.0;
          auVar80._8_4_ = 0x40000000;
          auVar80._0_8_ = 0x4000000040000000;
          auVar80._12_4_ = 0x40000000;
          auVar237 = vdivps_avx(auVar80,auVar88);
          auVar89._0_4_ = auVar237._0_4_ + -1.0;
          auVar89._4_4_ = auVar237._4_4_ + -1.0;
          auVar89._8_4_ = auVar237._8_4_ + -1.0;
          auVar89._12_4_ = auVar237._12_4_ + -1.0;
          goto LAB_0046c4bf;
        case 6:
          fVar204 = *(float *)*in_stack_00000020;
          fVar230 = ((float *)*in_stack_00000020)[1];
          auVar93._0_4_ = auVar241._0_4_ * fVar204 + fVar230;
          auVar93._4_4_ = auVar241._4_4_ * fVar204 + fVar230;
          auVar93._8_4_ = auVar241._8_4_ * fVar204 + fVar230;
          auVar93._12_4_ = auVar241._12_4_ * fVar204 + fVar230;
          auVar237 = vmaxps_avx(auVar237,auVar93);
          auVar89 = vminps_avx(auVar209,auVar237);
LAB_0046c4bf:
          auVar241._0_4_ = auVar241._0_4_ * auVar89._0_4_;
          auVar241._4_4_ = auVar241._4_4_ * auVar89._4_4_;
          auVar241._8_4_ = auVar241._8_4_ * auVar89._8_4_;
          auVar241._12_4_ = auVar241._12_4_ * auVar89._12_4_;
        }
        auVar94._0_4_ = auVar241._0_4_ * fVar307;
        auVar94._4_4_ = auVar241._4_4_ * fVar307;
        auVar94._8_4_ = auVar241._8_4_ * fVar307;
        auVar94._12_4_ = auVar241._12_4_ * fVar307;
        auVar237 = vandps_avx(auVar94,auVar280._0_16_);
        auVar237 = vorps_avx(auVar237,auVar52);
        auVar95._0_4_ = (int)(auVar94._0_4_ + auVar237._0_4_);
        auVar95._4_4_ = (int)(auVar94._4_4_ + auVar237._4_4_);
        auVar95._8_4_ = (int)(auVar94._8_4_ + auVar237._8_4_);
        auVar95._12_4_ = (int)(auVar94._12_4_ + auVar237._12_4_);
        auVar237 = vpackssdw_avx(auVar95,auVar95);
        auVar237 = vpminsw_avx(auVar334._0_16_,auVar237);
        auVar237 = vpmaxsw_avx(auVar237,auVar272._0_16_);
        auVar237 = vpacksswb_avx(auVar237,auVar237);
        *(int *)*(undefined1 (*) [16])ptr = auVar237._0_4_;
        intptr = (int *)(*(undefined1 (*) [32])intptr + 0x10);
        ptr = *(undefined1 (*) [16])ptr + 4;
        uVar31 = uVar32 + 4;
        iVar33 = uVar32 + 7;
        uVar32 = uVar31;
      } while (iVar33 < (int)uVar34);
    }
    if (uVar34 - uVar31 != 0 && (int)uVar31 <= (int)uVar34) {
      lVar35 = 0;
      auVar280 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar272 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
      do {
        fVar204 = fVar1 * (float)*(int *)(*(undefined1 (*) [32])intptr + lVar35 * 4) + fVar202;
        auVar237 = ZEXT416((uint)fVar204);
        fVar230 = fVar204;
        switch(elempack) {
        case 1:
          auVar237 = vmaxss_avx(auVar237,ZEXT416(0));
          fVar230 = auVar237._0_4_;
          break;
        case 2:
          auVar39._0_12_ = ZEXT812(0);
          auVar39._12_4_ = 0;
          auVar237 = vcmpss_avx(auVar39,auVar237,1);
          auVar69._8_4_ = 0x3f800000;
          auVar69._0_8_ = 0x3f8000003f800000;
          auVar69._12_4_ = 0x3f800000;
          auVar237 = vblendvps_avx(ZEXT416(*(uint *)*in_stack_00000020),auVar69,auVar237);
          fVar232 = auVar237._0_4_;
LAB_0046c699:
          fVar230 = fVar232 * fVar204;
          break;
        case 3:
          fVar204 = (float)((uint *)*in_stack_00000020)[1];
          auVar237 = vmaxss_avx(auVar237,ZEXT416(*(uint *)*in_stack_00000020));
          fVar230 = auVar237._0_4_;
          if (fVar204 < auVar237._0_4_) {
            fVar230 = fVar204;
          }
          break;
        case 4:
          auVar237 = vminss_avx(auVar237,ZEXT416(0x42b0c0a5));
          auVar53._0_4_ = auVar237._0_4_ ^ auVar280._0_4_;
          auVar53._4_4_ = auVar237._4_4_ ^ auVar280._4_4_;
          auVar53._8_4_ = auVar237._8_4_ ^ auVar280._8_4_;
          auVar53._12_4_ = auVar237._12_4_ ^ auVar280._12_4_;
          auVar237 = vcmpss_avx(auVar237,ZEXT416(0xc2b0c0a5),1);
          auVar68._8_4_ = 0x42b0c0a5;
          auVar68._0_8_ = 0x42b0c0a542b0c0a5;
          auVar68._12_4_ = 0x42b0c0a5;
          auVar237 = vblendvps_avx(auVar53,auVar68,auVar237);
          fVar204 = expf(auVar237._0_4_);
          auVar272 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar280 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          fVar230 = 1.0 / (fVar204 + 1.0);
          break;
        case 5:
          fVar230 = expf(fVar204);
          fVar230 = logf(fVar230 + 1.0);
          fVar230 = tanhf(fVar230);
          auVar272 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar280 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          fVar230 = fVar230 * fVar204;
          break;
        case 6:
          fVar231 = *(float *)*in_stack_00000020;
          fVar232 = ((float *)*in_stack_00000020)[1];
          fVar233 = (float)((uint)fVar232 ^ auVar280._0_4_) / fVar231;
          fVar230 = 0.0;
          if ((fVar233 <= fVar204) && (fVar230 = fVar204, fVar204 <= fVar233 + 1.0 / fVar231)) {
            fVar232 = fVar231 * fVar204 + fVar232;
            goto LAB_0046c699;
          }
        }
        auVar237 = vandps_avx(ZEXT416((uint)(fVar307 * fVar230)),auVar280._0_16_);
        auVar237 = vorps_avx(auVar237,auVar272._0_16_);
        auVar237 = ZEXT416((uint)(fVar307 * fVar230 + auVar237._0_4_));
        auVar237 = vroundss_avx(auVar237,auVar237,0xb);
        iVar33 = (int)auVar237._0_4_;
        if (iVar33 < -0x7e) {
          iVar33 = -0x7f;
        }
        uVar30 = (undefined1)iVar33;
        if (0x7e < iVar33) {
          uVar30 = 0x7f;
        }
        (*(undefined1 (*) [16])ptr)[lVar35] = uVar30;
        lVar35 = lVar35 + 1;
      } while (uVar34 - uVar31 != (int)lVar35);
    }
  }
  return;
}

Assistant:

static void requantize(const int* intptr, signed char* ptr, const Mat& scale_in_data, const Mat& bias_data, const Mat& scale_out_data, int activation_type, const Mat& activation_params, int elemcount, int elempack)
{
    const int scale_in_data_size = scale_in_data.w;
    const int bias_data_size = bias_data.w;
    const int scale_out_data_size = scale_out_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("requantize %d %d %d   %d %d", scale_in_data_size, bias_data_size, scale_out_data_size, elemcount, elempack);

    float scale_in = scale_in_data[0];
#if __SSE2__
    __m128 _scale_in0 = _mm_set1_ps(scale_in);
#if __AVX__
    __m256 _scale_in_avx = _mm256_set1_ps(scale_in);
#if __AVX512F__
    __m512 _scale_in_avx512 = _mm512_set1_ps(scale_in);
#endif // __AVX512F__
#else  // __AVX__
    __m128 _scale_in1 = _scale_in0;
#endif // __AVX__
    if (scale_in_data_size > 1)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_in_avx512 = _mm512_loadu_ps((const float*)scale_in_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX__
            _scale_in_avx = _mm256_loadu_ps((const float*)scale_in_data);
#if __AVX512F__
            _scale_in_avx512 = combine8x2_ps(_scale_in_avx, _scale_in_avx);
#endif // __AVX512F__
#else  // __AVX__
            _scale_in0 = _mm_loadu_ps((const float*)scale_in_data);
            _scale_in1 = _mm_loadu_ps((const float*)scale_in_data + 4);
#endif // __AVX__
        }
    }
#endif // __SSE2__

    float scale_out = scale_out_data[0];
#if __SSE2__
    __m128 _scale_out0 = _mm_set1_ps(scale_out);
#if __AVX__
    __m256 _scale_out_avx = _mm256_set1_ps(scale_out);
#if __AVX512F__
    __m512 _scale_out_avx512 = _mm512_set1_ps(scale_out);
#endif // __AVX512F__
#else  // __AVX__
    __m128 _scale_out1 = _scale_out0;
#endif // __AVX__
    if (scale_out_data_size > 1)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_out_avx512 = _mm512_loadu_ps((const float*)scale_out_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX__
            _scale_out_avx = _mm256_loadu_ps((const float*)scale_out_data);
#if __AVX512F__
            _scale_out_avx512 = combine8x2_ps(_scale_out_avx, _scale_out_avx);
#endif // __AVX512F__
#else  // __AVX__
            _scale_out0 = _mm_loadu_ps((const float*)scale_out_data);
            _scale_out1 = _mm_loadu_ps((const float*)scale_out_data + 4);
#endif // __AVX__
        }
    }
#endif // __SSE2__

    if (bias_data_size == 0)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 15 < size; i += 16)
        {
#if __AVX512F__
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_mul_ps(_v, _scale_in_avx512);
            _v = activation_avx512(_v, activation_type, activation_params);
            _v = _mm512_mul_ps(_v, _scale_out_avx512);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx512(_v));
#else  // __AVX512F__
            __m256 _v0 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            __m256 _v1 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)(intptr + 8)));
            _v0 = _mm256_mul_ps(_v0, _scale_in_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_in_avx);
            _v0 = activation_avx(_v0, activation_type, activation_params);
            _v1 = activation_avx(_v1, activation_type, activation_params);
            _v0 = _mm256_mul_ps(_v0, _scale_out_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_out_avx);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX__
        for (; i + 7 < size; i += 8)
        {
#if __AVX__
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_mul_ps(_v, _scale_in_avx);
            _v = activation_avx(_v, activation_type, activation_params);
            _v = _mm256_mul_ps(_v, _scale_out_avx);
            *(int64_t*)ptr = float2int8_avx(_v);
#else  // __AVX__
            __m128 _v0 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            __m128 _v1 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)(intptr + 4)));
            _v0 = _mm_mul_ps(_v0, _scale_in0);
            _v1 = _mm_mul_ps(_v1, _scale_in1);
            _v0 = activation_sse(_v0, activation_type, activation_params);
            _v1 = activation_sse(_v1, activation_type, activation_params);
            _v0 = _mm_mul_ps(_v0, _scale_out0);
            _v1 = _mm_mul_ps(_v1, _scale_out1);
            *(int64_t*)ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
            intptr += 8;
            ptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_mul_ps(_v, _scale_in0);
            _v = activation_sse(_v, activation_type, activation_params);
            _v = _mm_mul_ps(_v, _scale_out0);
            int32_t v = float2int8_sse(_v);
            ptr[0] = (v >> 0) & 0xff;
            ptr[1] = (v >> 8) & 0xff;
            ptr[2] = (v >> 16) & 0xff;
            ptr[3] = (v >> 24) & 0xff;
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = *intptr * scale_in;
            v = activation_ss(v, activation_type, activation_params);
            *ptr = float2int8(v * scale_out);
            intptr++;
            ptr++;
        }
    }
    else
    {
        float bias = bias_data[0];
#if __SSE2__
        __m128 _bias0 = _mm_set1_ps(bias);
#if __AVX__
        __m256 _bias_avx = _mm256_set1_ps(bias);
#if __AVX512F__
        __m512 _bias_avx512 = _mm512_set1_ps(bias);
#endif // __AVX512F__
#else  // __AVX__
        __m128 _bias1 = _bias0;
#endif // __AVX__
        if (bias_data_size > 1)
        {
#if __AVX512F__
            if (elempack == 16)
            {
                _bias_avx512 = _mm512_loadu_ps((const float*)bias_data);
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
#if __AVX__
                _bias_avx = _mm256_loadu_ps((const float*)bias_data);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
#else  // __AVX__
                _bias0 = _mm_loadu_ps((const float*)bias_data);
                _bias1 = _mm_loadu_ps((const float*)bias_data + 4);
#endif // __AVX__
            }
        }
#endif // __SSE2__

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 15 < size; i += 16)
        {
#if __AVX512F__
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_fmadd_ps(_v, _scale_in_avx512, _bias_avx512);
            _v = activation_avx512(_v, activation_type, activation_params);
            _v = _mm512_mul_ps(_v, _scale_out_avx512);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx512(_v));
#else  // __AVX512F__
            __m256 _v0 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            __m256 _v1 = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)(intptr + 8)));
            _v0 = _mm256_comp_fmadd_ps(_v0, _scale_in_avx, _bias_avx);
            _v1 = _mm256_comp_fmadd_ps(_v1, _scale_in_avx, _bias_avx);
            _v0 = activation_avx(_v0, activation_type, activation_params);
            _v1 = activation_avx(_v1, activation_type, activation_params);
            _v0 = _mm256_mul_ps(_v0, _scale_out_avx);
            _v1 = _mm256_mul_ps(_v1, _scale_out_avx);
            _mm_storeu_si128((__m128i*)ptr, float2int8_avx(_v0, _v1));
#endif // __AVX512F__
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX__
        for (; i + 7 < size; i += 8)
        {
#if __AVX__
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_comp_fmadd_ps(_v, _scale_in_avx, _bias_avx);
            _v = activation_avx(_v, activation_type, activation_params);
            _v = _mm256_mul_ps(_v, _scale_out_avx);
            *(int64_t*)ptr = float2int8_avx(_v);
#else  // __AVX__
            __m128 _v0 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            __m128 _v1 = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)(intptr + 4)));
            _v0 = _mm_comp_fmadd_ps(_v0, _scale_in0, _bias0);
            _v1 = _mm_comp_fmadd_ps(_v1, _scale_in1, _bias1);
            _v0 = activation_sse(_v0, activation_type, activation_params);
            _v1 = activation_sse(_v1, activation_type, activation_params);
            _v0 = _mm_mul_ps(_v0, _scale_out0);
            _v1 = _mm_mul_ps(_v1, _scale_out1);
            *(int64_t*)ptr = float2int8_sse(_v0, _v1);
#endif // __AVX__
            intptr += 8;
            ptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_comp_fmadd_ps(_v, _scale_in0, _bias0);
            _v = activation_sse(_v, activation_type, activation_params);
            _v = _mm_mul_ps(_v, _scale_out0);
            int32_t v = float2int8_sse(_v);
            ptr[0] = (v >> 0) & 0xff;
            ptr[1] = (v >> 8) & 0xff;
            ptr[2] = (v >> 16) & 0xff;
            ptr[3] = (v >> 24) & 0xff;
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = *intptr * scale_in + bias;
            v = activation_ss(v, activation_type, activation_params);
            *ptr = float2int8(v * scale_out);
            intptr++;
            ptr++;
        }
    }
}